

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [28];
  Primitive PVar10;
  uint uVar11;
  undefined4 uVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [24];
  uint uVar121;
  uint uVar122;
  ulong uVar123;
  ulong uVar124;
  uint uVar125;
  long lVar126;
  long lVar127;
  Geometry *pGVar128;
  long lVar129;
  undefined4 uVar130;
  undefined8 unaff_R13;
  float fVar131;
  float fVar148;
  float fVar150;
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar152;
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar149;
  float fVar151;
  float fVar154;
  float fVar157;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar158;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar174;
  float fVar189;
  float fVar190;
  vint4 bi_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  undefined1 auVar188 [32];
  float fVar204;
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar207;
  float fVar209;
  float fVar212;
  undefined1 auVar198 [32];
  float fVar205;
  float fVar208;
  float fVar210;
  float fVar213;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar206;
  float fVar211;
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar214;
  float fVar229;
  float fVar232;
  vint4 bi_1;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar215;
  float fVar216;
  undefined1 auVar223 [16];
  float fVar230;
  float fVar234;
  undefined1 auVar224 [32];
  float fVar231;
  float fVar233;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar235;
  undefined1 auVar228 [32];
  vint4 ai_1;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar248;
  undefined1 auVar247 [32];
  float fVar249;
  float fVar250;
  float fVar256;
  float fVar257;
  float fVar258;
  vint4 ai_2;
  undefined1 auVar251 [16];
  float fVar259;
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  float fVar266;
  undefined1 auVar254 [32];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar255 [64];
  float fVar267;
  float fVar276;
  float fVar278;
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar272 [32];
  float fVar268;
  undefined1 auVar273 [32];
  float fVar277;
  float fVar279;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar293;
  float fVar295;
  float fVar296;
  float fVar298;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar299;
  undefined1 auVar288 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar309;
  float fVar310;
  undefined1 auVar306 [16];
  float fVar311;
  float fVar312;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar313;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar322;
  undefined1 auVar316 [16];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar318 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar336;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar340;
  float fVar341;
  undefined1 auVar337 [16];
  float fVar342;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar343;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined8 uStack_888;
  undefined8 uStack_878;
  undefined1 local_870 [16];
  undefined1 local_860 [32];
  uint local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  ulong local_6d0;
  undefined8 uStack_6c8;
  undefined1 (*local_6b8) [16];
  Precalculations *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [8];
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_510;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar220 [16];
  undefined1 auVar270 [16];
  undefined1 auVar317 [32];
  undefined1 auVar335 [64];
  undefined1 auVar344 [16];
  
  PVar10 = prim[1];
  uVar123 = (ulong)(byte)PVar10;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 4 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 5 + 6)));
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 6 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0xf + 6)));
  lVar129 = uVar123 * 0x25;
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x11 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1a + 6)));
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1b + 6)));
  auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar223 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar182 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar182 = vinsertps_avx(auVar182,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar223 = vsubps_avx(auVar223,*(undefined1 (*) [16])(prim + lVar129 + 6));
  fVar313 = *(float *)(prim + lVar129 + 0x12);
  auVar217._0_4_ = fVar313 * auVar223._0_4_;
  auVar217._4_4_ = fVar313 * auVar223._4_4_;
  auVar217._8_4_ = fVar313 * auVar223._8_4_;
  auVar217._12_4_ = fVar313 * auVar223._12_4_;
  auVar286._0_4_ = fVar313 * auVar182._0_4_;
  auVar286._4_4_ = fVar313 * auVar182._4_4_;
  auVar286._8_4_ = fVar313 * auVar182._8_4_;
  auVar286._12_4_ = fVar313 * auVar182._12_4_;
  auVar184 = vcvtdq2ps_avx(auVar186);
  auVar271 = vcvtdq2ps_avx(auVar271);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar182 = vshufps_avx(auVar286,auVar286,0x55);
  auVar186 = vshufps_avx(auVar286,auVar286,0xaa);
  fVar249 = auVar186._0_4_;
  fVar256 = auVar186._4_4_;
  fVar258 = auVar186._8_4_;
  fVar259 = auVar186._12_4_;
  fVar158 = auVar182._0_4_;
  fVar169 = auVar182._4_4_;
  fVar170 = auVar182._8_4_;
  fVar171 = auVar182._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar197);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar19 = vcvtdq2ps_avx(auVar223);
  auVar223 = vshufps_avx(auVar286,auVar286,0);
  fVar313 = auVar223._0_4_;
  fVar319 = auVar223._4_4_;
  fVar320 = auVar223._8_4_;
  fVar322 = auVar223._12_4_;
  auVar287._0_4_ = fVar313 * auVar18._0_4_ + fVar158 * auVar184._0_4_ + fVar249 * auVar271._0_4_;
  auVar287._4_4_ = fVar319 * auVar18._4_4_ + fVar169 * auVar184._4_4_ + fVar256 * auVar271._4_4_;
  auVar287._8_4_ = fVar320 * auVar18._8_4_ + fVar170 * auVar184._8_4_ + fVar258 * auVar271._8_4_;
  auVar287._12_4_ = fVar322 * auVar18._12_4_ + fVar171 * auVar184._12_4_ + fVar259 * auVar271._12_4_
  ;
  auVar175._0_4_ = fVar313 * auVar22._0_4_ + fVar158 * auVar23._0_4_ + fVar249 * auVar24._0_4_;
  auVar175._4_4_ = fVar319 * auVar22._4_4_ + fVar169 * auVar23._4_4_ + fVar256 * auVar24._4_4_;
  auVar175._8_4_ = fVar320 * auVar22._8_4_ + fVar170 * auVar23._8_4_ + fVar258 * auVar24._8_4_;
  auVar175._12_4_ = fVar322 * auVar22._12_4_ + fVar171 * auVar23._12_4_ + fVar259 * auVar24._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar123 * 7 + 6);
  auVar133 = vpmovsxwd_avx(auVar223);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar314._0_4_ = fVar158 * auVar25._0_4_ + fVar249 * auVar19._0_4_ + fVar313 * auVar132._0_4_;
  auVar314._4_4_ = fVar169 * auVar25._4_4_ + fVar256 * auVar19._4_4_ + fVar319 * auVar132._4_4_;
  auVar314._8_4_ = fVar170 * auVar25._8_4_ + fVar258 * auVar19._8_4_ + fVar320 * auVar132._8_4_;
  auVar314._12_4_ = fVar171 * auVar25._12_4_ + fVar259 * auVar19._12_4_ + fVar322 * auVar132._12_4_;
  auVar223 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar158 = auVar223._0_4_;
  fVar169 = auVar223._4_4_;
  fVar170 = auVar223._8_4_;
  fVar171 = auVar223._12_4_;
  auVar223 = vshufps_avx(auVar217,auVar217,0x55);
  fVar249 = auVar223._0_4_;
  fVar256 = auVar223._4_4_;
  fVar258 = auVar223._8_4_;
  fVar259 = auVar223._12_4_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar123 * 0xb + 6);
  auVar134 = vpmovsxwd_avx(auVar182);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar123 * 9 + 6);
  auVar177 = vpmovsxwd_avx(auVar197);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar123 * 0xd + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar223 = vshufps_avx(auVar217,auVar217,0);
  fVar313 = auVar223._0_4_;
  fVar319 = auVar223._4_4_;
  fVar320 = auVar223._8_4_;
  fVar322 = auVar223._12_4_;
  auVar269._0_4_ = fVar249 * auVar184._0_4_ + fVar158 * auVar271._0_4_ + auVar18._0_4_ * fVar313;
  auVar269._4_4_ = fVar256 * auVar184._4_4_ + fVar169 * auVar271._4_4_ + auVar18._4_4_ * fVar319;
  auVar269._8_4_ = fVar258 * auVar184._8_4_ + fVar170 * auVar271._8_4_ + auVar18._8_4_ * fVar320;
  auVar269._12_4_ = fVar259 * auVar184._12_4_ + fVar171 * auVar271._12_4_ + auVar18._12_4_ * fVar322
  ;
  auVar218._0_4_ = auVar24._0_4_ * fVar158 + fVar249 * auVar23._0_4_ + fVar313 * auVar22._0_4_;
  auVar218._4_4_ = auVar24._4_4_ * fVar169 + fVar256 * auVar23._4_4_ + fVar319 * auVar22._4_4_;
  auVar218._8_4_ = auVar24._8_4_ * fVar170 + fVar258 * auVar23._8_4_ + fVar320 * auVar22._8_4_;
  auVar218._12_4_ = auVar24._12_4_ * fVar171 + fVar259 * auVar23._12_4_ + fVar322 * auVar22._12_4_;
  auVar337._8_4_ = 0x7fffffff;
  auVar337._0_8_ = 0x7fffffff7fffffff;
  auVar337._12_4_ = 0x7fffffff;
  auVar223 = vandps_avx(auVar287,auVar337);
  auVar328._8_4_ = 0x219392ef;
  auVar328._0_8_ = 0x219392ef219392ef;
  auVar328._12_4_ = 0x219392ef;
  auVar223 = vcmpps_avx(auVar223,auVar328,1);
  auVar182 = vblendvps_avx(auVar287,auVar328,auVar223);
  auVar223 = vandps_avx(auVar337,auVar175);
  auVar223 = vcmpps_avx(auVar223,auVar328,1);
  auVar197 = vblendvps_avx(auVar175,auVar328,auVar223);
  auVar223 = vandps_avx(auVar314,auVar337);
  auVar223 = vcmpps_avx(auVar223,auVar328,1);
  auVar223 = vblendvps_avx(auVar314,auVar328,auVar223);
  auVar241._0_4_ = fVar249 * auVar25._0_4_ + fVar158 * auVar19._0_4_ + auVar132._0_4_ * fVar313;
  auVar241._4_4_ = fVar256 * auVar25._4_4_ + fVar169 * auVar19._4_4_ + auVar132._4_4_ * fVar319;
  auVar241._8_4_ = fVar258 * auVar25._8_4_ + fVar170 * auVar19._8_4_ + auVar132._8_4_ * fVar320;
  auVar241._12_4_ = fVar259 * auVar25._12_4_ + fVar171 * auVar19._12_4_ + auVar132._12_4_ * fVar322;
  auVar184 = vrcpps_avx(auVar182);
  fVar249 = auVar184._0_4_;
  auVar251._0_4_ = fVar249 * auVar182._0_4_;
  fVar256 = auVar184._4_4_;
  auVar251._4_4_ = fVar256 * auVar182._4_4_;
  fVar258 = auVar184._8_4_;
  auVar251._8_4_ = fVar258 * auVar182._8_4_;
  fVar259 = auVar184._12_4_;
  auVar251._12_4_ = fVar259 * auVar182._12_4_;
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = 0x3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar182 = vsubps_avx(auVar329,auVar251);
  fVar249 = fVar249 + fVar249 * auVar182._0_4_;
  fVar256 = fVar256 + fVar256 * auVar182._4_4_;
  fVar258 = fVar258 + fVar258 * auVar182._8_4_;
  fVar259 = fVar259 + fVar259 * auVar182._12_4_;
  auVar182 = vrcpps_avx(auVar197);
  fVar283 = auVar182._0_4_;
  auVar176._0_4_ = fVar283 * auVar197._0_4_;
  fVar293 = auVar182._4_4_;
  auVar176._4_4_ = fVar293 * auVar197._4_4_;
  fVar296 = auVar182._8_4_;
  auVar176._8_4_ = fVar296 * auVar197._8_4_;
  fVar299 = auVar182._12_4_;
  auVar176._12_4_ = fVar299 * auVar197._12_4_;
  auVar182 = vsubps_avx(auVar329,auVar176);
  fVar283 = fVar283 + fVar283 * auVar182._0_4_;
  fVar293 = fVar293 + fVar293 * auVar182._4_4_;
  fVar296 = fVar296 + fVar296 * auVar182._8_4_;
  fVar299 = fVar299 + fVar299 * auVar182._12_4_;
  auVar182 = vrcpps_avx(auVar223);
  fVar313 = auVar182._0_4_;
  auVar315._0_4_ = auVar223._0_4_ * fVar313;
  fVar319 = auVar182._4_4_;
  auVar315._4_4_ = auVar223._4_4_ * fVar319;
  fVar320 = auVar182._8_4_;
  auVar315._8_4_ = auVar223._8_4_ * fVar320;
  fVar322 = auVar182._12_4_;
  auVar315._12_4_ = auVar223._12_4_ * fVar322;
  auVar223 = vsubps_avx(auVar329,auVar315);
  fVar313 = auVar223._0_4_ * fVar313 + fVar313;
  fVar319 = auVar223._4_4_ * fVar319 + fVar319;
  fVar320 = auVar223._8_4_ * fVar320 + fVar320;
  fVar322 = auVar223._12_4_ * fVar322 + fVar322;
  auVar197 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar129 + 0x16)) *
                                         *(float *)(prim + lVar129 + 0x1a))),0);
  auVar223 = vcvtdq2ps_avx(auVar133);
  auVar182 = vcvtdq2ps_avx(auVar134);
  auVar182 = vsubps_avx(auVar182,auVar223);
  fVar158 = auVar197._0_4_;
  fVar169 = auVar197._4_4_;
  fVar170 = auVar197._8_4_;
  fVar171 = auVar197._12_4_;
  auVar132._0_4_ = fVar158 * auVar182._0_4_ + auVar223._0_4_;
  auVar132._4_4_ = fVar169 * auVar182._4_4_ + auVar223._4_4_;
  auVar132._8_4_ = fVar170 * auVar182._8_4_ + auVar223._8_4_;
  auVar132._12_4_ = fVar171 * auVar182._12_4_ + auVar223._12_4_;
  auVar223 = vcvtdq2ps_avx(auVar177);
  auVar182 = vcvtdq2ps_avx(auVar186);
  auVar182 = vsubps_avx(auVar182,auVar223);
  auVar192._0_4_ = fVar158 * auVar182._0_4_ + auVar223._0_4_;
  auVar192._4_4_ = fVar169 * auVar182._4_4_ + auVar223._4_4_;
  auVar192._8_4_ = fVar170 * auVar182._8_4_ + auVar223._8_4_;
  auVar192._12_4_ = fVar171 * auVar182._12_4_ + auVar223._12_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar123 * 0x12 + 6);
  auVar223 = vpmovsxwd_avx(auVar184);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar123 * 0x16 + 6);
  auVar182 = vpmovsxwd_avx(auVar271);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar182 = vsubps_avx(auVar182,auVar223);
  auVar236._0_4_ = auVar182._0_4_ * fVar158 + auVar223._0_4_;
  auVar236._4_4_ = auVar182._4_4_ * fVar169 + auVar223._4_4_;
  auVar236._8_4_ = auVar182._8_4_ * fVar170 + auVar223._8_4_;
  auVar236._12_4_ = auVar182._12_4_ * fVar171 + auVar223._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar123 * 0x14 + 6);
  auVar223 = vpmovsxwd_avx(auVar23);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar123 * 0x18 + 6);
  auVar182 = vpmovsxwd_avx(auVar24);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar182 = vsubps_avx(auVar182,auVar223);
  auVar306._0_4_ = auVar182._0_4_ * fVar158 + auVar223._0_4_;
  auVar306._4_4_ = auVar182._4_4_ * fVar169 + auVar223._4_4_;
  auVar306._8_4_ = auVar182._8_4_ * fVar170 + auVar223._8_4_;
  auVar306._12_4_ = auVar182._12_4_ * fVar171 + auVar223._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar123 * 0x1d + 6);
  auVar223 = vpmovsxwd_avx(auVar18);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar123 * 0x21 + 6);
  auVar182 = vpmovsxwd_avx(auVar22);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar197 = vsubps_avx(auVar182,auVar223);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar123 * 0x1f + 6);
  auVar182 = vpmovsxwd_avx(auVar25);
  auVar330._0_4_ = auVar197._0_4_ * fVar158 + auVar223._0_4_;
  auVar330._4_4_ = auVar197._4_4_ * fVar169 + auVar223._4_4_;
  auVar330._8_4_ = auVar197._8_4_ * fVar170 + auVar223._8_4_;
  auVar330._12_4_ = auVar197._12_4_ * fVar171 + auVar223._12_4_;
  auVar335 = ZEXT1664(auVar330);
  auVar223 = vcvtdq2ps_avx(auVar182);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar123 * 0x23 + 6);
  auVar182 = vpmovsxwd_avx(auVar19);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar182 = vsubps_avx(auVar182,auVar223);
  auVar177._0_4_ = auVar223._0_4_ + auVar182._0_4_ * fVar158;
  auVar177._4_4_ = auVar223._4_4_ + auVar182._4_4_ * fVar169;
  auVar177._8_4_ = auVar223._8_4_ + auVar182._8_4_ * fVar170;
  auVar177._12_4_ = auVar223._12_4_ + auVar182._12_4_ * fVar171;
  auVar223 = vsubps_avx(auVar132,auVar269);
  auVar133._0_4_ = fVar249 * auVar223._0_4_;
  auVar133._4_4_ = fVar256 * auVar223._4_4_;
  auVar133._8_4_ = fVar258 * auVar223._8_4_;
  auVar133._12_4_ = fVar259 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar192,auVar269);
  auVar193._0_4_ = fVar249 * auVar223._0_4_;
  auVar193._4_4_ = fVar256 * auVar223._4_4_;
  auVar193._8_4_ = fVar258 * auVar223._8_4_;
  auVar193._12_4_ = fVar259 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar236,auVar218);
  auVar237._0_4_ = fVar283 * auVar223._0_4_;
  auVar237._4_4_ = fVar293 * auVar223._4_4_;
  auVar237._8_4_ = fVar296 * auVar223._8_4_;
  auVar237._12_4_ = fVar299 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar306,auVar218);
  auVar219._0_4_ = fVar283 * auVar223._0_4_;
  auVar219._4_4_ = fVar293 * auVar223._4_4_;
  auVar219._8_4_ = fVar296 * auVar223._8_4_;
  auVar219._12_4_ = fVar299 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar330,auVar241);
  auVar252._0_4_ = fVar313 * auVar223._0_4_;
  auVar252._4_4_ = fVar319 * auVar223._4_4_;
  auVar252._8_4_ = fVar320 * auVar223._8_4_;
  auVar252._12_4_ = fVar322 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar177,auVar241);
  auVar178._0_4_ = fVar313 * auVar223._0_4_;
  auVar178._4_4_ = fVar319 * auVar223._4_4_;
  auVar178._8_4_ = fVar320 * auVar223._8_4_;
  auVar178._12_4_ = fVar322 * auVar223._12_4_;
  auVar223 = vpminsd_avx(auVar133,auVar193);
  auVar182 = vpminsd_avx(auVar237,auVar219);
  auVar223 = vmaxps_avx(auVar223,auVar182);
  auVar182 = vpminsd_avx(auVar252,auVar178);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar288._4_4_ = uVar130;
  auVar288._0_4_ = uVar130;
  auVar288._8_4_ = uVar130;
  auVar288._12_4_ = uVar130;
  auVar182 = vmaxps_avx(auVar182,auVar288);
  auVar223 = vmaxps_avx(auVar223,auVar182);
  local_2b0._0_4_ = auVar223._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar223._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar223._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar223._12_4_ * 0.99999964;
  auVar223 = vpmaxsd_avx(auVar133,auVar193);
  auVar182 = vpmaxsd_avx(auVar237,auVar219);
  auVar223 = vminps_avx(auVar223,auVar182);
  auVar182 = vpmaxsd_avx(auVar252,auVar178);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar194._4_4_ = uVar130;
  auVar194._0_4_ = uVar130;
  auVar194._8_4_ = uVar130;
  auVar194._12_4_ = uVar130;
  auVar182 = vminps_avx(auVar182,auVar194);
  auVar223 = vminps_avx(auVar223,auVar182);
  auVar182 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar182 = vpcmpgtd_avx(auVar182,_DAT_01f4ad30);
  auVar134._0_4_ = auVar223._0_4_ * 1.0000004;
  auVar134._4_4_ = auVar223._4_4_ * 1.0000004;
  auVar134._8_4_ = auVar223._8_4_ * 1.0000004;
  auVar134._12_4_ = auVar223._12_4_ * 1.0000004;
  auVar223 = vcmpps_avx(local_2b0,auVar134,2);
  auVar223 = vandps_avx(auVar223,auVar182);
  uVar130 = vmovmskps_avx(auVar223);
  uVar123 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar130);
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_510 = pre->ray_space + k;
  local_6b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_6b0 = pre;
  local_508 = prim;
  do {
    if (uVar123 == 0) {
      return;
    }
    auVar142 = auVar335._0_32_;
    lVar129 = 0;
    if (uVar123 != 0) {
      for (; (uVar123 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    uVar125 = *(uint *)(local_508 + 2);
    uVar122 = *(uint *)(local_508 + lVar129 * 4 + 6);
    local_6a8 = (ulong)uVar122;
    pGVar128 = (context->scene->geometries).items[CONCAT44(0,uVar125)].ptr;
    uVar124 = (ulong)*(uint *)(*(long *)&pGVar128->field_0x58 +
                              local_6a8 *
                              pGVar128[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar313 = (pGVar128->time_range).lower;
    fVar313 = pGVar128->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar313) / ((pGVar128->time_range).upper - fVar313)
              );
    auVar223 = vroundss_avx(ZEXT416((uint)fVar313),ZEXT416((uint)fVar313),9);
    auVar223 = vminss_avx(auVar223,ZEXT416((uint)(pGVar128->fnumTimeSegments + -1.0)));
    auVar223 = vmaxss_avx(ZEXT816(0) << 0x20,auVar223);
    fVar313 = fVar313 - auVar223._0_4_;
    _Var13 = pGVar128[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar126 = (long)(int)auVar223._0_4_ * 0x38;
    lVar127 = *(long *)(_Var13 + 0x10 + lVar126);
    lVar14 = *(long *)(_Var13 + 0x38 + lVar126);
    lVar15 = *(long *)(_Var13 + 0x48 + lVar126);
    auVar223 = vshufps_avx(ZEXT416((uint)fVar313),ZEXT416((uint)fVar313),0);
    pfVar1 = (float *)(lVar14 + lVar15 * uVar124);
    fVar158 = auVar223._0_4_;
    fVar169 = auVar223._4_4_;
    fVar170 = auVar223._8_4_;
    fVar171 = auVar223._12_4_;
    lVar129 = uVar124 + 1;
    pfVar2 = (float *)(lVar14 + lVar15 * lVar129);
    p_Var16 = pGVar128[4].occlusionFilterN;
    auVar223 = vshufps_avx(ZEXT416((uint)(1.0 - fVar313)),ZEXT416((uint)(1.0 - fVar313)),0);
    pfVar3 = (float *)(*(long *)(_Var13 + lVar126) + lVar127 * uVar124);
    fVar313 = auVar223._0_4_;
    fVar319 = auVar223._4_4_;
    fVar320 = auVar223._8_4_;
    fVar322 = auVar223._12_4_;
    pfVar4 = (float *)(*(long *)(_Var13 + lVar126) + lVar127 * lVar129);
    pfVar5 = (float *)(*(long *)(p_Var16 + lVar126 + 0x38) +
                      uVar124 * *(long *)(p_Var16 + lVar126 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var16 + lVar126 + 0x38) +
                      *(long *)(p_Var16 + lVar126 + 0x48) * lVar129);
    fVar214 = fVar313 * *pfVar3 + fVar158 * *pfVar1;
    fVar229 = fVar319 * pfVar3[1] + fVar169 * pfVar1[1];
    auVar220._0_8_ = CONCAT44(fVar229,fVar214);
    auVar220._8_4_ = fVar320 * pfVar3[2] + fVar170 * pfVar1[2];
    auVar220._12_4_ = fVar322 * pfVar3[3] + fVar171 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var16 + lVar126) + *(long *)(p_Var16 + lVar126 + 0x10) * uVar124)
    ;
    fVar343 = fVar313 * *pfVar4 + fVar158 * *pfVar2;
    fVar346 = fVar319 * pfVar4[1] + fVar169 * pfVar2[1];
    auVar344._0_8_ = CONCAT44(fVar346,fVar343);
    auVar344._8_4_ = fVar320 * pfVar4[2] + fVar170 * pfVar2[2];
    auVar344._12_4_ = fVar322 * pfVar4[3] + fVar171 * pfVar2[3];
    pfVar2 = (float *)(*(long *)(p_Var16 + lVar126) + *(long *)(p_Var16 + lVar126 + 0x10) * lVar129)
    ;
    uVar11 = (uint)pGVar128[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar186 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    fVar267 = fVar214 + (fVar313 * *pfVar1 + fVar158 * *pfVar5) * 0.33333334;
    fVar276 = fVar229 + (fVar319 * pfVar1[1] + fVar169 * pfVar5[1]) * 0.33333334;
    auVar270._0_8_ = CONCAT44(fVar276,fVar267);
    auVar270._8_4_ = auVar220._8_4_ + (fVar320 * pfVar1[2] + fVar170 * pfVar5[2]) * 0.33333334;
    auVar270._12_4_ = auVar220._12_4_ + (fVar322 * pfVar1[3] + fVar171 * pfVar5[3]) * 0.33333334;
    auVar159._0_4_ = (fVar313 * *pfVar2 + fVar158 * *pfVar6) * 0.33333334;
    auVar159._4_4_ = (fVar319 * pfVar2[1] + fVar169 * pfVar6[1]) * 0.33333334;
    auVar159._8_4_ = (fVar320 * pfVar2[2] + fVar170 * pfVar6[2]) * 0.33333334;
    auVar159._12_4_ = (fVar322 * pfVar2[3] + fVar171 * pfVar6[3]) * 0.33333334;
    _local_790 = vsubps_avx(auVar344,auVar159);
    auVar197 = vsubps_avx(auVar220,auVar186);
    auVar223 = vshufps_avx(auVar197,auVar197,0);
    auVar182 = vshufps_avx(auVar197,auVar197,0x55);
    auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
    fVar313 = (local_510->vx).field_0.m128[0];
    fVar319 = (local_510->vx).field_0.m128[1];
    fVar320 = (local_510->vx).field_0.m128[2];
    fVar322 = (local_510->vx).field_0.m128[3];
    fVar158 = (local_510->vy).field_0.m128[0];
    fVar169 = (local_510->vy).field_0.m128[1];
    fVar170 = (local_510->vy).field_0.m128[2];
    fVar171 = (local_510->vy).field_0.m128[3];
    fVar249 = (local_510->vz).field_0.m128[0];
    fVar256 = (local_510->vz).field_0.m128[1];
    fVar258 = (local_510->vz).field_0.m128[2];
    fVar259 = (local_510->vz).field_0.m128[3];
    auVar221._0_4_ = auVar223._0_4_ * fVar313 + auVar182._0_4_ * fVar158 + fVar249 * auVar197._0_4_;
    auVar221._4_4_ = auVar223._4_4_ * fVar319 + auVar182._4_4_ * fVar169 + fVar256 * auVar197._4_4_;
    auVar221._8_4_ = auVar223._8_4_ * fVar320 + auVar182._8_4_ * fVar170 + fVar258 * auVar197._8_4_;
    auVar221._12_4_ =
         auVar223._12_4_ * fVar322 + auVar182._12_4_ * fVar171 + fVar259 * auVar197._12_4_;
    auVar223 = vblendps_avx(auVar221,auVar220,8);
    auVar184 = vsubps_avx(auVar270,auVar186);
    auVar182 = vshufps_avx(auVar184,auVar184,0);
    auVar197 = vshufps_avx(auVar184,auVar184,0x55);
    auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
    auVar238._0_8_ =
         CONCAT44(auVar182._4_4_ * fVar319 + auVar197._4_4_ * fVar169 + fVar256 * auVar184._4_4_,
                  auVar182._0_4_ * fVar313 + auVar197._0_4_ * fVar158 + fVar249 * auVar184._0_4_);
    auVar238._8_4_ = auVar182._8_4_ * fVar320 + auVar197._8_4_ * fVar170 + fVar258 * auVar184._8_4_;
    auVar238._12_4_ =
         auVar182._12_4_ * fVar322 + auVar197._12_4_ * fVar171 + fVar259 * auVar184._12_4_;
    auVar182 = vblendps_avx(auVar238,auVar270,8);
    auVar271 = vsubps_avx(_local_790,auVar186);
    auVar197 = vshufps_avx(auVar271,auVar271,0);
    auVar184 = vshufps_avx(auVar271,auVar271,0x55);
    auVar271 = vshufps_avx(auVar271,auVar271,0xaa);
    auVar222._0_4_ = auVar197._0_4_ * fVar313 + auVar184._0_4_ * fVar158 + auVar271._0_4_ * fVar249;
    auVar222._4_4_ = auVar197._4_4_ * fVar319 + auVar184._4_4_ * fVar169 + auVar271._4_4_ * fVar256;
    auVar222._8_4_ = auVar197._8_4_ * fVar320 + auVar184._8_4_ * fVar170 + auVar271._8_4_ * fVar258;
    auVar222._12_4_ =
         auVar197._12_4_ * fVar322 + auVar184._12_4_ * fVar171 + auVar271._12_4_ * fVar259;
    auVar197 = vblendps_avx(auVar222,_local_790,8);
    auVar271 = vsubps_avx(auVar344,auVar186);
    auVar186 = vshufps_avx(auVar271,auVar271,0);
    auVar184 = vshufps_avx(auVar271,auVar271,0x55);
    auVar271 = vshufps_avx(auVar271,auVar271,0xaa);
    auVar160._0_4_ = auVar186._0_4_ * fVar313 + auVar184._0_4_ * fVar158 + fVar249 * auVar271._0_4_;
    auVar160._4_4_ = auVar186._4_4_ * fVar319 + auVar184._4_4_ * fVar169 + fVar256 * auVar271._4_4_;
    auVar160._8_4_ = auVar186._8_4_ * fVar320 + auVar184._8_4_ * fVar170 + fVar258 * auVar271._8_4_;
    auVar160._12_4_ =
         auVar186._12_4_ * fVar322 + auVar184._12_4_ * fVar171 + fVar259 * auVar271._12_4_;
    auVar186 = vblendps_avx(auVar160,auVar344,8);
    auVar195._8_4_ = 0x7fffffff;
    auVar195._0_8_ = 0x7fffffff7fffffff;
    auVar195._12_4_ = 0x7fffffff;
    auVar223 = vandps_avx(auVar223,auVar195);
    auVar182 = vandps_avx(auVar182,auVar195);
    auVar184 = vmaxps_avx(auVar223,auVar182);
    auVar223 = vandps_avx(auVar197,auVar195);
    auVar182 = vandps_avx(auVar186,auVar195);
    auVar223 = vmaxps_avx(auVar223,auVar182);
    auVar223 = vmaxps_avx(auVar184,auVar223);
    auVar182 = vmovshdup_avx(auVar223);
    auVar182 = vmaxss_avx(auVar182,auVar223);
    auVar223 = vshufpd_avx(auVar223,auVar223,1);
    auVar223 = vmaxss_avx(auVar223,auVar182);
    lVar129 = (long)(int)uVar11 * 0x44;
    fVar296 = *(float *)(bezier_basis0 + lVar129 + 0x908);
    fVar299 = *(float *)(bezier_basis0 + lVar129 + 0x90c);
    fVar206 = *(float *)(bezier_basis0 + lVar129 + 0x910);
    fVar321 = *(float *)(bezier_basis0 + lVar129 + 0x914);
    fVar211 = *(float *)(bezier_basis0 + lVar129 + 0x918);
    fVar323 = *(float *)(bezier_basis0 + lVar129 + 0x91c);
    fVar172 = *(float *)(bezier_basis0 + lVar129 + 0x920);
    auVar182 = vshufps_avx(auVar222,auVar222,0);
    register0x00001310 = auVar182;
    _local_7e0 = auVar182;
    auVar197 = vshufps_avx(auVar222,auVar222,0x55);
    register0x00001290 = auVar197;
    _local_820 = auVar197;
    pauVar8 = (undefined1 (*) [32])(bezier_basis0 + lVar129 + 0xd8c);
    fVar322 = *(float *)*pauVar8;
    fVar158 = *(float *)(bezier_basis0 + lVar129 + 0xd90);
    fVar169 = *(float *)(bezier_basis0 + lVar129 + 0xd94);
    fVar170 = *(float *)(bezier_basis0 + lVar129 + 0xd98);
    fVar171 = *(float *)(bezier_basis0 + lVar129 + 0xd9c);
    fVar249 = *(float *)(bezier_basis0 + lVar129 + 0xda0);
    fVar256 = *(float *)(bezier_basis0 + lVar129 + 0xda4);
    auVar117 = *(undefined1 (*) [28])*pauVar8;
    _auStack_590 = SUB3216(*pauVar8,0x10);
    auVar186 = vshufps_avx(auVar160,auVar160,0);
    register0x00001210 = auVar186;
    _local_460 = auVar186;
    fVar149 = auVar186._0_4_;
    fVar151 = auVar186._4_4_;
    fVar154 = auVar186._8_4_;
    fVar152 = auVar186._12_4_;
    fVar215 = auVar182._0_4_;
    fVar230 = auVar182._4_4_;
    fVar232 = auVar182._8_4_;
    fVar234 = auVar182._12_4_;
    auVar182 = vshufps_avx(auVar160,auVar160,0x55);
    register0x00001550 = auVar182;
    _local_680 = auVar182;
    fVar312 = auVar182._0_4_;
    fVar340 = auVar182._4_4_;
    fVar341 = auVar182._8_4_;
    fVar342 = auVar182._12_4_;
    fVar174 = auVar197._0_4_;
    fVar189 = auVar197._4_4_;
    fVar190 = auVar197._8_4_;
    fVar191 = auVar197._12_4_;
    auVar182 = vshufps_avx(_local_790,_local_790,0xff);
    register0x000013d0 = auVar182;
    _local_80 = auVar182;
    auVar197 = vshufps_avx(auVar344,auVar344,0xff);
    register0x00001590 = auVar197;
    _local_a0 = auVar197;
    fVar260 = auVar197._0_4_;
    fVar263 = auVar197._4_4_;
    fVar265 = auVar197._8_4_;
    fVar285 = auVar197._12_4_;
    fVar216 = auVar182._0_4_;
    fVar231 = auVar182._4_4_;
    fVar233 = auVar182._8_4_;
    fVar157 = auVar182._12_4_;
    auVar108._8_4_ = auVar238._8_4_;
    auVar108._0_8_ = auVar238._0_8_;
    auVar108._12_4_ = auVar238._12_4_;
    auVar182 = vshufps_avx(auVar108,auVar108,0);
    register0x00001490 = auVar182;
    _local_7c0 = auVar182;
    fVar258 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x484);
    fVar259 = *(float *)(bezier_basis0 + lVar129 + 0x488);
    fVar283 = *(float *)(bezier_basis0 + lVar129 + 0x48c);
    fVar293 = *(float *)(bezier_basis0 + lVar129 + 0x490);
    fVar324 = *(float *)(bezier_basis0 + lVar129 + 0x494);
    fVar336 = *(float *)(bezier_basis0 + lVar129 + 0x498);
    fVar325 = *(float *)(bezier_basis0 + lVar129 + 0x49c);
    auVar118 = *(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x484);
    fVar235 = auVar182._0_4_;
    fVar309 = auVar182._4_4_;
    fVar310 = auVar182._8_4_;
    fVar311 = auVar182._12_4_;
    auVar182 = vshufps_avx(auVar108,auVar108,0x55);
    register0x000015d0 = auVar182;
    _local_480 = auVar182;
    fVar295 = auVar182._0_4_;
    fVar298 = auVar182._4_4_;
    fVar301 = auVar182._8_4_;
    fVar302 = auVar182._12_4_;
    auVar197 = vpermilps_avx(auVar270,0xff);
    register0x00001310 = auVar197;
    _local_c0 = auVar197;
    fVar313 = auVar197._0_4_;
    fVar319 = auVar197._4_4_;
    fVar320 = auVar197._8_4_;
    auVar182 = vshufps_avx(auVar221,auVar221,0);
    register0x00001390 = auVar182;
    _local_160 = auVar182;
    pauVar8 = (undefined1 (*) [32])(bezier_basis0 + lVar129);
    fVar204 = *(float *)*pauVar8;
    fVar327 = *(float *)(bezier_basis0 + lVar129 + 4);
    fVar326 = *(float *)(bezier_basis0 + lVar129 + 8);
    fVar268 = *(float *)(bezier_basis0 + lVar129 + 0xc);
    fVar205 = *(float *)(bezier_basis0 + lVar129 + 0x10);
    fVar261 = *(float *)(bezier_basis0 + lVar129 + 0x14);
    fVar277 = *(float *)(bezier_basis0 + lVar129 + 0x18);
    auVar119 = *(undefined1 (*) [28])*pauVar8;
    fVar207 = auVar182._0_4_;
    fVar209 = auVar182._4_4_;
    fVar212 = auVar182._8_4_;
    fVar266 = auVar182._12_4_;
    auVar316._0_4_ = fVar207 * fVar204 + fVar235 * fVar258 + fVar215 * fVar296 + fVar149 * fVar322;
    auVar316._4_4_ = fVar209 * fVar327 + fVar309 * fVar259 + fVar230 * fVar299 + fVar151 * fVar158;
    auVar316._8_4_ = fVar212 * fVar326 + fVar310 * fVar283 + fVar232 * fVar206 + fVar154 * fVar169;
    auVar316._12_4_ = fVar266 * fVar268 + fVar311 * fVar293 + fVar234 * fVar321 + fVar152 * fVar170;
    auVar317._16_4_ = fVar207 * fVar205 + fVar235 * fVar324 + fVar215 * fVar211 + fVar149 * fVar171;
    auVar317._0_16_ = auVar316;
    auVar317._20_4_ = fVar209 * fVar261 + fVar309 * fVar336 + fVar230 * fVar323 + fVar151 * fVar249;
    auVar317._24_4_ = fVar212 * fVar277 + fVar310 * fVar325 + fVar232 * fVar172 + fVar154 * fVar256;
    auVar317._28_4_ = fVar266 + fVar152 + 0.0 + 0.0;
    auVar182 = vshufps_avx(auVar221,auVar221,0x55);
    local_620._16_16_ = auVar182;
    local_620._0_16_ = auVar182;
    fVar297 = auVar182._0_4_;
    fVar300 = auVar182._4_4_;
    fVar250 = auVar182._8_4_;
    fVar257 = auVar182._12_4_;
    auVar272._0_4_ = fVar297 * fVar204 + fVar295 * fVar258 + fVar174 * fVar296 + fVar312 * fVar322;
    auVar272._4_4_ = fVar300 * fVar327 + fVar298 * fVar259 + fVar189 * fVar299 + fVar340 * fVar158;
    auVar272._8_4_ = fVar250 * fVar326 + fVar301 * fVar283 + fVar190 * fVar206 + fVar341 * fVar169;
    auVar272._12_4_ = fVar257 * fVar268 + fVar302 * fVar293 + fVar191 * fVar321 + fVar342 * fVar170;
    auVar272._16_4_ = fVar297 * fVar205 + fVar295 * fVar324 + fVar174 * fVar211 + fVar312 * fVar171;
    auVar272._20_4_ = fVar300 * fVar261 + fVar298 * fVar336 + fVar189 * fVar323 + fVar340 * fVar249;
    auVar272._24_4_ = fVar250 * fVar277 + fVar301 * fVar325 + fVar190 * fVar172 + fVar341 * fVar256;
    auVar272._28_4_ = fVar191 + 0.0 + 0.0 + 0.0;
    auVar182 = vpermilps_avx(auVar220,0xff);
    register0x00001450 = auVar182;
    _local_e0 = auVar182;
    _local_2e0 = *pauVar8;
    auVar147 = _local_2e0;
    fVar248 = auVar182._0_4_;
    fVar284 = auVar182._4_4_;
    fVar294 = auVar182._8_4_;
    local_8c0._0_4_ = fVar248 * fVar204 + fVar258 * fVar313 + fVar216 * fVar296 + fVar260 * fVar322;
    local_8c0._4_4_ = fVar284 * fVar327 + fVar259 * fVar319 + fVar231 * fVar299 + fVar263 * fVar158;
    fStack_8b8 = fVar294 * fVar326 + fVar283 * fVar320 + fVar233 * fVar206 + fVar265 * fVar169;
    fStack_8b4 = auVar182._12_4_ * fVar268 +
                 fVar293 * auVar197._12_4_ + fVar157 * fVar321 + fVar285 * fVar170;
    fStack_8b0 = fVar248 * fVar205 + fVar324 * fVar313 + fVar216 * fVar211 + fVar260 * fVar171;
    fStack_8ac = fVar284 * fVar261 + fVar336 * fVar319 + fVar231 * fVar323 + fVar263 * fVar249;
    fStack_8a8 = fVar294 * fVar277 + fVar325 * fVar320 + fVar233 * fVar172 + fVar265 * fVar256;
    fStack_8a4 = *(float *)(bezier_basis0 + lVar129 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar324 = *(float *)(bezier_basis1 + lVar129 + 0x908);
    fVar336 = *(float *)(bezier_basis1 + lVar129 + 0x90c);
    fVar325 = *(float *)(bezier_basis1 + lVar129 + 0x910);
    fVar204 = *(float *)(bezier_basis1 + lVar129 + 0x914);
    fVar327 = *(float *)(bezier_basis1 + lVar129 + 0x918);
    fVar326 = *(float *)(bezier_basis1 + lVar129 + 0x91c);
    fVar268 = *(float *)(bezier_basis1 + lVar129 + 0x920);
    fVar205 = *(float *)(bezier_basis1 + lVar129 + 0xd8c);
    fVar261 = *(float *)(bezier_basis1 + lVar129 + 0xd90);
    fVar277 = *(float *)(bezier_basis1 + lVar129 + 0xd94);
    fVar278 = *(float *)(bezier_basis1 + lVar129 + 0xd98);
    fVar208 = *(float *)(bezier_basis1 + lVar129 + 0xd9c);
    fVar262 = *(float *)(bezier_basis1 + lVar129 + 0xda0);
    fVar279 = *(float *)(bezier_basis1 + lVar129 + 0xda4);
    fVar280 = *(float *)(bezier_basis1 + lVar129 + 0x484);
    fVar210 = *(float *)(bezier_basis1 + lVar129 + 0x488);
    fVar264 = *(float *)(bezier_basis1 + lVar129 + 0x48c);
    fVar281 = *(float *)(bezier_basis1 + lVar129 + 0x490);
    fVar282 = *(float *)(bezier_basis1 + lVar129 + 0x494);
    fVar213 = *(float *)(bezier_basis1 + lVar129 + 0x498);
    fVar173 = *(float *)(bezier_basis1 + lVar129 + 0x49c);
    fVar322 = fVar342 + fStack_8a4 + 0.0;
    fVar305 = *(float *)(bezier_basis1 + lVar129);
    fVar148 = *(float *)(bezier_basis1 + lVar129 + 4);
    fVar150 = *(float *)(bezier_basis1 + lVar129 + 8);
    fVar153 = *(float *)(bezier_basis1 + lVar129 + 0xc);
    fVar155 = *(float *)(bezier_basis1 + lVar129 + 0x10);
    fVar156 = *(float *)(bezier_basis1 + lVar129 + 0x14);
    fVar131 = *(float *)(bezier_basis1 + lVar129 + 0x18);
    auVar224._0_4_ = fVar207 * fVar305 + fVar235 * fVar280 + fVar215 * fVar324 + fVar205 * fVar149;
    auVar224._4_4_ = fVar209 * fVar148 + fVar309 * fVar210 + fVar230 * fVar336 + fVar261 * fVar151;
    auVar224._8_4_ = fVar212 * fVar150 + fVar310 * fVar264 + fVar232 * fVar325 + fVar277 * fVar154;
    auVar224._12_4_ = fVar266 * fVar153 + fVar311 * fVar281 + fVar234 * fVar204 + fVar278 * fVar152;
    auVar224._16_4_ = fVar207 * fVar155 + fVar235 * fVar282 + fVar215 * fVar327 + fVar208 * fVar149;
    auVar224._20_4_ = fVar209 * fVar156 + fVar309 * fVar213 + fVar230 * fVar326 + fVar262 * fVar151;
    auVar224._24_4_ = fVar212 * fVar131 + fVar310 * fVar173 + fVar232 * fVar268 + fVar279 * fVar154;
    auVar224._28_4_ = fVar285 + fVar322;
    local_580._0_4_ = fVar297 * fVar305 + fVar295 * fVar280 + fVar324 * fVar174 + fVar312 * fVar205;
    local_580._4_4_ = fVar300 * fVar148 + fVar298 * fVar210 + fVar336 * fVar189 + fVar340 * fVar261;
    fStack_578 = fVar250 * fVar150 + fVar301 * fVar264 + fVar325 * fVar190 + fVar341 * fVar277;
    fStack_574 = fVar257 * fVar153 + fVar302 * fVar281 + fVar204 * fVar191 + fVar342 * fVar278;
    fStack_570 = fVar297 * fVar155 + fVar295 * fVar282 + fVar327 * fVar174 + fVar312 * fVar208;
    fStack_56c = fVar300 * fVar156 + fVar298 * fVar213 + fVar326 * fVar189 + fVar340 * fVar262;
    fStack_568 = fVar250 * fVar131 + fVar301 * fVar173 + fVar268 * fVar190 + fVar341 * fVar279;
    fStack_564 = fVar322 + fVar342 + fVar266 + 0.0;
    auVar239._0_4_ = fVar313 * fVar280 + fVar216 * fVar324 + fVar260 * fVar205 + fVar248 * fVar305;
    auVar239._4_4_ = fVar319 * fVar210 + fVar231 * fVar336 + fVar263 * fVar261 + fVar284 * fVar148;
    auVar239._8_4_ = fVar320 * fVar264 + fVar233 * fVar325 + fVar265 * fVar277 + fVar294 * fVar150;
    auVar239._12_4_ =
         auVar197._12_4_ * fVar281 + fVar157 * fVar204 + fVar285 * fVar278 +
         auVar182._12_4_ * fVar153;
    auVar239._16_4_ = fVar313 * fVar282 + fVar216 * fVar327 + fVar260 * fVar208 + fVar248 * fVar155;
    auVar239._20_4_ = fVar319 * fVar213 + fVar231 * fVar326 + fVar263 * fVar262 + fVar284 * fVar156;
    auVar239._24_4_ = fVar320 * fVar173 + fVar233 * fVar268 + fVar265 * fVar279 + fVar294 * fVar131;
    auVar239._28_4_ = fVar342 + fVar157 + fVar266 + fVar322;
    auVar26 = vsubps_avx(auVar224,auVar317);
    auVar27 = vsubps_avx(_local_580,auVar272);
    fVar313 = auVar26._0_4_;
    fVar320 = auVar26._4_4_;
    auVar20._4_4_ = auVar272._4_4_ * fVar320;
    auVar20._0_4_ = auVar272._0_4_ * fVar313;
    fVar158 = auVar26._8_4_;
    auVar20._8_4_ = auVar272._8_4_ * fVar158;
    fVar170 = auVar26._12_4_;
    auVar20._12_4_ = auVar272._12_4_ * fVar170;
    fVar249 = auVar26._16_4_;
    auVar20._16_4_ = auVar272._16_4_ * fVar249;
    fVar258 = auVar26._20_4_;
    auVar20._20_4_ = auVar272._20_4_ * fVar258;
    fVar283 = auVar26._24_4_;
    auVar20._24_4_ = auVar272._24_4_ * fVar283;
    auVar20._28_4_ = fVar322;
    fVar319 = auVar27._0_4_;
    fVar322 = auVar27._4_4_;
    auVar28._4_4_ = auVar316._4_4_ * fVar322;
    auVar28._0_4_ = auVar316._0_4_ * fVar319;
    fVar169 = auVar27._8_4_;
    auVar28._8_4_ = auVar316._8_4_ * fVar169;
    fVar171 = auVar27._12_4_;
    auVar28._12_4_ = auVar316._12_4_ * fVar171;
    fVar256 = auVar27._16_4_;
    auVar28._16_4_ = auVar317._16_4_ * fVar256;
    fVar259 = auVar27._20_4_;
    auVar28._20_4_ = auVar317._20_4_ * fVar259;
    fVar293 = auVar27._24_4_;
    auVar28._24_4_ = auVar317._24_4_ * fVar293;
    auVar28._28_4_ = fStack_564;
    auVar28 = vsubps_avx(auVar20,auVar28);
    auVar20 = vmaxps_avx(_local_8c0,auVar239);
    auVar34._4_4_ = auVar20._4_4_ * auVar20._4_4_ * (fVar320 * fVar320 + fVar322 * fVar322);
    auVar34._0_4_ = auVar20._0_4_ * auVar20._0_4_ * (fVar313 * fVar313 + fVar319 * fVar319);
    auVar34._8_4_ = auVar20._8_4_ * auVar20._8_4_ * (fVar158 * fVar158 + fVar169 * fVar169);
    auVar34._12_4_ = auVar20._12_4_ * auVar20._12_4_ * (fVar170 * fVar170 + fVar171 * fVar171);
    auVar34._16_4_ = auVar20._16_4_ * auVar20._16_4_ * (fVar249 * fVar249 + fVar256 * fVar256);
    auVar34._20_4_ = auVar20._20_4_ * auVar20._20_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
    auVar34._24_4_ = auVar20._24_4_ * auVar20._24_4_ * (fVar283 * fVar283 + fVar293 * fVar293);
    auVar34._28_4_ = auVar224._28_4_ + fStack_564;
    auVar21._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar21._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar21._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar21._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar21._16_4_ = auVar28._16_4_ * auVar28._16_4_;
    auVar21._20_4_ = auVar28._20_4_ * auVar28._20_4_;
    auVar21._24_4_ = auVar28._24_4_ * auVar28._24_4_;
    auVar21._28_4_ = auVar28._28_4_;
    auVar20 = vcmpps_avx(auVar21,auVar34,2);
    auVar196._0_4_ = (float)(int)uVar11;
    auVar196._4_12_ = auVar316._4_12_;
    auVar184 = ZEXT416((uint)(auVar223._0_4_ * 4.7683716e-07));
    local_860._0_16_ = auVar184;
    auVar223 = vshufps_avx(auVar196,auVar196,0);
    auVar198._16_16_ = auVar223;
    auVar198._0_16_ = auVar223;
    auVar28 = vcmpps_avx(_DAT_01f7b060,auVar198,1);
    auVar223 = vpermilps_avx(auVar221,0xaa);
    register0x00001450 = auVar223;
    _local_5e0 = auVar223;
    auVar109._8_4_ = auVar238._8_4_;
    auVar109._0_8_ = auVar238._0_8_;
    auVar109._12_4_ = auVar238._12_4_;
    auVar182 = vpermilps_avx(auVar109,0xaa);
    register0x00001550 = auVar182;
    _local_100 = auVar182;
    auVar197 = vpermilps_avx(auVar222,0xaa);
    register0x00001590 = auVar197;
    _local_120 = auVar197;
    auVar186 = vpermilps_avx(auVar160,0xaa);
    register0x00001310 = auVar186;
    _local_740 = auVar186;
    auVar34 = auVar28 & auVar20;
    local_840 = *(uint *)(ray + k * 4 + 0x30);
    uStack_83c = 0;
    uStack_838 = 0;
    uStack_834 = 0;
    uStack_6c8 = auVar160._8_8_;
    local_6d0 = CONCAT44(0,uVar125);
    auVar271 = ZEXT416(uVar125);
    local_630 = ZEXT416(uVar122);
    uStack_878 = auVar220._8_8_;
    uStack_888 = auVar270._8_8_;
    fVar313 = fVar312;
    fVar319 = fVar340;
    fVar320 = fVar341;
    fVar322 = fVar342;
    fVar158 = fVar235;
    fVar169 = fVar309;
    fVar170 = fVar310;
    fVar171 = fVar174;
    fVar249 = fVar189;
    fVar256 = fVar190;
    fVar258 = fVar215;
    fVar259 = fVar230;
    fVar283 = fVar232;
    _local_780 = auVar344;
    local_420 = auVar196._0_4_;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
      auVar335 = ZEXT3264(auVar142);
      auVar255 = ZEXT3264(local_620);
LAB_00908834:
      auVar184 = local_860._0_16_;
    }
    else {
      auVar271 = ZEXT416(uVar125);
      local_600._0_16_ = auVar271;
      local_300 = vandps_avx(auVar20,auVar28);
      fVar248 = auVar223._0_4_;
      fVar284 = auVar223._4_4_;
      fVar294 = auVar223._8_4_;
      fVar260 = auVar223._12_4_;
      fVar263 = auVar182._0_4_;
      fVar265 = auVar182._4_4_;
      fVar285 = auVar182._8_4_;
      fVar303 = auVar182._12_4_;
      fVar304 = auVar197._0_4_;
      fVar347 = auVar197._4_4_;
      fVar348 = auVar197._8_4_;
      fVar349 = auVar197._12_4_;
      fVar216 = auVar186._0_4_;
      fVar231 = auVar186._4_4_;
      fVar233 = auVar186._8_4_;
      fVar157 = auVar186._12_4_;
      fVar293 = auVar28._28_4_ + *(float *)(bezier_basis1 + lVar129 + 0x924) + 0.0;
      local_320 = auVar26;
      local_4a0 = fVar248 * fVar305 + fVar263 * fVar280 + fVar304 * fVar324 + fVar216 * fVar205;
      fStack_49c = fVar284 * fVar148 + fVar265 * fVar210 + fVar347 * fVar336 + fVar231 * fVar261;
      fStack_498 = fVar294 * fVar150 + fVar285 * fVar264 + fVar348 * fVar325 + fVar233 * fVar277;
      fStack_494 = fVar260 * fVar153 + fVar303 * fVar281 + fVar349 * fVar204 + fVar157 * fVar278;
      fStack_490 = fVar248 * fVar155 + fVar263 * fVar282 + fVar304 * fVar327 + fVar216 * fVar208;
      fStack_48c = fVar284 * fVar156 + fVar265 * fVar213 + fVar347 * fVar326 + fVar231 * fVar262;
      fStack_488 = fVar294 * fVar131 + fVar285 * fVar173 + fVar348 * fVar268 + fVar233 * fVar279;
      fStack_484 = local_300._28_4_ + fVar293;
      local_2e0._0_4_ = auVar119._0_4_;
      local_2e0._4_4_ = auVar119._4_4_;
      fStack_2d8 = auVar119._8_4_;
      fStack_2d4 = auVar119._12_4_;
      fStack_2d0 = auVar119._16_4_;
      fStack_2cc = auVar119._20_4_;
      fStack_2c8 = auVar119._24_4_;
      local_5c0._0_4_ = auVar118._0_4_;
      local_5c0._4_4_ = auVar118._4_4_;
      fStack_5b8 = auVar118._8_4_;
      fStack_5b4 = auVar118._12_4_;
      fStack_5b0 = auVar118._16_4_;
      fStack_5ac = auVar118._20_4_;
      fStack_5a8 = auVar118._24_4_;
      local_5a0._0_4_ = auVar117._0_4_;
      local_5a0._4_4_ = auVar117._4_4_;
      fStack_598 = auVar117._8_4_;
      fStack_594 = auVar117._12_4_;
      auStack_590._0_4_ = auVar117._16_4_;
      auStack_590._4_4_ = auVar117._20_4_;
      fStack_588 = auVar117._24_4_;
      local_720 = fVar248 * (float)local_2e0._0_4_ +
                  fVar263 * (float)local_5c0._0_4_ +
                  fVar304 * fVar296 + fVar216 * (float)local_5a0._0_4_;
      fStack_71c = fVar284 * (float)local_2e0._4_4_ +
                   fVar265 * (float)local_5c0._4_4_ +
                   fVar347 * fVar299 + fVar231 * (float)local_5a0._4_4_;
      fStack_718 = fVar294 * fStack_2d8 +
                   fVar285 * fStack_5b8 + fVar348 * fVar206 + fVar233 * fStack_598;
      fStack_714 = fVar260 * fStack_2d4 +
                   fVar303 * fStack_5b4 + fVar349 * fVar321 + fVar157 * fStack_594;
      fStack_710 = fVar248 * fStack_2d0 +
                   fVar263 * fStack_5b0 + fVar304 * fVar211 + fVar216 * (float)auStack_590._0_4_;
      fStack_70c = fVar284 * fStack_2cc +
                   fVar265 * fStack_5ac + fVar347 * fVar323 + fVar231 * (float)auStack_590._4_4_;
      fStack_708 = fVar294 * fStack_2c8 +
                   fVar285 * fStack_5a8 + fVar348 * fVar172 + fVar233 * fStack_588;
      fStack_704 = fStack_484 + fVar293 + local_300._28_4_ + auVar28._28_4_;
      fVar293 = *(float *)(bezier_basis0 + lVar129 + 0x1210);
      fVar296 = *(float *)(bezier_basis0 + lVar129 + 0x1214);
      fVar299 = *(float *)(bezier_basis0 + lVar129 + 0x1218);
      fVar206 = *(float *)(bezier_basis0 + lVar129 + 0x121c);
      fVar321 = *(float *)(bezier_basis0 + lVar129 + 0x1220);
      fVar211 = *(float *)(bezier_basis0 + lVar129 + 0x1224);
      fVar323 = *(float *)(bezier_basis0 + lVar129 + 0x1228);
      fVar172 = *(float *)(bezier_basis0 + lVar129 + 0x1694);
      fVar324 = *(float *)(bezier_basis0 + lVar129 + 0x1698);
      fVar336 = *(float *)(bezier_basis0 + lVar129 + 0x169c);
      fVar325 = *(float *)(bezier_basis0 + lVar129 + 0x16a0);
      fVar204 = *(float *)(bezier_basis0 + lVar129 + 0x16a4);
      fVar327 = *(float *)(bezier_basis0 + lVar129 + 0x16a8);
      fVar326 = *(float *)(bezier_basis0 + lVar129 + 0x16ac);
      fVar268 = *(float *)(bezier_basis0 + lVar129 + 0x1b18);
      fVar205 = *(float *)(bezier_basis0 + lVar129 + 0x1b1c);
      fVar261 = *(float *)(bezier_basis0 + lVar129 + 0x1b20);
      fVar277 = *(float *)(bezier_basis0 + lVar129 + 0x1b24);
      fVar278 = *(float *)(bezier_basis0 + lVar129 + 0x1b28);
      fVar208 = *(float *)(bezier_basis0 + lVar129 + 0x1b2c);
      fVar262 = *(float *)(bezier_basis0 + lVar129 + 0x1b30);
      fVar279 = *(float *)(bezier_basis0 + lVar129 + 0x1f9c);
      fVar280 = *(float *)(bezier_basis0 + lVar129 + 0x1fa0);
      fVar210 = *(float *)(bezier_basis0 + lVar129 + 0x1fa4);
      fVar264 = *(float *)(bezier_basis0 + lVar129 + 0x1fa8);
      fVar281 = *(float *)(bezier_basis0 + lVar129 + 0x1fac);
      fVar282 = *(float *)(bezier_basis0 + lVar129 + 0x1fb0);
      fVar213 = *(float *)(bezier_basis0 + lVar129 + 0x1fb4);
      fVar173 = *(float *)(bezier_basis0 + lVar129 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar129 + 0x1fb8);
      fVar305 = *(float *)(bezier_basis0 + lVar129 + 0x16b0) + fVar173;
      local_5c0._4_4_ =
           fVar209 * fVar296 + fVar309 * fVar324 + fVar230 * fVar205 + fVar151 * fVar280;
      local_5c0._0_4_ =
           fVar207 * fVar293 + fVar235 * fVar172 + fVar215 * fVar268 + fVar149 * fVar279;
      fStack_5b8 = fVar212 * fVar299 + fVar310 * fVar336 + fVar232 * fVar261 + fVar154 * fVar210;
      fStack_5b4 = fVar266 * fVar206 + fVar311 * fVar325 + fVar234 * fVar277 + fVar152 * fVar264;
      fStack_5b0 = fVar207 * fVar321 + fVar235 * fVar204 + fVar215 * fVar278 + fVar149 * fVar281;
      fStack_5ac = fVar209 * fVar211 + fVar309 * fVar327 + fVar230 * fVar208 + fVar151 * fVar282;
      fStack_5a8 = fVar212 * fVar323 + fVar310 * fVar326 + fVar232 * fVar262 + fVar154 * fVar213;
      fStack_5a4 = *(float *)(bezier_basis0 + lVar129 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar129 + 0x1fb8) +
                   fVar260 + *(float *)(bezier_basis1 + lVar129 + 0x4a0);
      auVar163._0_4_ = fVar297 * fVar293 + fVar174 * fVar268 + fVar312 * fVar279 + fVar295 * fVar172
      ;
      auVar163._4_4_ = fVar300 * fVar296 + fVar189 * fVar205 + fVar340 * fVar280 + fVar298 * fVar324
      ;
      auVar163._8_4_ = fVar250 * fVar299 + fVar190 * fVar261 + fVar341 * fVar210 + fVar301 * fVar336
      ;
      auVar163._12_4_ =
           fVar257 * fVar206 + fVar191 * fVar277 + fVar342 * fVar264 + fVar302 * fVar325;
      auVar163._16_4_ =
           fVar297 * fVar321 + fVar174 * fVar278 + fVar312 * fVar281 + fVar295 * fVar204;
      auVar163._20_4_ =
           fVar300 * fVar211 + fVar189 * fVar208 + fVar340 * fVar282 + fVar298 * fVar327;
      auVar163._24_4_ =
           fVar250 * fVar323 + fVar190 * fVar262 + fVar341 * fVar213 + fVar301 * fVar326;
      auVar163._28_4_ =
           fVar173 + fVar260 + 0.0 + fVar260 + *(float *)(bezier_basis1 + lVar129 + 0x4a0);
      auVar242._0_4_ = fVar263 * fVar172 + fVar304 * fVar268 + fVar216 * fVar279 + fVar248 * fVar293
      ;
      auVar242._4_4_ = fVar265 * fVar324 + fVar347 * fVar205 + fVar231 * fVar280 + fVar284 * fVar296
      ;
      auVar242._8_4_ = fVar285 * fVar336 + fVar348 * fVar261 + fVar233 * fVar210 + fVar294 * fVar299
      ;
      auVar242._12_4_ =
           fVar303 * fVar325 + fVar349 * fVar277 + fVar157 * fVar264 + fVar260 * fVar206;
      auVar242._16_4_ =
           fVar263 * fVar204 + fVar304 * fVar278 + fVar216 * fVar281 + fVar248 * fVar321;
      auVar242._20_4_ =
           fVar265 * fVar327 + fVar347 * fVar208 + fVar231 * fVar282 + fVar284 * fVar211;
      auVar242._24_4_ =
           fVar285 * fVar326 + fVar348 * fVar262 + fVar233 * fVar213 + fVar294 * fVar323;
      auVar242._28_4_ = fVar305 + *(float *)(bezier_basis0 + lVar129 + 0x122c);
      fVar293 = *(float *)(bezier_basis1 + lVar129 + 0x1b18);
      fVar296 = *(float *)(bezier_basis1 + lVar129 + 0x1b1c);
      fVar299 = *(float *)(bezier_basis1 + lVar129 + 0x1b20);
      fVar206 = *(float *)(bezier_basis1 + lVar129 + 0x1b24);
      fVar321 = *(float *)(bezier_basis1 + lVar129 + 0x1b28);
      fVar211 = *(float *)(bezier_basis1 + lVar129 + 0x1b2c);
      fVar323 = *(float *)(bezier_basis1 + lVar129 + 0x1b30);
      fVar172 = *(float *)(bezier_basis1 + lVar129 + 0x1f9c);
      fVar324 = *(float *)(bezier_basis1 + lVar129 + 0x1fa0);
      fVar336 = *(float *)(bezier_basis1 + lVar129 + 0x1fa4);
      fVar325 = *(float *)(bezier_basis1 + lVar129 + 0x1fa8);
      fVar204 = *(float *)(bezier_basis1 + lVar129 + 0x1fac);
      fVar327 = *(float *)(bezier_basis1 + lVar129 + 0x1fb0);
      fVar326 = *(float *)(bezier_basis1 + lVar129 + 0x1fb4);
      fVar268 = *(float *)(bezier_basis1 + lVar129 + 0x1694);
      fVar205 = *(float *)(bezier_basis1 + lVar129 + 0x1698);
      fVar261 = *(float *)(bezier_basis1 + lVar129 + 0x169c);
      fVar277 = *(float *)(bezier_basis1 + lVar129 + 0x16a0);
      fVar278 = *(float *)(bezier_basis1 + lVar129 + 0x16a4);
      fVar208 = *(float *)(bezier_basis1 + lVar129 + 0x16a8);
      fVar262 = *(float *)(bezier_basis1 + lVar129 + 0x16ac);
      fVar279 = *(float *)(bezier_basis1 + lVar129 + 0x1210);
      fVar280 = *(float *)(bezier_basis1 + lVar129 + 0x1214);
      fVar210 = *(float *)(bezier_basis1 + lVar129 + 0x1218);
      fVar264 = *(float *)(bezier_basis1 + lVar129 + 0x121c);
      fVar281 = *(float *)(bezier_basis1 + lVar129 + 0x1220);
      fVar282 = *(float *)(bezier_basis1 + lVar129 + 0x1224);
      fVar213 = *(float *)(bezier_basis1 + lVar129 + 0x1228);
      auVar253._0_4_ = fVar207 * fVar279 + fVar235 * fVar268 + fVar215 * fVar293 + fVar149 * fVar172
      ;
      auVar253._4_4_ = fVar209 * fVar280 + fVar309 * fVar205 + fVar230 * fVar296 + fVar151 * fVar324
      ;
      auVar253._8_4_ = fVar212 * fVar210 + fVar310 * fVar261 + fVar232 * fVar299 + fVar154 * fVar336
      ;
      auVar253._12_4_ =
           fVar266 * fVar264 + fVar311 * fVar277 + fVar234 * fVar206 + fVar152 * fVar325;
      auVar253._16_4_ =
           fVar207 * fVar281 + fVar235 * fVar278 + fVar215 * fVar321 + fVar149 * fVar204;
      auVar253._20_4_ =
           fVar209 * fVar282 + fVar309 * fVar208 + fVar230 * fVar211 + fVar151 * fVar327;
      auVar253._24_4_ =
           fVar212 * fVar213 + fVar310 * fVar262 + fVar232 * fVar323 + fVar154 * fVar326;
      auVar253._28_4_ = fVar152 + fVar152 + fVar305 + fVar152;
      auVar289._0_4_ = fVar297 * fVar279 + fVar295 * fVar268 + fVar174 * fVar293 + fVar312 * fVar172
      ;
      auVar289._4_4_ = fVar300 * fVar280 + fVar298 * fVar205 + fVar189 * fVar296 + fVar340 * fVar324
      ;
      auVar289._8_4_ = fVar250 * fVar210 + fVar301 * fVar261 + fVar190 * fVar299 + fVar341 * fVar336
      ;
      auVar289._12_4_ =
           fVar257 * fVar264 + fVar302 * fVar277 + fVar191 * fVar206 + fVar342 * fVar325;
      auVar289._16_4_ =
           fVar297 * fVar281 + fVar295 * fVar278 + fVar174 * fVar321 + fVar312 * fVar204;
      auVar289._20_4_ =
           fVar300 * fVar282 + fVar298 * fVar208 + fVar189 * fVar211 + fVar340 * fVar327;
      auVar289._24_4_ =
           fVar250 * fVar213 + fVar301 * fVar262 + fVar190 * fVar323 + fVar341 * fVar326;
      auVar289._28_4_ = fVar152 + fVar152 + fVar152 + fVar305;
      auVar188._0_4_ = fVar248 * fVar279 + fVar263 * fVar268 + fVar304 * fVar293 + fVar172 * fVar216
      ;
      auVar188._4_4_ = fVar284 * fVar280 + fVar265 * fVar205 + fVar347 * fVar296 + fVar324 * fVar231
      ;
      auVar188._8_4_ = fVar294 * fVar210 + fVar285 * fVar261 + fVar348 * fVar299 + fVar336 * fVar233
      ;
      auVar188._12_4_ =
           fVar260 * fVar264 + fVar303 * fVar277 + fVar349 * fVar206 + fVar325 * fVar157;
      auVar188._16_4_ =
           fVar248 * fVar281 + fVar263 * fVar278 + fVar304 * fVar321 + fVar204 * fVar216;
      auVar188._20_4_ =
           fVar284 * fVar282 + fVar265 * fVar208 + fVar347 * fVar211 + fVar327 * fVar231;
      auVar188._24_4_ =
           fVar294 * fVar213 + fVar285 * fVar262 + fVar348 * fVar323 + fVar326 * fVar233;
      auVar188._28_4_ =
           *(float *)(bezier_basis1 + lVar129 + 0x122c) +
           *(float *)(bezier_basis1 + lVar129 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar129 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar129 + 0x1fb8);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar225._16_4_ = 0x7fffffff;
      auVar225._20_4_ = 0x7fffffff;
      auVar225._24_4_ = 0x7fffffff;
      auVar225._28_4_ = 0x7fffffff;
      auVar20 = vandps_avx(_local_5c0,auVar225);
      auVar28 = vandps_avx(auVar163,auVar225);
      auVar28 = vmaxps_avx(auVar20,auVar28);
      auVar20 = vandps_avx(auVar242,auVar225);
      auVar20 = vmaxps_avx(auVar28,auVar20);
      auVar223 = vpermilps_avx(auVar184,0);
      auVar243._16_16_ = auVar223;
      auVar243._0_16_ = auVar223;
      auVar20 = vcmpps_avx(auVar20,auVar243,1);
      auVar34 = vblendvps_avx(_local_5c0,auVar26,auVar20);
      auVar21 = vblendvps_avx(auVar163,auVar27,auVar20);
      auVar20 = vandps_avx(auVar253,auVar225);
      auVar28 = vandps_avx(auVar289,auVar225);
      auVar198 = vmaxps_avx(auVar20,auVar28);
      auVar20 = vandps_avx(auVar188,auVar225);
      auVar20 = vmaxps_avx(auVar198,auVar20);
      auVar198 = vcmpps_avx(auVar20,auVar243,1);
      auVar20 = vblendvps_avx(auVar253,auVar26,auVar198);
      auVar26 = vblendvps_avx(auVar289,auVar27,auVar198);
      fVar305 = auVar34._0_4_;
      fVar148 = auVar34._4_4_;
      fVar150 = auVar34._8_4_;
      fVar153 = auVar34._12_4_;
      fVar155 = auVar34._16_4_;
      fVar156 = auVar34._20_4_;
      fVar131 = auVar34._24_4_;
      fVar149 = auVar20._0_4_;
      fVar151 = auVar20._4_4_;
      fVar154 = auVar20._8_4_;
      fVar152 = auVar20._12_4_;
      fVar207 = auVar20._16_4_;
      fVar209 = auVar20._20_4_;
      fVar212 = auVar20._24_4_;
      fVar266 = -auVar20._28_4_;
      fVar293 = auVar21._0_4_;
      fVar321 = auVar21._4_4_;
      fVar324 = auVar21._8_4_;
      fVar327 = auVar21._12_4_;
      fVar261 = auVar21._16_4_;
      fVar262 = auVar21._20_4_;
      fVar264 = auVar21._24_4_;
      auVar138._0_4_ = fVar293 * fVar293 + fVar305 * fVar305;
      auVar138._4_4_ = fVar321 * fVar321 + fVar148 * fVar148;
      auVar138._8_4_ = fVar324 * fVar324 + fVar150 * fVar150;
      auVar138._12_4_ = fVar327 * fVar327 + fVar153 * fVar153;
      auVar138._16_4_ = fVar261 * fVar261 + fVar155 * fVar155;
      auVar138._20_4_ = fVar262 * fVar262 + fVar156 * fVar156;
      auVar138._24_4_ = fVar264 * fVar264 + fVar131 * fVar131;
      auVar138._28_4_ = auVar289._28_4_ + auVar34._28_4_;
      auVar27 = vrsqrtps_avx(auVar138);
      fVar296 = auVar27._0_4_;
      fVar299 = auVar27._4_4_;
      auVar32._4_4_ = fVar299 * 1.5;
      auVar32._0_4_ = fVar296 * 1.5;
      fVar206 = auVar27._8_4_;
      auVar32._8_4_ = fVar206 * 1.5;
      fVar211 = auVar27._12_4_;
      auVar32._12_4_ = fVar211 * 1.5;
      fVar323 = auVar27._16_4_;
      auVar32._16_4_ = fVar323 * 1.5;
      fVar172 = auVar27._20_4_;
      auVar32._20_4_ = fVar172 * 1.5;
      fVar336 = auVar27._24_4_;
      fVar173 = auVar28._28_4_;
      auVar32._24_4_ = fVar336 * 1.5;
      auVar32._28_4_ = fVar173;
      auVar27._4_4_ = fVar299 * fVar299 * fVar299 * auVar138._4_4_ * 0.5;
      auVar27._0_4_ = fVar296 * fVar296 * fVar296 * auVar138._0_4_ * 0.5;
      auVar27._8_4_ = fVar206 * fVar206 * fVar206 * auVar138._8_4_ * 0.5;
      auVar27._12_4_ = fVar211 * fVar211 * fVar211 * auVar138._12_4_ * 0.5;
      auVar27._16_4_ = fVar323 * fVar323 * fVar323 * auVar138._16_4_ * 0.5;
      auVar27._20_4_ = fVar172 * fVar172 * fVar172 * auVar138._20_4_ * 0.5;
      auVar27._24_4_ = fVar336 * fVar336 * fVar336 * auVar138._24_4_ * 0.5;
      auVar27._28_4_ = auVar138._28_4_;
      auVar28 = vsubps_avx(auVar32,auVar27);
      fVar296 = auVar28._0_4_;
      fVar211 = auVar28._4_4_;
      fVar336 = auVar28._8_4_;
      fVar326 = auVar28._12_4_;
      fVar277 = auVar28._16_4_;
      fVar279 = auVar28._20_4_;
      fVar281 = auVar28._24_4_;
      fVar299 = auVar26._0_4_;
      fVar323 = auVar26._4_4_;
      fVar325 = auVar26._8_4_;
      fVar268 = auVar26._12_4_;
      fVar278 = auVar26._16_4_;
      fVar280 = auVar26._20_4_;
      fVar282 = auVar26._24_4_;
      auVar139._0_4_ = fVar299 * fVar299 + fVar149 * fVar149;
      auVar139._4_4_ = fVar323 * fVar323 + fVar151 * fVar151;
      auVar139._8_4_ = fVar325 * fVar325 + fVar154 * fVar154;
      auVar139._12_4_ = fVar268 * fVar268 + fVar152 * fVar152;
      auVar139._16_4_ = fVar278 * fVar278 + fVar207 * fVar207;
      auVar139._20_4_ = fVar280 * fVar280 + fVar209 * fVar209;
      auVar139._24_4_ = fVar282 * fVar282 + fVar212 * fVar212;
      auVar139._28_4_ = auVar20._28_4_ + auVar28._28_4_;
      auVar20 = vrsqrtps_avx(auVar139);
      fVar206 = auVar20._0_4_;
      fVar172 = auVar20._4_4_;
      auVar33._4_4_ = fVar172 * 1.5;
      auVar33._0_4_ = fVar206 * 1.5;
      fVar204 = auVar20._8_4_;
      auVar33._8_4_ = fVar204 * 1.5;
      fVar205 = auVar20._12_4_;
      auVar33._12_4_ = fVar205 * 1.5;
      fVar208 = auVar20._16_4_;
      auVar33._16_4_ = fVar208 * 1.5;
      fVar210 = auVar20._20_4_;
      auVar33._20_4_ = fVar210 * 1.5;
      fVar213 = auVar20._24_4_;
      auVar33._24_4_ = fVar213 * 1.5;
      auVar33._28_4_ = fVar173;
      auVar29._4_4_ = fVar172 * fVar172 * fVar172 * auVar139._4_4_ * 0.5;
      auVar29._0_4_ = fVar206 * fVar206 * fVar206 * auVar139._0_4_ * 0.5;
      auVar29._8_4_ = fVar204 * fVar204 * fVar204 * auVar139._8_4_ * 0.5;
      auVar29._12_4_ = fVar205 * fVar205 * fVar205 * auVar139._12_4_ * 0.5;
      auVar29._16_4_ = fVar208 * fVar208 * fVar208 * auVar139._16_4_ * 0.5;
      auVar29._20_4_ = fVar210 * fVar210 * fVar210 * auVar139._20_4_ * 0.5;
      auVar29._24_4_ = fVar213 * fVar213 * fVar213 * auVar139._24_4_ * 0.5;
      auVar29._28_4_ = auVar139._28_4_;
      auVar20 = vsubps_avx(auVar33,auVar29);
      fVar206 = auVar20._0_4_;
      fVar172 = auVar20._4_4_;
      fVar204 = auVar20._8_4_;
      fVar205 = auVar20._12_4_;
      fVar208 = auVar20._16_4_;
      fVar210 = auVar20._20_4_;
      fVar213 = auVar20._24_4_;
      fVar293 = (float)local_8c0._0_4_ * fVar293 * fVar296;
      fVar321 = (float)local_8c0._4_4_ * fVar321 * fVar211;
      auVar30._4_4_ = fVar321;
      auVar30._0_4_ = fVar293;
      fVar324 = fStack_8b8 * fVar324 * fVar336;
      auVar30._8_4_ = fVar324;
      fVar327 = fStack_8b4 * fVar327 * fVar326;
      auVar30._12_4_ = fVar327;
      fVar261 = fStack_8b0 * fVar261 * fVar277;
      auVar30._16_4_ = fVar261;
      fVar262 = fStack_8ac * fVar262 * fVar279;
      auVar30._20_4_ = fVar262;
      fVar264 = fStack_8a8 * fVar264 * fVar281;
      auVar30._24_4_ = fVar264;
      auVar30._28_4_ = fVar266;
      local_5a0._4_4_ = auVar316._4_4_ + fVar321;
      local_5a0._0_4_ = auVar316._0_4_ + fVar293;
      fStack_598 = auVar316._8_4_ + fVar324;
      fStack_594 = auVar316._12_4_ + fVar327;
      auStack_590._0_4_ = auVar317._16_4_ + fVar261;
      auStack_590._4_4_ = auVar317._20_4_ + fVar262;
      fStack_588 = auVar317._24_4_ + fVar264;
      fStack_584 = auVar317._28_4_ + fVar266;
      fVar293 = (float)local_8c0._0_4_ * fVar296 * -fVar305;
      fVar321 = (float)local_8c0._4_4_ * fVar211 * -fVar148;
      auVar31._4_4_ = fVar321;
      auVar31._0_4_ = fVar293;
      fVar324 = fStack_8b8 * fVar336 * -fVar150;
      auVar31._8_4_ = fVar324;
      fVar327 = fStack_8b4 * fVar326 * -fVar153;
      auVar31._12_4_ = fVar327;
      fVar261 = fStack_8b0 * fVar277 * -fVar155;
      auVar31._16_4_ = fVar261;
      fVar262 = fStack_8ac * fVar279 * -fVar156;
      auVar31._20_4_ = fVar262;
      fVar264 = fStack_8a8 * fVar281 * -fVar131;
      auVar31._24_4_ = fVar264;
      auVar31._28_4_ = fVar173;
      local_5c0._4_4_ = fVar321 + auVar272._4_4_;
      local_5c0._0_4_ = fVar293 + auVar272._0_4_;
      fStack_5b8 = fVar324 + auVar272._8_4_;
      fStack_5b4 = fVar327 + auVar272._12_4_;
      fStack_5b0 = fVar261 + auVar272._16_4_;
      fStack_5ac = fVar262 + auVar272._20_4_;
      fStack_5a8 = fVar264 + auVar272._24_4_;
      fStack_5a4 = fVar173 + auVar272._28_4_;
      fVar293 = (float)local_8c0._0_4_ * fVar296 * 0.0;
      fVar296 = (float)local_8c0._4_4_ * fVar211 * 0.0;
      auVar35._4_4_ = fVar296;
      auVar35._0_4_ = fVar293;
      fVar321 = fStack_8b8 * fVar336 * 0.0;
      auVar35._8_4_ = fVar321;
      fVar211 = fStack_8b4 * fVar326 * 0.0;
      auVar35._12_4_ = fVar211;
      fVar324 = fStack_8b0 * fVar277 * 0.0;
      auVar35._16_4_ = fVar324;
      fVar336 = fStack_8ac * fVar279 * 0.0;
      auVar35._20_4_ = fVar336;
      fVar327 = fStack_8a8 * fVar281 * 0.0;
      auVar35._24_4_ = fVar327;
      auVar35._28_4_ = fVar342;
      auVar112._4_4_ = fStack_71c;
      auVar112._0_4_ = local_720;
      auVar112._8_4_ = fStack_718;
      auVar112._12_4_ = fStack_714;
      auVar112._16_4_ = fStack_710;
      auVar112._20_4_ = fStack_70c;
      auVar112._24_4_ = fStack_708;
      auVar112._28_4_ = fStack_704;
      auVar244._0_4_ = fVar293 + local_720;
      auVar244._4_4_ = fVar296 + fStack_71c;
      auVar244._8_4_ = fVar321 + fStack_718;
      auVar244._12_4_ = fVar211 + fStack_714;
      auVar244._16_4_ = fVar324 + fStack_710;
      auVar244._20_4_ = fVar336 + fStack_70c;
      auVar244._24_4_ = fVar327 + fStack_708;
      auVar244._28_4_ = fVar342 + fStack_704;
      fVar293 = auVar239._0_4_ * fVar299 * fVar206;
      fVar296 = auVar239._4_4_ * fVar323 * fVar172;
      auVar36._4_4_ = fVar296;
      auVar36._0_4_ = fVar293;
      fVar299 = auVar239._8_4_ * fVar325 * fVar204;
      auVar36._8_4_ = fVar299;
      fVar321 = auVar239._12_4_ * fVar268 * fVar205;
      auVar36._12_4_ = fVar321;
      fVar211 = auVar239._16_4_ * fVar278 * fVar208;
      auVar36._16_4_ = fVar211;
      fVar323 = auVar239._20_4_ * fVar280 * fVar210;
      auVar36._20_4_ = fVar323;
      fVar324 = auVar239._24_4_ * fVar282 * fVar213;
      auVar36._24_4_ = fVar324;
      auVar36._28_4_ = auVar26._28_4_;
      auVar198 = vsubps_avx(auVar317,auVar30);
      auVar290._0_4_ = auVar224._0_4_ + fVar293;
      auVar290._4_4_ = auVar224._4_4_ + fVar296;
      auVar290._8_4_ = auVar224._8_4_ + fVar299;
      auVar290._12_4_ = auVar224._12_4_ + fVar321;
      auVar290._16_4_ = auVar224._16_4_ + fVar211;
      auVar290._20_4_ = auVar224._20_4_ + fVar323;
      auVar290._24_4_ = auVar224._24_4_ + fVar324;
      auVar290._28_4_ = auVar224._28_4_ + auVar26._28_4_;
      fVar293 = auVar239._0_4_ * fVar206 * -fVar149;
      fVar296 = auVar239._4_4_ * fVar172 * -fVar151;
      auVar26._4_4_ = fVar296;
      auVar26._0_4_ = fVar293;
      fVar299 = auVar239._8_4_ * fVar204 * -fVar154;
      auVar26._8_4_ = fVar299;
      fVar321 = auVar239._12_4_ * fVar205 * -fVar152;
      auVar26._12_4_ = fVar321;
      fVar211 = auVar239._16_4_ * fVar208 * -fVar207;
      auVar26._16_4_ = fVar211;
      fVar323 = auVar239._20_4_ * fVar210 * -fVar209;
      auVar26._20_4_ = fVar323;
      fVar324 = auVar239._24_4_ * fVar213 * -fVar212;
      auVar26._24_4_ = fVar324;
      auVar26._28_4_ = fVar303;
      auVar272 = vsubps_avx(auVar272,auVar31);
      auVar307._0_4_ = fVar293 + (float)local_580._0_4_;
      auVar307._4_4_ = fVar296 + (float)local_580._4_4_;
      auVar307._8_4_ = fVar299 + fStack_578;
      auVar307._12_4_ = fVar321 + fStack_574;
      auVar307._16_4_ = fVar211 + fStack_570;
      auVar307._20_4_ = fVar323 + fStack_56c;
      auVar307._24_4_ = fVar324 + fStack_568;
      auVar307._28_4_ = fVar303 + fStack_564;
      fVar293 = auVar239._0_4_ * fVar206 * 0.0;
      fVar296 = auVar239._4_4_ * fVar172 * 0.0;
      auVar37._4_4_ = fVar296;
      auVar37._0_4_ = fVar293;
      fVar299 = auVar239._8_4_ * fVar204 * 0.0;
      auVar37._8_4_ = fVar299;
      fVar206 = auVar239._12_4_ * fVar205 * 0.0;
      auVar37._12_4_ = fVar206;
      fVar321 = auVar239._16_4_ * fVar208 * 0.0;
      auVar37._16_4_ = fVar321;
      fVar211 = auVar239._20_4_ * fVar210 * 0.0;
      auVar37._20_4_ = fVar211;
      fVar323 = auVar239._24_4_ * fVar213 * 0.0;
      auVar37._24_4_ = fVar323;
      auVar37._28_4_ = 0x3f000000;
      auVar33 = vsubps_avx(auVar112,auVar35);
      auVar114._4_4_ = fStack_49c;
      auVar114._0_4_ = local_4a0;
      auVar114._8_4_ = fStack_498;
      auVar114._12_4_ = fStack_494;
      auVar114._16_4_ = fStack_490;
      auVar114._20_4_ = fStack_48c;
      auVar114._24_4_ = fStack_488;
      auVar114._28_4_ = fStack_484;
      auVar345._0_4_ = fVar293 + local_4a0;
      auVar345._4_4_ = fVar296 + fStack_49c;
      auVar345._8_4_ = fVar299 + fStack_498;
      auVar345._12_4_ = fVar206 + fStack_494;
      auVar345._16_4_ = fVar321 + fStack_490;
      auVar345._20_4_ = fVar211 + fStack_48c;
      auVar345._24_4_ = fVar323 + fStack_488;
      auVar345._28_4_ = fStack_484 + 0.5;
      auVar20 = vsubps_avx(auVar224,auVar36);
      auVar28 = vsubps_avx(_local_580,auVar26);
      auVar29 = vsubps_avx(auVar114,auVar37);
      auVar26 = vsubps_avx(auVar307,auVar272);
      auVar27 = vsubps_avx(auVar345,auVar33);
      auVar38._4_4_ = auVar33._4_4_ * auVar26._4_4_;
      auVar38._0_4_ = auVar33._0_4_ * auVar26._0_4_;
      auVar38._8_4_ = auVar33._8_4_ * auVar26._8_4_;
      auVar38._12_4_ = auVar33._12_4_ * auVar26._12_4_;
      auVar38._16_4_ = auVar33._16_4_ * auVar26._16_4_;
      auVar38._20_4_ = auVar33._20_4_ * auVar26._20_4_;
      auVar38._24_4_ = auVar33._24_4_ * auVar26._24_4_;
      auVar38._28_4_ = fVar302;
      auVar39._4_4_ = auVar272._4_4_ * auVar27._4_4_;
      auVar39._0_4_ = auVar272._0_4_ * auVar27._0_4_;
      auVar39._8_4_ = auVar272._8_4_ * auVar27._8_4_;
      auVar39._12_4_ = auVar272._12_4_ * auVar27._12_4_;
      auVar39._16_4_ = auVar272._16_4_ * auVar27._16_4_;
      auVar39._20_4_ = auVar272._20_4_ * auVar27._20_4_;
      auVar39._24_4_ = auVar272._24_4_ * auVar27._24_4_;
      auVar39._28_4_ = fStack_564;
      auVar34 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar198._4_4_ * auVar27._4_4_;
      auVar40._0_4_ = auVar198._0_4_ * auVar27._0_4_;
      auVar40._8_4_ = auVar198._8_4_ * auVar27._8_4_;
      auVar40._12_4_ = auVar198._12_4_ * auVar27._12_4_;
      auVar40._16_4_ = auVar198._16_4_ * auVar27._16_4_;
      auVar40._20_4_ = auVar198._20_4_ * auVar27._20_4_;
      auVar40._24_4_ = auVar198._24_4_ * auVar27._24_4_;
      auVar40._28_4_ = auVar27._28_4_;
      auVar21 = vsubps_avx(auVar290,auVar198);
      auVar41._4_4_ = auVar33._4_4_ * auVar21._4_4_;
      auVar41._0_4_ = auVar33._0_4_ * auVar21._0_4_;
      auVar41._8_4_ = auVar33._8_4_ * auVar21._8_4_;
      auVar41._12_4_ = auVar33._12_4_ * auVar21._12_4_;
      auVar41._16_4_ = auVar33._16_4_ * auVar21._16_4_;
      auVar41._20_4_ = auVar33._20_4_ * auVar21._20_4_;
      auVar41._24_4_ = auVar33._24_4_ * auVar21._24_4_;
      auVar41._28_4_ = auVar224._28_4_;
      auVar224 = vsubps_avx(auVar41,auVar40);
      auVar42._4_4_ = auVar21._4_4_ * auVar272._4_4_;
      auVar42._0_4_ = auVar21._0_4_ * auVar272._0_4_;
      auVar42._8_4_ = auVar21._8_4_ * auVar272._8_4_;
      auVar42._12_4_ = auVar21._12_4_ * auVar272._12_4_;
      auVar42._16_4_ = auVar21._16_4_ * auVar272._16_4_;
      auVar42._20_4_ = auVar21._20_4_ * auVar272._20_4_;
      auVar42._24_4_ = auVar21._24_4_ * auVar272._24_4_;
      auVar42._28_4_ = auVar27._28_4_;
      auVar43._4_4_ = auVar198._4_4_ * auVar26._4_4_;
      auVar43._0_4_ = auVar198._0_4_ * auVar26._0_4_;
      auVar43._8_4_ = auVar198._8_4_ * auVar26._8_4_;
      auVar43._12_4_ = auVar198._12_4_ * auVar26._12_4_;
      auVar43._16_4_ = auVar198._16_4_ * auVar26._16_4_;
      auVar43._20_4_ = auVar198._20_4_ * auVar26._20_4_;
      auVar43._24_4_ = auVar198._24_4_ * auVar26._24_4_;
      auVar43._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar43,auVar42);
      auVar140._0_4_ = auVar34._0_4_ * 0.0 + auVar26._0_4_ + auVar224._0_4_ * 0.0;
      auVar140._4_4_ = auVar34._4_4_ * 0.0 + auVar26._4_4_ + auVar224._4_4_ * 0.0;
      auVar140._8_4_ = auVar34._8_4_ * 0.0 + auVar26._8_4_ + auVar224._8_4_ * 0.0;
      auVar140._12_4_ = auVar34._12_4_ * 0.0 + auVar26._12_4_ + auVar224._12_4_ * 0.0;
      auVar140._16_4_ = auVar34._16_4_ * 0.0 + auVar26._16_4_ + auVar224._16_4_ * 0.0;
      auVar140._20_4_ = auVar34._20_4_ * 0.0 + auVar26._20_4_ + auVar224._20_4_ * 0.0;
      auVar140._24_4_ = auVar34._24_4_ * 0.0 + auVar26._24_4_ + auVar224._24_4_ * 0.0;
      auVar140._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar224._28_4_;
      auVar32 = vcmpps_avx(auVar140,ZEXT432(0) << 0x20,2);
      auVar20 = vblendvps_avx(auVar20,_local_5a0,auVar32);
      auVar28 = vblendvps_avx(auVar28,_local_5c0,auVar32);
      auVar26 = vblendvps_avx(auVar29,auVar244,auVar32);
      auVar27 = vblendvps_avx(auVar198,auVar290,auVar32);
      auVar34 = vblendvps_avx(auVar272,auVar307,auVar32);
      auVar21 = vblendvps_avx(auVar33,auVar345,auVar32);
      auVar198 = vblendvps_avx(auVar290,auVar198,auVar32);
      auVar224 = vblendvps_avx(auVar307,auVar272,auVar32);
      auVar223 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      local_560._16_16_ = auVar317._16_16_;
      auVar272 = vblendvps_avx(auVar345,auVar33,auVar32);
      auVar198 = vsubps_avx(auVar198,auVar20);
      auVar317 = vsubps_avx(auVar224,auVar28);
      auVar272 = vsubps_avx(auVar272,auVar26);
      auVar33 = vsubps_avx(auVar28,auVar34);
      fVar293 = auVar317._0_4_;
      fVar131 = auVar26._0_4_;
      fVar211 = auVar317._4_4_;
      fVar149 = auVar26._4_4_;
      auVar44._4_4_ = fVar149 * fVar211;
      auVar44._0_4_ = fVar131 * fVar293;
      fVar325 = auVar317._8_4_;
      fVar151 = auVar26._8_4_;
      auVar44._8_4_ = fVar151 * fVar325;
      fVar205 = auVar317._12_4_;
      fVar154 = auVar26._12_4_;
      auVar44._12_4_ = fVar154 * fVar205;
      fVar262 = auVar317._16_4_;
      fVar152 = auVar26._16_4_;
      auVar44._16_4_ = fVar152 * fVar262;
      fVar281 = auVar317._20_4_;
      fVar207 = auVar26._20_4_;
      auVar44._20_4_ = fVar207 * fVar281;
      fVar148 = auVar317._24_4_;
      fVar209 = auVar26._24_4_;
      auVar44._24_4_ = fVar209 * fVar148;
      auVar44._28_4_ = auVar224._28_4_;
      fVar296 = auVar28._0_4_;
      fVar284 = auVar272._0_4_;
      fVar323 = auVar28._4_4_;
      fVar294 = auVar272._4_4_;
      auVar45._4_4_ = fVar294 * fVar323;
      auVar45._0_4_ = fVar284 * fVar296;
      fVar204 = auVar28._8_4_;
      fVar297 = auVar272._8_4_;
      auVar45._8_4_ = fVar297 * fVar204;
      fVar261 = auVar28._12_4_;
      fVar300 = auVar272._12_4_;
      auVar45._12_4_ = fVar300 * fVar261;
      fVar279 = auVar28._16_4_;
      fVar250 = auVar272._16_4_;
      auVar45._16_4_ = fVar250 * fVar279;
      fVar282 = auVar28._20_4_;
      fVar257 = auVar272._20_4_;
      auVar45._20_4_ = fVar257 * fVar282;
      fVar150 = auVar28._24_4_;
      fVar260 = auVar272._24_4_;
      uVar130 = auVar29._28_4_;
      auVar45._24_4_ = fVar260 * fVar150;
      auVar45._28_4_ = uVar130;
      auVar224 = vsubps_avx(auVar45,auVar44);
      fVar299 = auVar20._0_4_;
      fVar172 = auVar20._4_4_;
      auVar46._4_4_ = fVar294 * fVar172;
      auVar46._0_4_ = fVar284 * fVar299;
      fVar327 = auVar20._8_4_;
      auVar46._8_4_ = fVar297 * fVar327;
      fVar277 = auVar20._12_4_;
      auVar46._12_4_ = fVar300 * fVar277;
      fVar280 = auVar20._16_4_;
      auVar46._16_4_ = fVar250 * fVar280;
      fVar213 = auVar20._20_4_;
      auVar46._20_4_ = fVar257 * fVar213;
      fVar153 = auVar20._24_4_;
      auVar46._24_4_ = fVar260 * fVar153;
      auVar46._28_4_ = uVar130;
      fVar206 = auVar198._0_4_;
      fVar324 = auVar198._4_4_;
      auVar47._4_4_ = fVar149 * fVar324;
      auVar47._0_4_ = fVar131 * fVar206;
      fVar326 = auVar198._8_4_;
      auVar47._8_4_ = fVar151 * fVar326;
      fVar278 = auVar198._12_4_;
      auVar47._12_4_ = fVar154 * fVar278;
      fVar210 = auVar198._16_4_;
      auVar47._16_4_ = fVar152 * fVar210;
      fVar173 = auVar198._20_4_;
      auVar47._20_4_ = fVar207 * fVar173;
      fVar155 = auVar198._24_4_;
      auVar47._24_4_ = fVar209 * fVar155;
      auVar47._28_4_ = auVar345._28_4_;
      auVar29 = vsubps_avx(auVar47,auVar46);
      auVar48._4_4_ = fVar323 * fVar324;
      auVar48._0_4_ = fVar296 * fVar206;
      auVar48._8_4_ = fVar204 * fVar326;
      auVar48._12_4_ = fVar261 * fVar278;
      auVar48._16_4_ = fVar279 * fVar210;
      auVar48._20_4_ = fVar282 * fVar173;
      auVar48._24_4_ = fVar150 * fVar155;
      auVar48._28_4_ = uVar130;
      auVar350._0_4_ = fVar299 * fVar293;
      auVar350._4_4_ = fVar172 * fVar211;
      auVar350._8_4_ = fVar327 * fVar325;
      auVar350._12_4_ = fVar277 * fVar205;
      auVar350._16_4_ = fVar280 * fVar262;
      auVar350._20_4_ = fVar213 * fVar281;
      auVar350._24_4_ = fVar153 * fVar148;
      auVar350._28_4_ = 0;
      auVar30 = vsubps_avx(auVar350,auVar48);
      auVar31 = vsubps_avx(auVar26,auVar21);
      fVar321 = auVar30._28_4_ + auVar29._28_4_;
      auVar164._0_4_ = auVar30._0_4_ + auVar29._0_4_ * 0.0 + auVar224._0_4_ * 0.0;
      auVar164._4_4_ = auVar30._4_4_ + auVar29._4_4_ * 0.0 + auVar224._4_4_ * 0.0;
      auVar164._8_4_ = auVar30._8_4_ + auVar29._8_4_ * 0.0 + auVar224._8_4_ * 0.0;
      auVar164._12_4_ = auVar30._12_4_ + auVar29._12_4_ * 0.0 + auVar224._12_4_ * 0.0;
      auVar164._16_4_ = auVar30._16_4_ + auVar29._16_4_ * 0.0 + auVar224._16_4_ * 0.0;
      auVar164._20_4_ = auVar30._20_4_ + auVar29._20_4_ * 0.0 + auVar224._20_4_ * 0.0;
      auVar164._24_4_ = auVar30._24_4_ + auVar29._24_4_ * 0.0 + auVar224._24_4_ * 0.0;
      auVar164._28_4_ = fVar321 + auVar224._28_4_;
      fVar212 = auVar33._0_4_;
      fVar266 = auVar33._4_4_;
      auVar49._4_4_ = fVar266 * auVar21._4_4_;
      auVar49._0_4_ = fVar212 * auVar21._0_4_;
      fVar216 = auVar33._8_4_;
      auVar49._8_4_ = fVar216 * auVar21._8_4_;
      fVar231 = auVar33._12_4_;
      auVar49._12_4_ = fVar231 * auVar21._12_4_;
      fVar233 = auVar33._16_4_;
      auVar49._16_4_ = fVar233 * auVar21._16_4_;
      fVar157 = auVar33._20_4_;
      auVar49._20_4_ = fVar157 * auVar21._20_4_;
      fVar248 = auVar33._24_4_;
      auVar49._24_4_ = fVar248 * auVar21._24_4_;
      auVar49._28_4_ = fVar321;
      fVar321 = auVar31._0_4_;
      fVar336 = auVar31._4_4_;
      auVar50._4_4_ = auVar34._4_4_ * fVar336;
      auVar50._0_4_ = auVar34._0_4_ * fVar321;
      fVar268 = auVar31._8_4_;
      auVar50._8_4_ = auVar34._8_4_ * fVar268;
      fVar208 = auVar31._12_4_;
      auVar50._12_4_ = auVar34._12_4_ * fVar208;
      fVar264 = auVar31._16_4_;
      auVar50._16_4_ = auVar34._16_4_ * fVar264;
      fVar305 = auVar31._20_4_;
      auVar50._20_4_ = auVar34._20_4_ * fVar305;
      fVar156 = auVar31._24_4_;
      auVar50._24_4_ = auVar34._24_4_ * fVar156;
      auVar50._28_4_ = auVar30._28_4_;
      auVar33 = vsubps_avx(auVar50,auVar49);
      auVar29 = vsubps_avx(auVar20,auVar27);
      fVar263 = auVar29._0_4_;
      fVar265 = auVar29._4_4_;
      auVar51._4_4_ = fVar265 * auVar21._4_4_;
      auVar51._0_4_ = fVar263 * auVar21._0_4_;
      fVar285 = auVar29._8_4_;
      auVar51._8_4_ = fVar285 * auVar21._8_4_;
      fVar295 = auVar29._12_4_;
      auVar51._12_4_ = fVar295 * auVar21._12_4_;
      fVar298 = auVar29._16_4_;
      auVar51._16_4_ = fVar298 * auVar21._16_4_;
      fVar301 = auVar29._20_4_;
      auVar51._20_4_ = fVar301 * auVar21._20_4_;
      fVar302 = auVar29._24_4_;
      auVar51._24_4_ = fVar302 * auVar21._24_4_;
      auVar51._28_4_ = auVar21._28_4_;
      auVar52._4_4_ = auVar27._4_4_ * fVar336;
      auVar52._0_4_ = auVar27._0_4_ * fVar321;
      auVar52._8_4_ = auVar27._8_4_ * fVar268;
      auVar52._12_4_ = auVar27._12_4_ * fVar208;
      auVar52._16_4_ = auVar27._16_4_ * fVar264;
      auVar52._20_4_ = auVar27._20_4_ * fVar305;
      auVar52._24_4_ = auVar27._24_4_ * fVar156;
      auVar52._28_4_ = auVar224._28_4_;
      auVar224 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar34._4_4_ * fVar265;
      auVar53._0_4_ = auVar34._0_4_ * fVar263;
      auVar53._8_4_ = auVar34._8_4_ * fVar285;
      auVar53._12_4_ = auVar34._12_4_ * fVar295;
      auVar53._16_4_ = auVar34._16_4_ * fVar298;
      auVar53._20_4_ = auVar34._20_4_ * fVar301;
      auVar53._24_4_ = auVar34._24_4_ * fVar302;
      auVar53._28_4_ = auVar21._28_4_;
      auVar54._4_4_ = auVar27._4_4_ * fVar266;
      auVar54._0_4_ = auVar27._0_4_ * fVar212;
      auVar54._8_4_ = auVar27._8_4_ * fVar216;
      auVar54._12_4_ = auVar27._12_4_ * fVar231;
      auVar54._16_4_ = auVar27._16_4_ * fVar233;
      auVar54._20_4_ = auVar27._20_4_ * fVar157;
      auVar54._24_4_ = auVar27._24_4_ * fVar248;
      auVar54._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar54,auVar53);
      auVar226._0_4_ = auVar33._0_4_ * 0.0 + auVar27._0_4_ + auVar224._0_4_ * 0.0;
      auVar226._4_4_ = auVar33._4_4_ * 0.0 + auVar27._4_4_ + auVar224._4_4_ * 0.0;
      auVar226._8_4_ = auVar33._8_4_ * 0.0 + auVar27._8_4_ + auVar224._8_4_ * 0.0;
      auVar226._12_4_ = auVar33._12_4_ * 0.0 + auVar27._12_4_ + auVar224._12_4_ * 0.0;
      auVar226._16_4_ = auVar33._16_4_ * 0.0 + auVar27._16_4_ + auVar224._16_4_ * 0.0;
      auVar226._20_4_ = auVar33._20_4_ * 0.0 + auVar27._20_4_ + auVar224._20_4_ * 0.0;
      auVar226._24_4_ = auVar33._24_4_ * 0.0 + auVar27._24_4_ + auVar224._24_4_ * 0.0;
      auVar226._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar224._28_4_;
      auVar27 = vmaxps_avx(auVar164,auVar226);
      auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
      auVar182 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
      auVar223 = vpand_avx(auVar182,auVar223);
      auVar182 = vpmovsxwd_avx(auVar223);
      auVar197 = vpunpckhwd_avx(auVar223,auVar223);
      auVar199._16_16_ = auVar197;
      auVar199._0_16_ = auVar182;
      if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar199 >> 0x7f,0) == '\0') &&
            (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar197 >> 0x3f,0) == '\0') &&
          (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar197[0xf]
         ) {
LAB_0090a318:
        auVar203 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar335 = ZEXT3264(auVar142);
      }
      else {
        auVar55._4_4_ = fVar336 * fVar211;
        auVar55._0_4_ = fVar321 * fVar293;
        auVar55._8_4_ = fVar268 * fVar325;
        auVar55._12_4_ = fVar208 * fVar205;
        auVar55._16_4_ = fVar264 * fVar262;
        auVar55._20_4_ = fVar305 * fVar281;
        auVar55._24_4_ = fVar156 * fVar148;
        auVar55._28_4_ = auVar197._12_4_;
        auVar331._0_4_ = fVar212 * fVar284;
        auVar331._4_4_ = fVar266 * fVar294;
        auVar331._8_4_ = fVar216 * fVar297;
        auVar331._12_4_ = fVar231 * fVar300;
        auVar331._16_4_ = fVar233 * fVar250;
        auVar331._20_4_ = fVar157 * fVar257;
        auVar331._24_4_ = fVar248 * fVar260;
        auVar331._28_4_ = 0;
        auVar27 = vsubps_avx(auVar331,auVar55);
        auVar56._4_4_ = fVar265 * fVar294;
        auVar56._0_4_ = fVar263 * fVar284;
        auVar56._8_4_ = fVar285 * fVar297;
        auVar56._12_4_ = fVar295 * fVar300;
        auVar56._16_4_ = fVar298 * fVar250;
        auVar56._20_4_ = fVar301 * fVar257;
        auVar56._24_4_ = fVar302 * fVar260;
        auVar56._28_4_ = auVar272._28_4_;
        auVar57._4_4_ = fVar336 * fVar324;
        auVar57._0_4_ = fVar321 * fVar206;
        auVar57._8_4_ = fVar268 * fVar326;
        auVar57._12_4_ = fVar208 * fVar278;
        auVar57._16_4_ = fVar264 * fVar210;
        auVar57._20_4_ = fVar305 * fVar173;
        auVar57._24_4_ = fVar156 * fVar155;
        auVar57._28_4_ = auVar31._28_4_;
        auVar21 = vsubps_avx(auVar57,auVar56);
        auVar58._4_4_ = fVar266 * fVar324;
        auVar58._0_4_ = fVar212 * fVar206;
        auVar58._8_4_ = fVar216 * fVar326;
        auVar58._12_4_ = fVar231 * fVar278;
        auVar58._16_4_ = fVar233 * fVar210;
        auVar58._20_4_ = fVar157 * fVar173;
        auVar58._24_4_ = fVar248 * fVar155;
        auVar58._28_4_ = auVar164._28_4_;
        auVar59._4_4_ = fVar265 * fVar211;
        auVar59._0_4_ = fVar263 * fVar293;
        auVar59._8_4_ = fVar285 * fVar325;
        auVar59._12_4_ = fVar295 * fVar205;
        auVar59._16_4_ = fVar298 * fVar262;
        auVar59._20_4_ = fVar301 * fVar281;
        auVar59._24_4_ = fVar302 * fVar148;
        auVar59._28_4_ = auVar317._28_4_;
        auVar224 = vsubps_avx(auVar59,auVar58);
        auVar254._0_4_ = auVar27._0_4_ * 0.0 + auVar224._0_4_ + auVar21._0_4_ * 0.0;
        auVar254._4_4_ = auVar27._4_4_ * 0.0 + auVar224._4_4_ + auVar21._4_4_ * 0.0;
        auVar254._8_4_ = auVar27._8_4_ * 0.0 + auVar224._8_4_ + auVar21._8_4_ * 0.0;
        auVar254._12_4_ = auVar27._12_4_ * 0.0 + auVar224._12_4_ + auVar21._12_4_ * 0.0;
        auVar254._16_4_ = auVar27._16_4_ * 0.0 + auVar224._16_4_ + auVar21._16_4_ * 0.0;
        auVar254._20_4_ = auVar27._20_4_ * 0.0 + auVar224._20_4_ + auVar21._20_4_ * 0.0;
        auVar254._24_4_ = auVar27._24_4_ * 0.0 + auVar224._24_4_ + auVar21._24_4_ * 0.0;
        auVar254._28_4_ = auVar317._28_4_ + auVar224._28_4_ + auVar164._28_4_;
        auVar34 = vrcpps_avx(auVar254);
        fVar293 = auVar34._0_4_;
        fVar206 = auVar34._4_4_;
        auVar60._4_4_ = auVar254._4_4_ * fVar206;
        auVar60._0_4_ = auVar254._0_4_ * fVar293;
        fVar321 = auVar34._8_4_;
        auVar60._8_4_ = auVar254._8_4_ * fVar321;
        fVar211 = auVar34._12_4_;
        auVar60._12_4_ = auVar254._12_4_ * fVar211;
        fVar324 = auVar34._16_4_;
        auVar60._16_4_ = auVar254._16_4_ * fVar324;
        fVar336 = auVar34._20_4_;
        auVar60._20_4_ = auVar254._20_4_ * fVar336;
        fVar325 = auVar34._24_4_;
        auVar60._24_4_ = auVar254._24_4_ * fVar325;
        auVar60._28_4_ = auVar31._28_4_;
        auVar332._8_4_ = 0x3f800000;
        auVar332._0_8_ = 0x3f8000003f800000;
        auVar332._12_4_ = 0x3f800000;
        auVar332._16_4_ = 0x3f800000;
        auVar332._20_4_ = 0x3f800000;
        auVar332._24_4_ = 0x3f800000;
        auVar332._28_4_ = 0x3f800000;
        auVar272 = vsubps_avx(auVar332,auVar60);
        fVar293 = auVar272._0_4_ * fVar293 + fVar293;
        fVar206 = auVar272._4_4_ * fVar206 + fVar206;
        fVar321 = auVar272._8_4_ * fVar321 + fVar321;
        fVar211 = auVar272._12_4_ * fVar211 + fVar211;
        fVar324 = auVar272._16_4_ * fVar324 + fVar324;
        fVar336 = auVar272._20_4_ * fVar336 + fVar336;
        fVar325 = auVar272._24_4_ * fVar325 + fVar325;
        auVar61._4_4_ =
             (auVar27._4_4_ * fVar172 + auVar21._4_4_ * fVar323 + auVar224._4_4_ * fVar149) *
             fVar206;
        auVar61._0_4_ =
             (auVar27._0_4_ * fVar299 + auVar21._0_4_ * fVar296 + auVar224._0_4_ * fVar131) *
             fVar293;
        auVar61._8_4_ =
             (auVar27._8_4_ * fVar327 + auVar21._8_4_ * fVar204 + auVar224._8_4_ * fVar151) *
             fVar321;
        auVar61._12_4_ =
             (auVar27._12_4_ * fVar277 + auVar21._12_4_ * fVar261 + auVar224._12_4_ * fVar154) *
             fVar211;
        auVar61._16_4_ =
             (auVar27._16_4_ * fVar280 + auVar21._16_4_ * fVar279 + auVar224._16_4_ * fVar152) *
             fVar324;
        auVar61._20_4_ =
             (auVar27._20_4_ * fVar213 + auVar21._20_4_ * fVar282 + auVar224._20_4_ * fVar207) *
             fVar336;
        auVar61._24_4_ =
             (auVar27._24_4_ * fVar153 + auVar21._24_4_ * fVar150 + auVar224._24_4_ * fVar209) *
             fVar325;
        auVar61._28_4_ = auVar198._28_4_ + auVar26._28_4_;
        auVar182 = vpermilps_avx(ZEXT416(local_840),0);
        auVar141._16_16_ = auVar182;
        auVar141._0_16_ = auVar182;
        auVar26 = vcmpps_avx(auVar141,auVar61,2);
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar200._4_4_ = uVar130;
        auVar200._0_4_ = uVar130;
        auVar200._8_4_ = uVar130;
        auVar200._12_4_ = uVar130;
        auVar200._16_4_ = uVar130;
        auVar200._20_4_ = uVar130;
        auVar200._24_4_ = uVar130;
        auVar200._28_4_ = uVar130;
        auVar27 = vcmpps_avx(auVar61,auVar200,2);
        auVar26 = vandps_avx(auVar27,auVar26);
        auVar182 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar223 = vpand_avx(auVar223,auVar182);
        auVar182 = vpmovsxwd_avx(auVar223);
        auVar197 = vpshufd_avx(auVar223,0xee);
        auVar197 = vpmovsxwd_avx(auVar197);
        auVar201._16_16_ = auVar197;
        auVar201._0_16_ = auVar182;
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar201 >> 0x7f,0) == '\0') &&
              (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar197 >> 0x3f,0) == '\0') &&
            (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar197[0xf]) goto LAB_0090a318;
        auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,auVar254,4);
        auVar182 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar223 = vpand_avx(auVar223,auVar182);
        auVar182 = vpmovsxwd_avx(auVar223);
        auVar223 = vpunpckhwd_avx(auVar223,auVar223);
        auVar245._16_16_ = auVar223;
        auVar245._0_16_ = auVar182;
        auVar203 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar335 = ZEXT3264(auVar142);
        if ((((((((auVar245 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar245 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar245 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar245 >> 0x7f,0) != '\0') ||
              (auVar245 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar223 >> 0x3f,0) != '\0') ||
            (auVar245 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar223[0xf] < '\0') {
          auVar62._4_4_ = auVar164._4_4_ * fVar206;
          auVar62._0_4_ = auVar164._0_4_ * fVar293;
          auVar62._8_4_ = auVar164._8_4_ * fVar321;
          auVar62._12_4_ = auVar164._12_4_ * fVar211;
          auVar62._16_4_ = auVar164._16_4_ * fVar324;
          auVar62._20_4_ = auVar164._20_4_ * fVar336;
          auVar62._24_4_ = auVar164._24_4_ * fVar325;
          auVar62._28_4_ = SUB84(uStack_4e8,4);
          auVar63._4_4_ = auVar226._4_4_ * fVar206;
          auVar63._0_4_ = auVar226._0_4_ * fVar293;
          auVar63._8_4_ = auVar226._8_4_ * fVar321;
          auVar63._12_4_ = auVar226._12_4_ * fVar211;
          auVar63._16_4_ = auVar226._16_4_ * fVar324;
          auVar63._20_4_ = auVar226._20_4_ * fVar336;
          auVar63._24_4_ = auVar226._24_4_ * fVar325;
          auVar63._28_4_ = auVar272._28_4_ + auVar34._28_4_;
          auVar227._8_4_ = 0x3f800000;
          auVar227._0_8_ = 0x3f8000003f800000;
          auVar227._12_4_ = 0x3f800000;
          auVar227._16_4_ = 0x3f800000;
          auVar227._20_4_ = 0x3f800000;
          auVar227._24_4_ = 0x3f800000;
          auVar227._28_4_ = 0x3f800000;
          auVar142 = vsubps_avx(auVar227,auVar62);
          auVar142 = vblendvps_avx(auVar142,auVar62,auVar32);
          auVar335 = ZEXT3264(auVar142);
          auVar142 = vsubps_avx(auVar227,auVar63);
          _local_340 = vblendvps_avx(auVar142,auVar63,auVar32);
          auVar203 = ZEXT3264(auVar245);
          local_440 = auVar61;
        }
      }
      auVar255 = ZEXT3264(local_620);
      auVar142 = auVar203._0_32_;
      if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar142 >> 0x7f,0) != '\0') ||
            (auVar203 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar142 >> 0xbf,0) != '\0') ||
          (auVar203 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar203[0x1f] < '\0') {
        auVar26 = vsubps_avx(auVar239,_local_8c0);
        local_8c0._0_4_ = (float)local_8c0._0_4_ + auVar335._0_4_ * auVar26._0_4_;
        local_8c0._4_4_ = (float)local_8c0._4_4_ + auVar335._4_4_ * auVar26._4_4_;
        fStack_8b8 = fStack_8b8 + auVar335._8_4_ * auVar26._8_4_;
        fStack_8b4 = fStack_8b4 + auVar335._12_4_ * auVar26._12_4_;
        fStack_8b0 = fStack_8b0 + auVar335._16_4_ * auVar26._16_4_;
        fStack_8ac = fStack_8ac + auVar335._20_4_ * auVar26._20_4_;
        fStack_8a8 = fStack_8a8 + auVar335._24_4_ * auVar26._24_4_;
        fStack_8a4 = fStack_8a4 + auVar26._28_4_;
        fVar293 = *(float *)((long)local_6b0->ray_space + k * 4 + -0x10);
        auVar64._4_4_ = ((float)local_8c0._4_4_ + (float)local_8c0._4_4_) * fVar293;
        auVar64._0_4_ = ((float)local_8c0._0_4_ + (float)local_8c0._0_4_) * fVar293;
        auVar64._8_4_ = (fStack_8b8 + fStack_8b8) * fVar293;
        auVar64._12_4_ = (fStack_8b4 + fStack_8b4) * fVar293;
        auVar64._16_4_ = (fStack_8b0 + fStack_8b0) * fVar293;
        auVar64._20_4_ = (fStack_8ac + fStack_8ac) * fVar293;
        auVar64._24_4_ = (fStack_8a8 + fStack_8a8) * fVar293;
        auVar64._28_4_ = fStack_8a4 + fStack_8a4;
        auVar26 = vcmpps_avx(local_440,auVar64,6);
        auVar27 = auVar142 & auVar26;
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0x7f,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0xbf,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar27[0x1f] < '\0') {
          local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
          local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
          uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
          uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
          uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
          uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
          uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
          uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
          local_800 = auVar335._0_32_;
          local_2a0 = local_800;
          auVar120 = _local_340;
          auVar27 = _local_340;
          local_280 = (float)local_340._0_4_;
          fStack_27c = (float)local_340._4_4_;
          fStack_278 = (float)uStack_338;
          fStack_274 = uStack_338._4_4_;
          fStack_270 = (float)uStack_330;
          fStack_26c = uStack_330._4_4_;
          fStack_268 = (float)uStack_328;
          fStack_264 = uStack_328._4_4_;
          local_260 = local_440;
          local_240 = 0;
          local_23c = uVar11;
          local_230 = auVar220._0_8_;
          uStack_228 = uStack_878;
          local_220 = auVar270._0_8_;
          uStack_218 = uStack_888;
          local_210 = local_790;
          uStack_208 = uStack_788;
          uStack_778 = auVar344._8_8_;
          local_200 = auVar344._0_8_;
          uStack_1f8 = uStack_778;
          _local_340 = auVar27;
          if ((pGVar128->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_540 = vandps_avx(auVar26,auVar142);
            auVar179._0_4_ = 1.0 / auVar196._0_4_;
            auVar179._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar223 = vshufps_avx(auVar179,auVar179,0);
            local_1c0[0] = auVar223._0_4_ * (auVar335._0_4_ + 0.0);
            local_1c0[1] = auVar223._4_4_ * (auVar335._4_4_ + 1.0);
            local_1c0[2] = auVar223._8_4_ * (auVar335._8_4_ + 2.0);
            local_1c0[3] = auVar223._12_4_ * (auVar335._12_4_ + 3.0);
            fStack_1b0 = auVar223._0_4_ * (auVar335._16_4_ + 4.0);
            fStack_1ac = auVar223._4_4_ * (auVar335._20_4_ + 5.0);
            fStack_1a8 = auVar223._8_4_ * (auVar335._24_4_ + 6.0);
            fStack_1a4 = auVar335._28_4_ + 7.0;
            uStack_330 = auVar120._16_8_;
            uStack_328 = auVar27._24_8_;
            local_1a0 = local_340;
            uStack_198 = uStack_338;
            uStack_190 = uStack_330;
            uStack_188 = uStack_328;
            local_180 = local_440;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar142 = vblendvps_avx(auVar142,local_440,local_540);
            auVar26 = vshufps_avx(auVar142,auVar142,0xb1);
            auVar26 = vminps_avx(auVar142,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar26 = vcmpps_avx(auVar142,auVar26,0);
            auVar27 = local_540 & auVar26;
            auVar142 = local_540;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar142 = vandps_avx(auVar26,local_540);
            }
            uVar121 = vmovmskps_avx(auVar142);
            uVar17 = 0;
            if (uVar121 != 0) {
              for (; (uVar121 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar124 = (ulong)uVar17;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar128->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar313 = local_1c0[uVar124];
              uVar130 = *(undefined4 *)((long)&local_1a0 + uVar124 * 4);
              fVar320 = 1.0 - fVar313;
              fVar319 = fVar313 * fVar320 + fVar313 * fVar320;
              auVar223 = ZEXT416((uint)(fVar313 * fVar313 * 3.0));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar182 = ZEXT416((uint)((fVar319 - fVar313 * fVar313) * 3.0));
              auVar182 = vshufps_avx(auVar182,auVar182,0);
              auVar197 = ZEXT416((uint)((fVar320 * fVar320 - fVar319) * 3.0));
              auVar197 = vshufps_avx(auVar197,auVar197,0);
              auVar186 = ZEXT416((uint)(fVar320 * fVar320 * -3.0));
              auVar186 = vshufps_avx(auVar186,auVar186,0);
              auVar180._0_4_ =
                   auVar186._0_4_ * fVar214 +
                   auVar197._0_4_ * fVar267 +
                   auVar223._0_4_ * fVar343 + auVar182._0_4_ * (float)local_790._0_4_;
              auVar180._4_4_ =
                   auVar186._4_4_ * fVar229 +
                   auVar197._4_4_ * fVar276 +
                   auVar223._4_4_ * fVar346 + auVar182._4_4_ * (float)local_790._4_4_;
              auVar180._8_4_ =
                   auVar186._8_4_ * auVar220._8_4_ +
                   auVar197._8_4_ * auVar270._8_4_ +
                   auVar223._8_4_ * auVar344._8_4_ + auVar182._8_4_ * (float)uStack_788;
              auVar180._12_4_ =
                   auVar186._12_4_ * auVar220._12_4_ +
                   auVar197._12_4_ * auVar270._12_4_ +
                   auVar223._12_4_ * auVar344._12_4_ + auVar182._12_4_ * uStack_788._4_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar124 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar180._0_4_;
              uVar12 = vextractps_avx(auVar180,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
              uVar12 = vextractps_avx(auVar180,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
              *(float *)(ray + k * 4 + 0xf0) = fVar313;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar130;
              *(uint *)(ray + k * 4 + 0x110) = uVar122;
              *(uint *)(ray + k * 4 + 0x120) = uVar125;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_560._0_16_ = vpshufd_avx(auVar271,0);
              _local_660 = vpermilps_avx(local_630,0);
              _auStack_650 = auVar20._16_16_;
              _auStack_690 = auVar28._16_16_;
              _local_6a0 = *local_6b8;
              auStack_6f0 = auVar239._16_16_;
              local_700 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              fStack_41c = auVar316._4_4_;
              fStack_418 = auVar316._8_4_;
              fStack_414 = auVar316._12_4_;
              _local_2e0 = auVar147;
              while( true ) {
                local_3c0 = local_1c0[uVar124];
                local_3b0 = *(undefined4 *)((long)&local_1a0 + uVar124 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar124 * 4);
                fVar319 = 1.0 - local_3c0;
                fVar313 = local_3c0 * fVar319 + local_3c0 * fVar319;
                auVar223 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar182 = ZEXT416((uint)((fVar313 - local_3c0 * local_3c0) * 3.0));
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                auVar197 = ZEXT416((uint)((fVar319 * fVar319 - fVar313) * 3.0));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                local_770.context = context->user;
                auVar186 = ZEXT416((uint)(fVar319 * fVar319 * -3.0));
                auVar186 = vshufps_avx(auVar186,auVar186,0);
                auVar187._0_4_ =
                     auVar186._0_4_ * fVar214 +
                     auVar197._0_4_ * fVar267 +
                     auVar223._0_4_ * (float)local_780._0_4_ +
                     auVar182._0_4_ * (float)local_790._0_4_;
                auVar187._4_4_ =
                     auVar186._4_4_ * fVar229 +
                     auVar197._4_4_ * fVar276 +
                     auVar223._4_4_ * (float)local_780._4_4_ +
                     auVar182._4_4_ * (float)local_790._4_4_;
                auVar187._8_4_ =
                     auVar186._8_4_ * auVar220._8_4_ +
                     auVar197._8_4_ * auVar270._8_4_ +
                     auVar223._8_4_ * (float)uStack_778 + auVar182._8_4_ * (float)uStack_788;
                auVar187._12_4_ =
                     auVar186._12_4_ * auVar220._12_4_ +
                     auVar197._12_4_ * auVar270._12_4_ +
                     auVar223._12_4_ * uStack_778._4_4_ + auVar182._12_4_ * uStack_788._4_4_;
                auVar223 = vshufps_avx(auVar187,auVar187,0);
                local_3f0[0] = (RTCHitN)auVar223[0];
                local_3f0[1] = (RTCHitN)auVar223[1];
                local_3f0[2] = (RTCHitN)auVar223[2];
                local_3f0[3] = (RTCHitN)auVar223[3];
                local_3f0[4] = (RTCHitN)auVar223[4];
                local_3f0[5] = (RTCHitN)auVar223[5];
                local_3f0[6] = (RTCHitN)auVar223[6];
                local_3f0[7] = (RTCHitN)auVar223[7];
                local_3f0[8] = (RTCHitN)auVar223[8];
                local_3f0[9] = (RTCHitN)auVar223[9];
                local_3f0[10] = (RTCHitN)auVar223[10];
                local_3f0[0xb] = (RTCHitN)auVar223[0xb];
                local_3f0[0xc] = (RTCHitN)auVar223[0xc];
                local_3f0[0xd] = (RTCHitN)auVar223[0xd];
                local_3f0[0xe] = (RTCHitN)auVar223[0xe];
                local_3f0[0xf] = (RTCHitN)auVar223[0xf];
                auVar223 = vshufps_avx(auVar187,auVar187,0x55);
                local_3e0 = auVar223;
                local_3d0 = vshufps_avx(auVar187,auVar187,0xaa);
                fStack_3bc = local_3c0;
                fStack_3b8 = local_3c0;
                fStack_3b4 = local_3c0;
                uStack_3ac = local_3b0;
                uStack_3a8 = local_3b0;
                uStack_3a4 = local_3b0;
                local_3a0 = local_660;
                uStack_398 = uStack_658;
                local_390 = local_560._0_16_;
                vcmpps_avx(ZEXT1632(local_560._0_16_),ZEXT1632(local_560._0_16_),0xf);
                uStack_37c = (local_770.context)->instID[0];
                local_380 = uStack_37c;
                uStack_378 = uStack_37c;
                uStack_374 = uStack_37c;
                uStack_370 = (local_770.context)->instPrimID[0];
                uStack_36c = uStack_370;
                uStack_368 = uStack_370;
                uStack_364 = uStack_370;
                local_870 = _local_6a0;
                local_770.valid = (int *)local_870;
                local_770.geometryUserPtr = pGVar128->userPtr;
                local_770.hit = local_3f0;
                local_770.N = 4;
                local_770.ray = (RTCRayN *)ray;
                if (pGVar128->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar128->intersectionFilterN)(&local_770);
                  auVar255 = ZEXT3264(local_620);
                  auVar335 = ZEXT3264(local_800);
                  fVar235 = (float)local_7c0._0_4_;
                  fVar309 = (float)local_7c0._4_4_;
                  fVar310 = fStack_7b8;
                  fVar311 = fStack_7b4;
                  fVar158 = fStack_7b0;
                  fVar169 = fStack_7ac;
                  fVar170 = fStack_7a8;
                  fVar174 = (float)local_820._0_4_;
                  fVar189 = (float)local_820._4_4_;
                  fVar190 = fStack_818;
                  fVar191 = fStack_814;
                  fVar171 = fStack_810;
                  fVar249 = fStack_80c;
                  fVar256 = fStack_808;
                  fVar215 = (float)local_7e0._0_4_;
                  fVar230 = (float)local_7e0._4_4_;
                  fVar232 = fStack_7d8;
                  fVar234 = fStack_7d4;
                  fVar258 = fStack_7d0;
                  fVar259 = fStack_7cc;
                  fVar283 = fStack_7c8;
                }
                if (local_870 == (undefined1  [16])0x0) {
                  auVar223 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar223 = auVar223 ^ _DAT_01f46b70;
                  auVar271 = local_600._0_16_;
                }
                else {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar128->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var16)(&local_770);
                    auVar255 = ZEXT3264(local_620);
                    auVar335 = ZEXT3264(local_800);
                    fVar235 = (float)local_7c0._0_4_;
                    fVar309 = (float)local_7c0._4_4_;
                    fVar310 = fStack_7b8;
                    fVar311 = fStack_7b4;
                    fVar158 = fStack_7b0;
                    fVar169 = fStack_7ac;
                    fVar170 = fStack_7a8;
                    fVar174 = (float)local_820._0_4_;
                    fVar189 = (float)local_820._4_4_;
                    fVar190 = fStack_818;
                    fVar191 = fStack_814;
                    fVar171 = fStack_810;
                    fVar249 = fStack_80c;
                    fVar256 = fStack_808;
                    fVar215 = (float)local_7e0._0_4_;
                    fVar230 = (float)local_7e0._4_4_;
                    fVar232 = fStack_7d8;
                    fVar234 = fStack_7d4;
                    fVar258 = fStack_7d0;
                    fVar259 = fStack_7cc;
                    fVar283 = fStack_7c8;
                  }
                  auVar182 = vpcmpeqd_avx(local_870,_DAT_01f45a50);
                  auVar197 = vpcmpeqd_avx(auVar223,auVar223);
                  auVar223 = auVar182 ^ auVar197;
                  auVar271 = local_600._0_16_;
                  if (local_870 != (undefined1  [16])0x0) {
                    auVar182 = auVar182 ^ auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])local_770.hit);
                    *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar197;
                    auVar197 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar197;
                    auVar182 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])(local_770.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar182;
                  }
                }
                auVar142 = local_440;
                auVar162._8_8_ = 0x100000001;
                auVar162._0_8_ = 0x100000001;
                if ((auVar162 & auVar223) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_700._0_4_;
                  auVar223 = local_700;
                }
                else {
                  auVar223 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_540 + uVar124 * 4) = 0;
                local_700 = auVar223;
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar147._16_16_ = auVar223;
                auVar147._0_16_ = auVar223;
                auVar28 = vcmpps_avx(auVar142,auVar147,2);
                auVar20 = vandps_avx(auVar28,local_540);
                local_540 = local_540 & auVar28;
                if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_540 >> 0x7f,0) == '\0') &&
                      (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_540 >> 0xbf,0) == '\0') &&
                    (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_540[0x1f]) break;
                auVar168._8_4_ = 0x7f800000;
                auVar168._0_8_ = 0x7f8000007f800000;
                auVar168._12_4_ = 0x7f800000;
                auVar168._16_4_ = 0x7f800000;
                auVar168._20_4_ = 0x7f800000;
                auVar168._24_4_ = 0x7f800000;
                auVar168._28_4_ = 0x7f800000;
                auVar142 = vblendvps_avx(auVar168,auVar142,auVar20);
                auVar28 = vshufps_avx(auVar142,auVar142,0xb1);
                auVar28 = vminps_avx(auVar142,auVar28);
                auVar26 = vshufpd_avx(auVar28,auVar28,5);
                auVar28 = vminps_avx(auVar28,auVar26);
                auVar26 = vperm2f128_avx(auVar28,auVar28,1);
                auVar28 = vminps_avx(auVar28,auVar26);
                auVar28 = vcmpps_avx(auVar142,auVar28,0);
                auVar26 = auVar20 & auVar28;
                auVar142 = auVar20;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar142 = vandps_avx(auVar28,auVar20);
                }
                uVar122 = vmovmskps_avx(auVar142);
                uVar125 = 0;
                if (uVar122 != 0) {
                  for (; (uVar122 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                  }
                }
                uVar124 = (ulong)uVar125;
                local_540 = auVar20;
              }
            }
          }
          fVar312 = (float)local_680._0_4_;
          fVar340 = (float)local_680._4_4_;
          fVar341 = fStack_678;
          fVar342 = fStack_674;
          fVar313 = fStack_670;
          fVar319 = fStack_66c;
          fVar320 = fStack_668;
          fVar322 = fStack_664;
          goto LAB_00908834;
        }
      }
    }
    if (8 < (int)uVar11) {
      _local_5a0 = vpshufd_avx(ZEXT416(uVar11),0);
      auVar223 = vshufps_avx(auVar184,auVar184,0);
      local_600._16_16_ = auVar223;
      local_600._0_16_ = auVar223;
      auVar110._4_4_ = uStack_83c;
      auVar110._0_4_ = local_840;
      auVar110._8_4_ = uStack_838;
      auVar110._12_4_ = uStack_834;
      auVar223 = vpermilps_avx(auVar110,0);
      local_300._16_16_ = auVar223;
      local_300._0_16_ = auVar223;
      auVar136._0_4_ = 1.0 / local_420;
      auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar223 = vshufps_avx(auVar136,auVar136,0);
      register0x00001210 = auVar223;
      _local_140 = auVar223;
      auVar223 = vpshufd_avx(auVar271,0);
      local_320._0_16_ = auVar223;
      local_630 = vpermilps_avx(local_630,0);
      lVar127 = 8;
      local_800 = auVar335._0_32_;
      local_620 = auVar255._0_32_;
      local_700._0_8_ = (long)(int)uVar11;
      while( true ) {
        if ((long)local_700._0_8_ <= lVar127) break;
        pauVar7 = (undefined1 (*) [28])(bezier_basis0 + lVar127 * 4 + lVar129);
        fVar293 = *(float *)*pauVar7;
        fVar296 = *(float *)(*pauVar7 + 4);
        fVar299 = *(float *)(*pauVar7 + 8);
        fVar206 = *(float *)(*pauVar7 + 0xc);
        fVar321 = *(float *)(*pauVar7 + 0x10);
        fVar211 = *(float *)(*pauVar7 + 0x14);
        fVar323 = *(float *)(*pauVar7 + 0x18);
        auVar119 = *pauVar7;
        pauVar9 = (undefined1 (*) [28])(lVar129 + 0x21fb768 + lVar127 * 4);
        fVar172 = *(float *)*pauVar9;
        fVar324 = *(float *)(*pauVar9 + 4);
        fVar336 = *(float *)(*pauVar9 + 8);
        fVar325 = *(float *)(*pauVar9 + 0xc);
        fVar204 = *(float *)(*pauVar9 + 0x10);
        fVar327 = *(float *)(*pauVar9 + 0x14);
        fVar326 = *(float *)(*pauVar9 + 0x18);
        auVar118 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar129 + 0x21fbbec + lVar127 * 4);
        fVar268 = *(float *)*pauVar9;
        fVar205 = *(float *)(*pauVar9 + 4);
        fVar261 = *(float *)(*pauVar9 + 8);
        fVar277 = *(float *)(*pauVar9 + 0xc);
        fVar278 = *(float *)(*pauVar9 + 0x10);
        fVar208 = *(float *)(*pauVar9 + 0x14);
        fVar262 = *(float *)(*pauVar9 + 0x18);
        auVar117 = *pauVar9;
        pfVar1 = (float *)(lVar129 + 0x21fc070 + lVar127 * 4);
        fVar279 = *pfVar1;
        fVar280 = pfVar1[1];
        fVar210 = pfVar1[2];
        fVar264 = pfVar1[3];
        fVar281 = pfVar1[4];
        fVar282 = pfVar1[5];
        fVar213 = pfVar1[6];
        fVar173 = pfVar1[7];
        local_8c0._0_4_ =
             (float)local_160._0_4_ * fVar293 +
             fVar235 * fVar172 + fVar215 * fVar268 + (float)local_460._0_4_ * fVar279;
        local_8c0._4_4_ =
             (float)local_160._4_4_ * fVar296 +
             fVar309 * fVar324 + fVar230 * fVar205 + (float)local_460._4_4_ * fVar280;
        fStack_8b8 = fStack_158 * fVar299 +
                     fVar310 * fVar336 + fVar232 * fVar261 + fStack_458 * fVar210;
        fStack_8b4 = fStack_154 * fVar206 +
                     fVar311 * fVar325 + fVar234 * fVar277 + fStack_454 * fVar264;
        fStack_8b0 = fStack_150 * fVar321 +
                     fVar158 * fVar204 + fVar258 * fVar278 + fStack_450 * fVar281;
        fStack_8ac = fStack_14c * fVar211 +
                     fVar169 * fVar327 + fVar259 * fVar208 + fStack_44c * fVar282;
        fStack_8a8 = fStack_148 * fVar323 +
                     fVar170 * fVar326 + fVar283 * fVar262 + fStack_448 * fVar213;
        fStack_8a4 = fVar173 + fVar322 + fVar173 + fVar173 + fStack_444;
        fVar152 = auVar255._0_4_;
        fVar207 = auVar255._4_4_;
        fVar209 = auVar255._8_4_;
        fVar212 = auVar255._12_4_;
        fVar266 = auVar255._16_4_;
        fVar216 = auVar255._20_4_;
        fVar231 = auVar255._24_4_;
        local_860._0_4_ =
             fVar152 * fVar293 +
             fVar172 * (float)local_480._0_4_ + fVar174 * fVar268 + fVar312 * fVar279;
        local_860._4_4_ =
             fVar207 * fVar296 +
             fVar324 * (float)local_480._4_4_ + fVar189 * fVar205 + fVar340 * fVar280;
        local_860._8_4_ =
             fVar209 * fVar299 + fVar336 * fStack_478 + fVar190 * fVar261 + fVar341 * fVar210;
        local_860._12_4_ =
             fVar212 * fVar206 + fVar325 * fStack_474 + fVar191 * fVar277 + fVar342 * fVar264;
        local_860._16_4_ =
             fVar266 * fVar321 + fVar204 * fStack_470 + fVar171 * fVar278 + fVar313 * fVar281;
        local_860._20_4_ =
             fVar216 * fVar211 + fVar327 * fStack_46c + fVar249 * fVar208 + fVar319 * fVar282;
        local_860._24_4_ =
             fVar231 * fVar323 + fVar326 * fStack_468 + fVar256 * fVar262 + fVar320 * fVar213;
        local_860._28_4_ = fStack_8a4 + fVar173 + fVar173 + fStack_4c4;
        fVar131 = (float)local_c0._0_4_ * fVar172 +
                  (float)local_80._0_4_ * fVar268 + (float)local_a0._0_4_ * fVar279 +
                  (float)local_e0._0_4_ * fVar293;
        fVar149 = (float)local_c0._4_4_ * fVar324 +
                  (float)local_80._4_4_ * fVar205 + (float)local_a0._4_4_ * fVar280 +
                  (float)local_e0._4_4_ * fVar296;
        fVar151 = fStack_b8 * fVar336 + fStack_78 * fVar261 + fStack_98 * fVar210 +
                  fStack_d8 * fVar299;
        fVar154 = fStack_b4 * fVar325 + fStack_74 * fVar277 + fStack_94 * fVar264 +
                  fStack_d4 * fVar206;
        fStack_830 = fStack_b0 * fVar204 + fStack_70 * fVar278 + fStack_90 * fVar281 +
                     fStack_d0 * fVar321;
        fStack_82c = fStack_ac * fVar327 + fStack_6c * fVar208 + fStack_8c * fVar282 +
                     fStack_cc * fVar211;
        fStack_828 = fStack_a8 * fVar326 + fStack_68 * fVar262 + fStack_88 * fVar213 +
                     fStack_c8 * fVar323;
        fStack_824 = fVar173 + fVar173 + fVar322 + fStack_8a4;
        pfVar1 = (float *)(bezier_basis1 + lVar127 * 4 + lVar129);
        fVar293 = *pfVar1;
        fVar296 = pfVar1[1];
        fVar299 = pfVar1[2];
        fVar206 = pfVar1[3];
        fVar321 = pfVar1[4];
        fVar211 = pfVar1[5];
        fVar323 = pfVar1[6];
        pfVar2 = (float *)(lVar129 + 0x21fdb88 + lVar127 * 4);
        fVar172 = *pfVar2;
        fVar324 = pfVar2[1];
        fVar336 = pfVar2[2];
        fVar325 = pfVar2[3];
        fVar204 = pfVar2[4];
        fVar327 = pfVar2[5];
        fVar326 = pfVar2[6];
        pfVar3 = (float *)(lVar129 + 0x21fe00c + lVar127 * 4);
        fVar268 = *pfVar3;
        fVar205 = pfVar3[1];
        fVar261 = pfVar3[2];
        fVar277 = pfVar3[3];
        fVar278 = pfVar3[4];
        fVar208 = pfVar3[5];
        fVar262 = pfVar3[6];
        pfVar4 = (float *)(lVar129 + 0x21fe490 + lVar127 * 4);
        fVar173 = *pfVar4;
        fVar305 = pfVar4[1];
        fVar148 = pfVar4[2];
        fVar150 = pfVar4[3];
        fVar153 = pfVar4[4];
        fVar155 = pfVar4[5];
        fVar156 = pfVar4[6];
        fVar233 = auVar255._28_4_;
        fVar235 = fVar233 + fVar233 + fStack_444;
        auVar246._0_4_ =
             (float)local_160._0_4_ * fVar293 +
             (float)local_7c0._0_4_ * fVar172 + fVar215 * fVar268 + (float)local_460._0_4_ * fVar173
        ;
        auVar246._4_4_ =
             (float)local_160._4_4_ * fVar296 +
             (float)local_7c0._4_4_ * fVar324 + fVar230 * fVar205 + (float)local_460._4_4_ * fVar305
        ;
        auVar246._8_4_ =
             fStack_158 * fVar299 + fStack_7b8 * fVar336 + fVar232 * fVar261 + fStack_458 * fVar148;
        auVar246._12_4_ =
             fStack_154 * fVar206 + fStack_7b4 * fVar325 + fVar234 * fVar277 + fStack_454 * fVar150;
        auVar246._16_4_ =
             fStack_150 * fVar321 + fStack_7b0 * fVar204 + fVar258 * fVar278 + fStack_450 * fVar153;
        auVar246._20_4_ =
             fStack_14c * fVar211 + fStack_7ac * fVar327 + fVar259 * fVar208 + fStack_44c * fVar155;
        auVar246._24_4_ =
             fStack_148 * fVar323 + fStack_7a8 * fVar326 + fVar283 * fVar262 + fStack_448 * fVar156;
        auVar246._28_4_ = fVar233 + fStack_84 + fVar235;
        local_560._0_4_ =
             fVar152 * fVar293 +
             fVar172 * (float)local_480._0_4_ + fVar174 * fVar268 + fVar312 * fVar173;
        local_560._4_4_ =
             fVar207 * fVar296 +
             fVar324 * (float)local_480._4_4_ + fVar189 * fVar205 + fVar340 * fVar305;
        local_560._8_4_ =
             fVar209 * fVar299 + fVar336 * fStack_478 + fVar190 * fVar261 + fVar341 * fVar148;
        local_560._12_4_ =
             fVar212 * fVar206 + fVar325 * fStack_474 + fVar191 * fVar277 + fVar342 * fVar150;
        local_560._16_4_ =
             fVar266 * fVar321 + fVar204 * fStack_470 + fVar171 * fVar278 + fVar313 * fVar153;
        local_560._20_4_ =
             fVar216 * fVar211 + fVar327 * fStack_46c + fVar249 * fVar208 + fVar319 * fVar155;
        local_560._24_4_ =
             fVar231 * fVar323 + fVar326 * fStack_468 + fVar256 * fVar262 + fVar320 * fVar156;
        local_560._28_4_ = fVar235 + fVar233 + fVar233 + *(float *)pauVar7[1];
        auVar318._0_4_ =
             (float)local_c0._0_4_ * fVar172 +
             (float)local_80._0_4_ * fVar268 + (float)local_a0._0_4_ * fVar173 +
             fVar293 * (float)local_e0._0_4_;
        auVar318._4_4_ =
             (float)local_c0._4_4_ * fVar324 +
             (float)local_80._4_4_ * fVar205 + (float)local_a0._4_4_ * fVar305 +
             fVar296 * (float)local_e0._4_4_;
        auVar318._8_4_ =
             fStack_b8 * fVar336 + fStack_78 * fVar261 + fStack_98 * fVar148 + fVar299 * fStack_d8;
        auVar318._12_4_ =
             fStack_b4 * fVar325 + fStack_74 * fVar277 + fStack_94 * fVar150 + fVar206 * fStack_d4;
        auVar318._16_4_ =
             fStack_b0 * fVar204 + fStack_70 * fVar278 + fStack_90 * fVar153 + fVar321 * fStack_d0;
        auVar318._20_4_ =
             fStack_ac * fVar327 + fStack_6c * fVar208 + fStack_8c * fVar155 + fVar211 * fStack_cc;
        auVar318._24_4_ =
             fStack_a8 * fVar326 + fStack_68 * fVar262 + fStack_88 * fVar156 + fVar323 * fStack_c8;
        auVar318._28_4_ = fVar233 + fVar233 + fStack_84 + fVar235;
        auVar20 = vsubps_avx(auVar246,_local_8c0);
        auVar28 = vsubps_avx(local_560,local_860);
        fVar313 = auVar20._0_4_;
        fVar319 = auVar20._4_4_;
        auVar65._4_4_ = local_860._4_4_ * fVar319;
        auVar65._0_4_ = local_860._0_4_ * fVar313;
        fVar320 = auVar20._8_4_;
        auVar65._8_4_ = local_860._8_4_ * fVar320;
        fVar322 = auVar20._12_4_;
        auVar65._12_4_ = local_860._12_4_ * fVar322;
        fVar158 = auVar20._16_4_;
        auVar65._16_4_ = local_860._16_4_ * fVar158;
        fVar169 = auVar20._20_4_;
        auVar65._20_4_ = local_860._20_4_ * fVar169;
        fVar170 = auVar20._24_4_;
        auVar65._24_4_ = local_860._24_4_ * fVar170;
        auVar65._28_4_ = fVar235;
        fVar171 = auVar28._0_4_;
        fVar249 = auVar28._4_4_;
        auVar66._4_4_ = fVar249 * (float)local_8c0._4_4_;
        auVar66._0_4_ = fVar171 * (float)local_8c0._0_4_;
        fVar256 = auVar28._8_4_;
        auVar66._8_4_ = fVar256 * fStack_8b8;
        fVar258 = auVar28._12_4_;
        auVar66._12_4_ = fVar258 * fStack_8b4;
        fVar259 = auVar28._16_4_;
        auVar66._16_4_ = fVar259 * fStack_8b0;
        fVar283 = auVar28._20_4_;
        auVar66._20_4_ = fVar283 * fStack_8ac;
        fVar312 = auVar28._24_4_;
        auVar66._24_4_ = fVar312 * fStack_8a8;
        auVar66._28_4_ = local_560._28_4_;
        auVar26 = vsubps_avx(auVar65,auVar66);
        auVar111._4_4_ = fVar149;
        auVar111._0_4_ = fVar131;
        auVar111._8_4_ = fVar151;
        auVar111._12_4_ = fVar154;
        auVar111._16_4_ = fStack_830;
        auVar111._20_4_ = fStack_82c;
        auVar111._24_4_ = fStack_828;
        auVar111._28_4_ = fStack_824;
        auVar142 = vmaxps_avx(auVar111,auVar318);
        auVar67._4_4_ = auVar142._4_4_ * auVar142._4_4_ * (fVar319 * fVar319 + fVar249 * fVar249);
        auVar67._0_4_ = auVar142._0_4_ * auVar142._0_4_ * (fVar313 * fVar313 + fVar171 * fVar171);
        auVar67._8_4_ = auVar142._8_4_ * auVar142._8_4_ * (fVar320 * fVar320 + fVar256 * fVar256);
        auVar67._12_4_ = auVar142._12_4_ * auVar142._12_4_ * (fVar322 * fVar322 + fVar258 * fVar258)
        ;
        auVar67._16_4_ = auVar142._16_4_ * auVar142._16_4_ * (fVar158 * fVar158 + fVar259 * fVar259)
        ;
        auVar67._20_4_ = auVar142._20_4_ * auVar142._20_4_ * (fVar169 * fVar169 + fVar283 * fVar283)
        ;
        auVar67._24_4_ = auVar142._24_4_ * auVar142._24_4_ * (fVar170 * fVar170 + fVar312 * fVar312)
        ;
        auVar67._28_4_ = auVar246._28_4_ + local_560._28_4_;
        auVar68._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar68._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar68._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar68._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar68._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar68._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar68._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar68._28_4_ = auVar26._28_4_;
        _local_5c0 = vcmpps_avx(auVar68,auVar67,2);
        local_240 = (uint)lVar127;
        auVar182 = vpshufd_avx(ZEXT416(local_240),0);
        auVar223 = vpor_avx(auVar182,_DAT_01f4ad30);
        auVar182 = vpor_avx(auVar182,_DAT_01f7afa0);
        auVar223 = vpcmpgtd_avx(_local_5a0,auVar223);
        auVar182 = vpcmpgtd_avx(_local_5a0,auVar182);
        register0x00001290 = auVar182;
        _local_2e0 = auVar223;
        auVar142 = _local_2e0 & _local_5c0;
        fVar312 = (float)local_680._0_4_;
        fVar340 = (float)local_680._4_4_;
        fVar341 = fStack_678;
        fVar342 = fStack_674;
        fVar313 = fStack_670;
        fVar319 = fStack_66c;
        fVar320 = fStack_668;
        fVar322 = fStack_664;
        fVar235 = (float)local_7c0._0_4_;
        fVar309 = (float)local_7c0._4_4_;
        fVar310 = fStack_7b8;
        fVar311 = fStack_7b4;
        fVar158 = fStack_7b0;
        fVar169 = fStack_7ac;
        fVar170 = fStack_7a8;
        fVar174 = (float)local_820._0_4_;
        fVar189 = (float)local_820._4_4_;
        fVar190 = fStack_818;
        fVar191 = fStack_814;
        fVar171 = fStack_810;
        fVar249 = fStack_80c;
        fVar256 = fStack_808;
        fVar215 = (float)local_7e0._0_4_;
        fVar230 = (float)local_7e0._4_4_;
        fVar232 = fStack_7d8;
        fVar234 = fStack_7d4;
        fVar258 = fStack_7d0;
        fVar259 = fStack_7cc;
        fVar283 = fStack_7c8;
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0x7f,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar142 >> 0xbf,0) == '\0') &&
            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar142[0x1f]) {
          auVar335 = ZEXT3264(local_800);
          auVar255 = ZEXT3264(auVar255._0_32_);
        }
        else {
          local_4a0 = fVar293 * (float)local_5e0._0_4_ +
                      fVar172 * (float)local_100._0_4_ +
                      (float)local_120._0_4_ * fVar268 + (float)local_740._0_4_ * fVar173;
          fStack_49c = fVar296 * (float)local_5e0._4_4_ +
                       fVar324 * (float)local_100._4_4_ +
                       (float)local_120._4_4_ * fVar205 + (float)local_740._4_4_ * fVar305;
          fStack_498 = fVar299 * fStack_5d8 +
                       fVar336 * fStack_f8 + fStack_118 * fVar261 + fStack_738 * fVar148;
          fStack_494 = fVar206 * fStack_5d4 +
                       fVar325 * fStack_f4 + fStack_114 * fVar277 + fStack_734 * fVar150;
          fStack_490 = fVar321 * fStack_5d0 +
                       fVar204 * fStack_f0 + fStack_110 * fVar278 + fStack_730 * fVar153;
          fStack_48c = fVar211 * fStack_5cc +
                       fVar327 * fStack_ec + fStack_10c * fVar208 + fStack_72c * fVar155;
          fStack_488 = fVar323 * fStack_5c8 +
                       fVar326 * fStack_e8 + fStack_108 * fVar262 + fStack_728 * fVar156;
          fStack_484 = pfVar1[7] + pfVar3[7] + pfVar4[7] + 0.0;
          local_6a0._0_4_ = auVar118._0_4_;
          local_6a0._4_4_ = auVar118._4_4_;
          fStack_698 = auVar118._8_4_;
          fStack_694 = auVar118._12_4_;
          auStack_690._0_4_ = auVar118._16_4_;
          auStack_690._4_4_ = auVar118._20_4_;
          fStack_688 = auVar118._24_4_;
          local_580._0_4_ = auVar117._0_4_;
          local_580._4_4_ = auVar117._4_4_;
          fStack_578 = auVar117._8_4_;
          fStack_574 = auVar117._12_4_;
          fStack_570 = auVar117._16_4_;
          fStack_56c = auVar117._20_4_;
          fStack_568 = auVar117._24_4_;
          pfVar1 = (float *)(lVar129 + 0x21fcdfc + lVar127 * 4);
          fVar293 = *pfVar1;
          fVar296 = pfVar1[1];
          fVar299 = pfVar1[2];
          fVar206 = pfVar1[3];
          fVar321 = pfVar1[4];
          fVar211 = pfVar1[5];
          fVar323 = pfVar1[6];
          pfVar3 = (float *)(lVar129 + 0x21fd280 + lVar127 * 4);
          fVar172 = *pfVar3;
          fVar324 = pfVar3[1];
          fVar336 = pfVar3[2];
          fVar325 = pfVar3[3];
          fVar204 = pfVar3[4];
          fVar327 = pfVar3[5];
          fVar326 = pfVar3[6];
          fVar248 = pfVar2[7] + 0.0;
          pfVar5 = (float *)(lVar129 + 0x21fc978 + lVar127 * 4);
          fVar268 = *pfVar5;
          fVar205 = pfVar5[1];
          fVar261 = pfVar5[2];
          fVar277 = pfVar5[3];
          fVar278 = pfVar5[4];
          fVar208 = pfVar5[5];
          fVar262 = pfVar5[6];
          fVar157 = pfVar1[7] + pfVar3[7];
          fStack_404 = pfVar3[7] + fVar248;
          fVar248 = fVar248 + pfVar2[7] + auVar182._12_4_;
          pfVar1 = (float *)(lVar129 + 0x21fc4f4 + lVar127 * 4);
          fVar173 = *pfVar1;
          fVar305 = pfVar1[1];
          fVar148 = pfVar1[2];
          fVar150 = pfVar1[3];
          fVar153 = pfVar1[4];
          fVar155 = pfVar1[5];
          fVar156 = pfVar1[6];
          local_720 = (float)local_160._0_4_ * fVar173 +
                      (float)local_7c0._0_4_ * fVar268 +
                      (float)local_7e0._0_4_ * fVar293 + (float)local_460._0_4_ * fVar172;
          fStack_71c = (float)local_160._4_4_ * fVar305 +
                       (float)local_7c0._4_4_ * fVar205 +
                       (float)local_7e0._4_4_ * fVar296 + (float)local_460._4_4_ * fVar324;
          fStack_718 = fStack_158 * fVar148 +
                       fStack_7b8 * fVar261 + fStack_7d8 * fVar299 + fStack_458 * fVar336;
          fStack_714 = fStack_154 * fVar150 +
                       fStack_7b4 * fVar277 + fStack_7d4 * fVar206 + fStack_454 * fVar325;
          fStack_710 = fStack_150 * fVar153 +
                       fStack_7b0 * fVar278 + fStack_7d0 * fVar321 + fStack_450 * fVar204;
          fStack_70c = fStack_14c * fVar155 +
                       fStack_7ac * fVar208 + fStack_7cc * fVar211 + fStack_44c * fVar327;
          fStack_708 = fStack_148 * fVar156 +
                       fStack_7a8 * fVar262 + fStack_7c8 * fVar323 + fStack_448 * fVar326;
          fStack_704 = fVar157 + fStack_404;
          local_420 = fVar152 * fVar173 +
                      fVar268 * (float)local_480._0_4_ +
                      (float)local_820._0_4_ * fVar293 + (float)local_680._0_4_ * fVar172;
          fStack_41c = fVar207 * fVar305 +
                       fVar205 * (float)local_480._4_4_ +
                       (float)local_820._4_4_ * fVar296 + (float)local_680._4_4_ * fVar324;
          fStack_418 = fVar209 * fVar148 +
                       fVar261 * fStack_478 + fStack_818 * fVar299 + fStack_678 * fVar336;
          fStack_414 = fVar212 * fVar150 +
                       fVar277 * fStack_474 + fStack_814 * fVar206 + fStack_674 * fVar325;
          fStack_410 = fVar266 * fVar153 +
                       fVar278 * fStack_470 + fStack_810 * fVar321 + fStack_670 * fVar204;
          fStack_40c = fVar216 * fVar155 +
                       fVar208 * fStack_46c + fStack_80c * fVar211 + fStack_66c * fVar327;
          fStack_408 = fVar231 * fVar156 +
                       fVar262 * fStack_468 + fStack_808 * fVar323 + fStack_668 * fVar326;
          fStack_404 = fStack_404 + fVar248;
          auVar338._0_4_ =
               fVar268 * (float)local_100._0_4_ +
               (float)local_120._0_4_ * fVar293 + (float)local_740._0_4_ * fVar172 +
               fVar173 * (float)local_5e0._0_4_;
          auVar338._4_4_ =
               fVar205 * (float)local_100._4_4_ +
               (float)local_120._4_4_ * fVar296 + (float)local_740._4_4_ * fVar324 +
               fVar305 * (float)local_5e0._4_4_;
          auVar338._8_4_ =
               fVar261 * fStack_f8 + fStack_118 * fVar299 + fStack_738 * fVar336 +
               fVar148 * fStack_5d8;
          auVar338._12_4_ =
               fVar277 * fStack_f4 + fStack_114 * fVar206 + fStack_734 * fVar325 +
               fVar150 * fStack_5d4;
          auVar338._16_4_ =
               fVar278 * fStack_f0 + fStack_110 * fVar321 + fStack_730 * fVar204 +
               fVar153 * fStack_5d0;
          auVar338._20_4_ =
               fVar208 * fStack_ec + fStack_10c * fVar211 + fStack_72c * fVar327 +
               fVar155 * fStack_5cc;
          auVar338._24_4_ =
               fVar262 * fStack_e8 + fStack_108 * fVar323 + fStack_728 * fVar326 +
               fVar156 * fStack_5c8;
          auVar338._28_4_ = pfVar5[7] + fVar157 + fVar248;
          pfVar1 = (float *)(lVar129 + 0x21ff21c + lVar127 * 4);
          fVar293 = *pfVar1;
          fVar296 = pfVar1[1];
          fVar299 = pfVar1[2];
          fVar206 = pfVar1[3];
          fVar321 = pfVar1[4];
          fVar211 = pfVar1[5];
          fVar323 = pfVar1[6];
          pfVar2 = (float *)(lVar129 + 0x21ff6a0 + lVar127 * 4);
          fVar172 = *pfVar2;
          fVar324 = pfVar2[1];
          fVar336 = pfVar2[2];
          fVar325 = pfVar2[3];
          fVar204 = pfVar2[4];
          fVar327 = pfVar2[5];
          fVar326 = pfVar2[6];
          pfVar3 = (float *)(lVar129 + 0x21fed98 + lVar127 * 4);
          fVar268 = *pfVar3;
          fVar205 = pfVar3[1];
          fVar261 = pfVar3[2];
          fVar277 = pfVar3[3];
          fVar278 = pfVar3[4];
          fVar208 = pfVar3[5];
          fVar262 = pfVar3[6];
          pfVar5 = (float *)(lVar129 + 0x21fe914 + lVar127 * 4);
          fVar173 = *pfVar5;
          fVar305 = pfVar5[1];
          fVar148 = pfVar5[2];
          fVar150 = pfVar5[3];
          fVar153 = pfVar5[4];
          fVar155 = pfVar5[5];
          fVar156 = pfVar5[6];
          auVar291._0_4_ =
               (float)local_160._0_4_ * fVar173 +
               fVar268 * (float)local_7c0._0_4_ +
               (float)local_7e0._0_4_ * fVar293 + (float)local_460._0_4_ * fVar172;
          auVar291._4_4_ =
               (float)local_160._4_4_ * fVar305 +
               fVar205 * (float)local_7c0._4_4_ +
               (float)local_7e0._4_4_ * fVar296 + (float)local_460._4_4_ * fVar324;
          auVar291._8_4_ =
               fStack_158 * fVar148 +
               fVar261 * fStack_7b8 + fStack_7d8 * fVar299 + fStack_458 * fVar336;
          auVar291._12_4_ =
               fStack_154 * fVar150 +
               fVar277 * fStack_7b4 + fStack_7d4 * fVar206 + fStack_454 * fVar325;
          auVar291._16_4_ =
               fStack_150 * fVar153 +
               fVar278 * fStack_7b0 + fStack_7d0 * fVar321 + fStack_450 * fVar204;
          auVar291._20_4_ =
               fStack_14c * fVar155 +
               fVar208 * fStack_7ac + fStack_7cc * fVar211 + fStack_44c * fVar327;
          auVar291._24_4_ =
               fStack_148 * fVar156 +
               fVar262 * fStack_7a8 + fStack_7c8 * fVar323 + fStack_448 * fVar326;
          auVar291._28_4_ = fVar233 + fVar233 + fStack_7c4 + fVar233;
          auVar333._0_4_ =
               fVar173 * fVar152 +
               fVar268 * (float)local_480._0_4_ +
               (float)local_820._0_4_ * fVar293 + (float)local_680._0_4_ * fVar172;
          auVar333._4_4_ =
               fVar305 * fVar207 +
               fVar205 * (float)local_480._4_4_ +
               (float)local_820._4_4_ * fVar296 + (float)local_680._4_4_ * fVar324;
          auVar333._8_4_ =
               fVar148 * fVar209 +
               fVar261 * fStack_478 + fStack_818 * fVar299 + fStack_678 * fVar336;
          auVar333._12_4_ =
               fVar150 * fVar212 +
               fVar277 * fStack_474 + fStack_814 * fVar206 + fStack_674 * fVar325;
          auVar333._16_4_ =
               fVar153 * fVar266 +
               fVar278 * fStack_470 + fStack_810 * fVar321 + fStack_670 * fVar204;
          auVar333._20_4_ =
               fVar155 * fVar216 +
               fVar208 * fStack_46c + fStack_80c * fVar211 + fStack_66c * fVar327;
          auVar333._24_4_ =
               fVar156 * fVar231 +
               fVar262 * fStack_468 + fStack_808 * fVar323 + fStack_668 * fVar326;
          auVar333._28_4_ = fVar233 + fVar233 + fStack_444 + fVar233;
          auVar240._8_4_ = 0x7fffffff;
          auVar240._0_8_ = 0x7fffffff7fffffff;
          auVar240._12_4_ = 0x7fffffff;
          auVar240._16_4_ = 0x7fffffff;
          auVar240._20_4_ = 0x7fffffff;
          auVar240._24_4_ = 0x7fffffff;
          auVar240._28_4_ = 0x7fffffff;
          auVar113._4_4_ = fStack_71c;
          auVar113._0_4_ = local_720;
          auVar113._8_4_ = fStack_718;
          auVar113._12_4_ = fStack_714;
          auVar113._16_4_ = fStack_710;
          auVar113._20_4_ = fStack_70c;
          auVar113._24_4_ = fStack_708;
          auVar113._28_4_ = fStack_704;
          auVar142 = vandps_avx(auVar113,auVar240);
          auVar116._4_4_ = fStack_41c;
          auVar116._0_4_ = local_420;
          auVar116._8_4_ = fStack_418;
          auVar116._12_4_ = fStack_414;
          auVar116._16_4_ = fStack_410;
          auVar116._20_4_ = fStack_40c;
          auVar116._24_4_ = fStack_408;
          auVar116._28_4_ = fStack_404;
          auVar26 = vandps_avx(auVar116,auVar240);
          auVar26 = vmaxps_avx(auVar142,auVar26);
          auVar142 = vandps_avx(auVar338,auVar240);
          auVar26 = vmaxps_avx(auVar26,auVar142);
          auVar26 = vcmpps_avx(auVar26,local_600,1);
          auVar27 = vblendvps_avx(auVar113,auVar20,auVar26);
          auVar143._0_4_ =
               fVar173 * (float)local_5e0._0_4_ +
               fVar268 * (float)local_100._0_4_ +
               fVar172 * (float)local_740._0_4_ + (float)local_120._0_4_ * fVar293;
          auVar143._4_4_ =
               fVar305 * (float)local_5e0._4_4_ +
               fVar205 * (float)local_100._4_4_ +
               fVar324 * (float)local_740._4_4_ + (float)local_120._4_4_ * fVar296;
          auVar143._8_4_ =
               fVar148 * fStack_5d8 +
               fVar261 * fStack_f8 + fVar336 * fStack_738 + fStack_118 * fVar299;
          auVar143._12_4_ =
               fVar150 * fStack_5d4 +
               fVar277 * fStack_f4 + fVar325 * fStack_734 + fStack_114 * fVar206;
          auVar143._16_4_ =
               fVar153 * fStack_5d0 +
               fVar278 * fStack_f0 + fVar204 * fStack_730 + fStack_110 * fVar321;
          auVar143._20_4_ =
               fVar155 * fStack_5cc +
               fVar208 * fStack_ec + fVar327 * fStack_72c + fStack_10c * fVar211;
          auVar143._24_4_ =
               fVar156 * fStack_5c8 +
               fVar262 * fStack_e8 + fVar326 * fStack_728 + fStack_108 * fVar323;
          auVar143._28_4_ = auVar142._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar34 = vblendvps_avx(auVar116,auVar28,auVar26);
          auVar142 = vandps_avx(auVar291,auVar240);
          auVar26 = vandps_avx(auVar333,auVar240);
          auVar21 = vmaxps_avx(auVar142,auVar26);
          auVar142 = vandps_avx(auVar143,auVar240);
          auVar142 = vmaxps_avx(auVar21,auVar142);
          local_660._0_4_ = auVar119._0_4_;
          local_660._4_4_ = auVar119._4_4_;
          uStack_658._0_4_ = auVar119._8_4_;
          uStack_658._4_4_ = auVar119._12_4_;
          auStack_650._0_4_ = auVar119._16_4_;
          auStack_650._4_4_ = auVar119._20_4_;
          fStack_648 = auVar119._24_4_;
          auVar26 = vcmpps_avx(auVar142,local_600,1);
          auVar142 = vblendvps_avx(auVar291,auVar20,auVar26);
          auVar144._0_4_ =
               (float)local_5e0._0_4_ * (float)local_660._0_4_ +
               (float)local_100._0_4_ * (float)local_6a0._0_4_ +
               (float)local_120._0_4_ * (float)local_580._0_4_ + (float)local_740._0_4_ * fVar279;
          auVar144._4_4_ =
               (float)local_5e0._4_4_ * (float)local_660._4_4_ +
               (float)local_100._4_4_ * (float)local_6a0._4_4_ +
               (float)local_120._4_4_ * (float)local_580._4_4_ + (float)local_740._4_4_ * fVar280;
          auVar144._8_4_ =
               fStack_5d8 * (float)uStack_658 +
               fStack_f8 * fStack_698 + fStack_118 * fStack_578 + fStack_738 * fVar210;
          auVar144._12_4_ =
               fStack_5d4 * uStack_658._4_4_ +
               fStack_f4 * fStack_694 + fStack_114 * fStack_574 + fStack_734 * fVar264;
          auVar144._16_4_ =
               fStack_5d0 * (float)auStack_650._0_4_ +
               fStack_f0 * (float)auStack_690._0_4_ + fStack_110 * fStack_570 + fStack_730 * fVar281
          ;
          auVar144._20_4_ =
               fStack_5cc * (float)auStack_650._4_4_ +
               fStack_ec * (float)auStack_690._4_4_ + fStack_10c * fStack_56c + fStack_72c * fVar282
          ;
          auVar144._24_4_ =
               fStack_5c8 * fStack_648 +
               fStack_e8 * fStack_688 + fStack_108 * fStack_568 + fStack_728 * fVar213;
          auVar144._28_4_ = auVar21._28_4_ + fStack_484 + pfVar4[7] + 0.0;
          auVar20 = vblendvps_avx(auVar333,auVar28,auVar26);
          fVar152 = auVar27._0_4_;
          fVar207 = auVar27._4_4_;
          fVar209 = auVar27._8_4_;
          fVar212 = auVar27._12_4_;
          fVar266 = auVar27._16_4_;
          fVar216 = auVar27._20_4_;
          fVar231 = auVar27._24_4_;
          fVar233 = auVar27._28_4_;
          fVar268 = auVar142._0_4_;
          fVar261 = auVar142._4_4_;
          fVar278 = auVar142._8_4_;
          fVar262 = auVar142._12_4_;
          fVar280 = auVar142._16_4_;
          fVar264 = auVar142._20_4_;
          fVar282 = auVar142._24_4_;
          fVar293 = auVar34._0_4_;
          fVar299 = auVar34._4_4_;
          fVar321 = auVar34._8_4_;
          fVar323 = auVar34._12_4_;
          fVar324 = auVar34._16_4_;
          fVar325 = auVar34._20_4_;
          fVar327 = auVar34._24_4_;
          auVar308._0_4_ = fVar293 * fVar293 + fVar152 * fVar152;
          auVar308._4_4_ = fVar299 * fVar299 + fVar207 * fVar207;
          auVar308._8_4_ = fVar321 * fVar321 + fVar209 * fVar209;
          auVar308._12_4_ = fVar323 * fVar323 + fVar212 * fVar212;
          auVar308._16_4_ = fVar324 * fVar324 + fVar266 * fVar266;
          auVar308._20_4_ = fVar325 * fVar325 + fVar216 * fVar216;
          auVar308._24_4_ = fVar327 * fVar327 + fVar231 * fVar231;
          auVar308._28_4_ = fStack_664 + auVar28._28_4_;
          auVar28 = vrsqrtps_avx(auVar308);
          fVar296 = auVar28._0_4_;
          fVar206 = auVar28._4_4_;
          auVar69._4_4_ = fVar206 * 1.5;
          auVar69._0_4_ = fVar296 * 1.5;
          fVar211 = auVar28._8_4_;
          auVar69._8_4_ = fVar211 * 1.5;
          fVar172 = auVar28._12_4_;
          auVar69._12_4_ = fVar172 * 1.5;
          fVar336 = auVar28._16_4_;
          auVar69._16_4_ = fVar336 * 1.5;
          fVar204 = auVar28._20_4_;
          auVar69._20_4_ = fVar204 * 1.5;
          fVar326 = auVar28._24_4_;
          auVar69._24_4_ = fVar326 * 1.5;
          auVar69._28_4_ = auVar333._28_4_;
          auVar70._4_4_ = fVar206 * fVar206 * fVar206 * auVar308._4_4_ * 0.5;
          auVar70._0_4_ = fVar296 * fVar296 * fVar296 * auVar308._0_4_ * 0.5;
          auVar70._8_4_ = fVar211 * fVar211 * fVar211 * auVar308._8_4_ * 0.5;
          auVar70._12_4_ = fVar172 * fVar172 * fVar172 * auVar308._12_4_ * 0.5;
          auVar70._16_4_ = fVar336 * fVar336 * fVar336 * auVar308._16_4_ * 0.5;
          auVar70._20_4_ = fVar204 * fVar204 * fVar204 * auVar308._20_4_ * 0.5;
          auVar70._24_4_ = fVar326 * fVar326 * fVar326 * auVar308._24_4_ * 0.5;
          auVar70._28_4_ = auVar308._28_4_;
          auVar26 = vsubps_avx(auVar69,auVar70);
          fVar173 = auVar26._0_4_;
          fVar305 = auVar26._4_4_;
          fVar148 = auVar26._8_4_;
          fVar150 = auVar26._12_4_;
          fVar153 = auVar26._16_4_;
          fVar155 = auVar26._20_4_;
          fVar156 = auVar26._24_4_;
          fVar296 = auVar20._0_4_;
          fVar206 = auVar20._4_4_;
          fVar211 = auVar20._8_4_;
          fVar172 = auVar20._12_4_;
          fVar336 = auVar20._16_4_;
          fVar204 = auVar20._20_4_;
          fVar326 = auVar20._24_4_;
          auVar273._0_4_ = fVar296 * fVar296 + fVar268 * fVar268;
          auVar273._4_4_ = fVar206 * fVar206 + fVar261 * fVar261;
          auVar273._8_4_ = fVar211 * fVar211 + fVar278 * fVar278;
          auVar273._12_4_ = fVar172 * fVar172 + fVar262 * fVar262;
          auVar273._16_4_ = fVar336 * fVar336 + fVar280 * fVar280;
          auVar273._20_4_ = fVar204 * fVar204 + fVar264 * fVar264;
          auVar273._24_4_ = fVar326 * fVar326 + fVar282 * fVar282;
          auVar273._28_4_ = auVar28._28_4_ + auVar142._28_4_;
          auVar142 = vrsqrtps_avx(auVar273);
          fVar205 = auVar142._0_4_;
          fVar277 = auVar142._4_4_;
          auVar71._4_4_ = fVar277 * 1.5;
          auVar71._0_4_ = fVar205 * 1.5;
          fVar208 = auVar142._8_4_;
          auVar71._8_4_ = fVar208 * 1.5;
          fVar279 = auVar142._12_4_;
          auVar71._12_4_ = fVar279 * 1.5;
          fVar210 = auVar142._16_4_;
          auVar71._16_4_ = fVar210 * 1.5;
          fVar281 = auVar142._20_4_;
          auVar71._20_4_ = fVar281 * 1.5;
          fVar213 = auVar142._24_4_;
          auVar71._24_4_ = fVar213 * 1.5;
          auVar71._28_4_ = auVar333._28_4_;
          auVar72._4_4_ = fVar277 * fVar277 * fVar277 * auVar273._4_4_ * 0.5;
          auVar72._0_4_ = fVar205 * fVar205 * fVar205 * auVar273._0_4_ * 0.5;
          auVar72._8_4_ = fVar208 * fVar208 * fVar208 * auVar273._8_4_ * 0.5;
          auVar72._12_4_ = fVar279 * fVar279 * fVar279 * auVar273._12_4_ * 0.5;
          auVar72._16_4_ = fVar210 * fVar210 * fVar210 * auVar273._16_4_ * 0.5;
          auVar72._20_4_ = fVar281 * fVar281 * fVar281 * auVar273._20_4_ * 0.5;
          auVar72._24_4_ = fVar213 * fVar213 * fVar213 * auVar273._24_4_ * 0.5;
          auVar72._28_4_ = auVar273._28_4_;
          auVar20 = vsubps_avx(auVar71,auVar72);
          fVar205 = auVar20._0_4_;
          fVar277 = auVar20._4_4_;
          fVar208 = auVar20._8_4_;
          fVar279 = auVar20._12_4_;
          fVar210 = auVar20._16_4_;
          fVar281 = auVar20._20_4_;
          fVar213 = auVar20._24_4_;
          fVar293 = fVar131 * fVar173 * fVar293;
          fVar299 = fVar149 * fVar305 * fVar299;
          auVar73._4_4_ = fVar299;
          auVar73._0_4_ = fVar293;
          fVar321 = fVar151 * fVar148 * fVar321;
          auVar73._8_4_ = fVar321;
          fVar323 = fVar154 * fVar150 * fVar323;
          auVar73._12_4_ = fVar323;
          fVar324 = fStack_830 * fVar153 * fVar324;
          auVar73._16_4_ = fVar324;
          fVar325 = fStack_82c * fVar155 * fVar325;
          auVar73._20_4_ = fVar325;
          fVar327 = fStack_828 * fVar156 * fVar327;
          auVar73._24_4_ = fVar327;
          auVar73._28_4_ = auVar142._28_4_;
          local_660._4_4_ = fVar299 + (float)local_8c0._4_4_;
          local_660._0_4_ = fVar293 + (float)local_8c0._0_4_;
          uStack_658._0_4_ = fVar321 + fStack_8b8;
          uStack_658._4_4_ = fVar323 + fStack_8b4;
          auStack_650._0_4_ = fVar324 + fStack_8b0;
          auStack_650._4_4_ = fVar325 + fStack_8ac;
          fStack_648 = fVar327 + fStack_8a8;
          fStack_644 = auVar142._28_4_ + fStack_8a4;
          fVar293 = fVar131 * fVar173 * -fVar152;
          fVar299 = fVar149 * fVar305 * -fVar207;
          auVar74._4_4_ = fVar299;
          auVar74._0_4_ = fVar293;
          fVar321 = fVar151 * fVar148 * -fVar209;
          auVar74._8_4_ = fVar321;
          fVar323 = fVar154 * fVar150 * -fVar212;
          auVar74._12_4_ = fVar323;
          fVar324 = fStack_830 * fVar153 * -fVar266;
          auVar74._16_4_ = fVar324;
          fVar325 = fStack_82c * fVar155 * -fVar216;
          auVar74._20_4_ = fVar325;
          fVar327 = fStack_828 * fVar156 * -fVar231;
          auVar74._24_4_ = fVar327;
          auVar74._28_4_ = -fVar233;
          local_580._4_4_ = local_860._4_4_ + fVar299;
          local_580._0_4_ = local_860._0_4_ + fVar293;
          fStack_578 = local_860._8_4_ + fVar321;
          fStack_574 = local_860._12_4_ + fVar323;
          fStack_570 = local_860._16_4_ + fVar324;
          fStack_56c = local_860._20_4_ + fVar325;
          fStack_568 = local_860._24_4_ + fVar327;
          fStack_564 = local_860._28_4_ + -fVar233;
          fVar293 = fVar173 * 0.0 * fVar131;
          fVar299 = fVar305 * 0.0 * fVar149;
          auVar75._4_4_ = fVar299;
          auVar75._0_4_ = fVar293;
          fVar321 = fVar148 * 0.0 * fVar151;
          auVar75._8_4_ = fVar321;
          fVar323 = fVar150 * 0.0 * fVar154;
          auVar75._12_4_ = fVar323;
          fVar324 = fVar153 * 0.0 * fStack_830;
          auVar75._16_4_ = fVar324;
          fVar325 = fVar155 * 0.0 * fStack_82c;
          auVar75._20_4_ = fVar325;
          fVar327 = fVar156 * 0.0 * fStack_828;
          auVar75._24_4_ = fVar327;
          auVar75._28_4_ = fVar233;
          auVar142 = vsubps_avx(_local_8c0,auVar73);
          auVar351._0_4_ = fVar293 + auVar144._0_4_;
          auVar351._4_4_ = fVar299 + auVar144._4_4_;
          auVar351._8_4_ = fVar321 + auVar144._8_4_;
          auVar351._12_4_ = fVar323 + auVar144._12_4_;
          auVar351._16_4_ = fVar324 + auVar144._16_4_;
          auVar351._20_4_ = fVar325 + auVar144._20_4_;
          auVar351._24_4_ = fVar327 + auVar144._24_4_;
          auVar351._28_4_ = fVar233 + auVar144._28_4_;
          fVar293 = auVar318._0_4_ * fVar205 * fVar296;
          fVar296 = auVar318._4_4_ * fVar277 * fVar206;
          auVar76._4_4_ = fVar296;
          auVar76._0_4_ = fVar293;
          fVar299 = auVar318._8_4_ * fVar208 * fVar211;
          auVar76._8_4_ = fVar299;
          fVar206 = auVar318._12_4_ * fVar279 * fVar172;
          auVar76._12_4_ = fVar206;
          fVar321 = auVar318._16_4_ * fVar210 * fVar336;
          auVar76._16_4_ = fVar321;
          fVar211 = auVar318._20_4_ * fVar281 * fVar204;
          auVar76._20_4_ = fVar211;
          fVar323 = auVar318._24_4_ * fVar213 * fVar326;
          auVar76._24_4_ = fVar323;
          auVar76._28_4_ = fStack_8a4;
          auVar272 = vsubps_avx(local_860,auVar74);
          auVar339._0_4_ = auVar246._0_4_ + fVar293;
          auVar339._4_4_ = auVar246._4_4_ + fVar296;
          auVar339._8_4_ = auVar246._8_4_ + fVar299;
          auVar339._12_4_ = auVar246._12_4_ + fVar206;
          auVar339._16_4_ = auVar246._16_4_ + fVar321;
          auVar339._20_4_ = auVar246._20_4_ + fVar211;
          auVar339._24_4_ = auVar246._24_4_ + fVar323;
          auVar339._28_4_ = auVar246._28_4_ + fStack_8a4;
          fVar293 = fVar205 * -fVar268 * auVar318._0_4_;
          fVar296 = fVar277 * -fVar261 * auVar318._4_4_;
          auVar77._4_4_ = fVar296;
          auVar77._0_4_ = fVar293;
          fVar299 = fVar208 * -fVar278 * auVar318._8_4_;
          auVar77._8_4_ = fVar299;
          fVar206 = fVar279 * -fVar262 * auVar318._12_4_;
          auVar77._12_4_ = fVar206;
          fVar321 = fVar210 * -fVar280 * auVar318._16_4_;
          auVar77._16_4_ = fVar321;
          fVar211 = fVar281 * -fVar264 * auVar318._20_4_;
          auVar77._20_4_ = fVar211;
          fVar323 = fVar213 * -fVar282 * auVar318._24_4_;
          auVar77._24_4_ = fVar323;
          auVar77._28_4_ = fStack_824;
          auVar317 = vsubps_avx(auVar144,auVar75);
          auVar228._0_4_ = local_560._0_4_ + fVar293;
          auVar228._4_4_ = local_560._4_4_ + fVar296;
          auVar228._8_4_ = local_560._8_4_ + fVar299;
          auVar228._12_4_ = local_560._12_4_ + fVar206;
          auVar228._16_4_ = local_560._16_4_ + fVar321;
          auVar228._20_4_ = local_560._20_4_ + fVar211;
          auVar228._24_4_ = local_560._24_4_ + fVar323;
          auVar228._28_4_ = local_560._28_4_ + fStack_824;
          fVar293 = fVar205 * 0.0 * auVar318._0_4_;
          fVar296 = fVar277 * 0.0 * auVar318._4_4_;
          auVar78._4_4_ = fVar296;
          auVar78._0_4_ = fVar293;
          fVar299 = fVar208 * 0.0 * auVar318._8_4_;
          auVar78._8_4_ = fVar299;
          fVar206 = fVar279 * 0.0 * auVar318._12_4_;
          auVar78._12_4_ = fVar206;
          fVar321 = fVar210 * 0.0 * auVar318._16_4_;
          auVar78._16_4_ = fVar321;
          fVar211 = fVar281 * 0.0 * auVar318._20_4_;
          auVar78._20_4_ = fVar211;
          fVar323 = fVar213 * 0.0 * auVar318._24_4_;
          auVar78._24_4_ = fVar323;
          auVar78._28_4_ = auVar144._28_4_;
          auVar28 = vsubps_avx(auVar246,auVar76);
          auVar115._4_4_ = fStack_49c;
          auVar115._0_4_ = local_4a0;
          auVar115._8_4_ = fStack_498;
          auVar115._12_4_ = fStack_494;
          auVar115._16_4_ = fStack_490;
          auVar115._20_4_ = fStack_48c;
          auVar115._24_4_ = fStack_488;
          auVar115._28_4_ = fStack_484;
          auVar292._0_4_ = local_4a0 + fVar293;
          auVar292._4_4_ = fStack_49c + fVar296;
          auVar292._8_4_ = fStack_498 + fVar299;
          auVar292._12_4_ = fStack_494 + fVar206;
          auVar292._16_4_ = fStack_490 + fVar321;
          auVar292._20_4_ = fStack_48c + fVar211;
          auVar292._24_4_ = fStack_488 + fVar323;
          auVar292._28_4_ = fStack_484 + auVar144._28_4_;
          auVar26 = vsubps_avx(local_560,auVar77);
          auVar27 = vsubps_avx(auVar115,auVar78);
          auVar34 = vsubps_avx(auVar228,auVar272);
          auVar21 = vsubps_avx(auVar292,auVar317);
          auVar79._4_4_ = auVar317._4_4_ * auVar34._4_4_;
          auVar79._0_4_ = auVar317._0_4_ * auVar34._0_4_;
          auVar79._8_4_ = auVar317._8_4_ * auVar34._8_4_;
          auVar79._12_4_ = auVar317._12_4_ * auVar34._12_4_;
          auVar79._16_4_ = auVar317._16_4_ * auVar34._16_4_;
          auVar79._20_4_ = auVar317._20_4_ * auVar34._20_4_;
          auVar79._24_4_ = auVar317._24_4_ * auVar34._24_4_;
          auVar79._28_4_ = auVar333._28_4_;
          auVar80._4_4_ = auVar272._4_4_ * auVar21._4_4_;
          auVar80._0_4_ = auVar272._0_4_ * auVar21._0_4_;
          auVar80._8_4_ = auVar272._8_4_ * auVar21._8_4_;
          auVar80._12_4_ = auVar272._12_4_ * auVar21._12_4_;
          auVar80._16_4_ = auVar272._16_4_ * auVar21._16_4_;
          auVar80._20_4_ = auVar272._20_4_ * auVar21._20_4_;
          auVar80._24_4_ = auVar272._24_4_ * auVar21._24_4_;
          auVar80._28_4_ = fStack_484;
          auVar147 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar142._4_4_ * auVar21._4_4_;
          auVar81._0_4_ = auVar142._0_4_ * auVar21._0_4_;
          auVar81._8_4_ = auVar142._8_4_ * auVar21._8_4_;
          auVar81._12_4_ = auVar142._12_4_ * auVar21._12_4_;
          auVar81._16_4_ = auVar142._16_4_ * auVar21._16_4_;
          auVar81._20_4_ = auVar142._20_4_ * auVar21._20_4_;
          auVar81._24_4_ = auVar142._24_4_ * auVar21._24_4_;
          auVar81._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar339,auVar142);
          auVar82._4_4_ = auVar317._4_4_ * auVar21._4_4_;
          auVar82._0_4_ = auVar317._0_4_ * auVar21._0_4_;
          auVar82._8_4_ = auVar317._8_4_ * auVar21._8_4_;
          auVar82._12_4_ = auVar317._12_4_ * auVar21._12_4_;
          auVar82._16_4_ = auVar317._16_4_ * auVar21._16_4_;
          auVar82._20_4_ = auVar317._20_4_ * auVar21._20_4_;
          auVar82._24_4_ = auVar317._24_4_ * auVar21._24_4_;
          auVar82._28_4_ = auVar20._28_4_;
          auVar198 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = auVar272._4_4_ * auVar21._4_4_;
          auVar83._0_4_ = auVar272._0_4_ * auVar21._0_4_;
          auVar83._8_4_ = auVar272._8_4_ * auVar21._8_4_;
          auVar83._12_4_ = auVar272._12_4_ * auVar21._12_4_;
          auVar83._16_4_ = auVar272._16_4_ * auVar21._16_4_;
          auVar83._20_4_ = auVar272._20_4_ * auVar21._20_4_;
          auVar83._24_4_ = auVar272._24_4_ * auVar21._24_4_;
          auVar83._28_4_ = auVar20._28_4_;
          auVar84._4_4_ = auVar142._4_4_ * auVar34._4_4_;
          auVar84._0_4_ = auVar142._0_4_ * auVar34._0_4_;
          auVar84._8_4_ = auVar142._8_4_ * auVar34._8_4_;
          auVar84._12_4_ = auVar142._12_4_ * auVar34._12_4_;
          auVar84._16_4_ = auVar142._16_4_ * auVar34._16_4_;
          auVar84._20_4_ = auVar142._20_4_ * auVar34._20_4_;
          auVar84._24_4_ = auVar142._24_4_ * auVar34._24_4_;
          auVar84._28_4_ = auVar34._28_4_;
          auVar20 = vsubps_avx(auVar84,auVar83);
          auVar165._0_4_ = auVar147._0_4_ * 0.0 + auVar20._0_4_ + auVar198._0_4_ * 0.0;
          auVar165._4_4_ = auVar147._4_4_ * 0.0 + auVar20._4_4_ + auVar198._4_4_ * 0.0;
          auVar165._8_4_ = auVar147._8_4_ * 0.0 + auVar20._8_4_ + auVar198._8_4_ * 0.0;
          auVar165._12_4_ = auVar147._12_4_ * 0.0 + auVar20._12_4_ + auVar198._12_4_ * 0.0;
          auVar165._16_4_ = auVar147._16_4_ * 0.0 + auVar20._16_4_ + auVar198._16_4_ * 0.0;
          auVar165._20_4_ = auVar147._20_4_ * 0.0 + auVar20._20_4_ + auVar198._20_4_ * 0.0;
          auVar165._24_4_ = auVar147._24_4_ * 0.0 + auVar20._24_4_ + auVar198._24_4_ * 0.0;
          auVar165._28_4_ = auVar147._28_4_ + auVar20._28_4_ + auVar198._28_4_;
          auVar239 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
          auVar20 = vblendvps_avx(auVar28,_local_660,auVar239);
          auVar28 = vblendvps_avx(auVar26,_local_580,auVar239);
          auVar26 = vblendvps_avx(auVar27,auVar351,auVar239);
          auVar27 = vblendvps_avx(auVar142,auVar339,auVar239);
          auVar34 = vblendvps_avx(auVar272,auVar228,auVar239);
          auVar21 = vblendvps_avx(auVar317,auVar292,auVar239);
          auVar147 = vblendvps_avx(auVar339,auVar142,auVar239);
          auVar198 = vblendvps_avx(auVar228,auVar272,auVar239);
          auVar224 = vblendvps_avx(auVar292,auVar317,auVar239);
          auVar142 = vandps_avx(_local_2e0,_local_5c0);
          auVar147 = vsubps_avx(auVar147,auVar20);
          auVar32 = vsubps_avx(auVar198,auVar28);
          auVar224 = vsubps_avx(auVar224,auVar26);
          auVar33 = vsubps_avx(auVar28,auVar34);
          fVar293 = auVar32._0_4_;
          fVar250 = auVar26._0_4_;
          fVar172 = auVar32._4_4_;
          fVar257 = auVar26._4_4_;
          auVar85._4_4_ = fVar257 * fVar172;
          auVar85._0_4_ = fVar250 * fVar293;
          fVar268 = auVar32._8_4_;
          fVar343 = auVar26._8_4_;
          auVar85._8_4_ = fVar343 * fVar268;
          fVar279 = auVar32._12_4_;
          fVar260 = auVar26._12_4_;
          auVar85._12_4_ = fVar260 * fVar279;
          fVar173 = auVar32._16_4_;
          fVar346 = auVar26._16_4_;
          auVar85._16_4_ = fVar346 * fVar173;
          fVar152 = auVar32._20_4_;
          fVar263 = auVar26._20_4_;
          auVar85._20_4_ = fVar263 * fVar152;
          fVar233 = auVar32._24_4_;
          fVar265 = auVar26._24_4_;
          auVar85._24_4_ = fVar265 * fVar233;
          auVar85._28_4_ = auVar198._28_4_;
          fVar296 = auVar28._0_4_;
          fVar285 = auVar224._0_4_;
          fVar324 = auVar28._4_4_;
          fVar295 = auVar224._4_4_;
          auVar86._4_4_ = fVar295 * fVar324;
          auVar86._0_4_ = fVar285 * fVar296;
          fVar205 = auVar28._8_4_;
          fVar298 = auVar224._8_4_;
          auVar86._8_4_ = fVar298 * fVar205;
          fVar280 = auVar28._12_4_;
          fVar301 = auVar224._12_4_;
          auVar86._12_4_ = fVar301 * fVar280;
          fVar305 = auVar28._16_4_;
          fVar302 = auVar224._16_4_;
          auVar86._16_4_ = fVar302 * fVar305;
          fVar207 = auVar28._20_4_;
          fVar303 = auVar224._20_4_;
          auVar86._20_4_ = fVar303 * fVar207;
          fVar157 = auVar28._24_4_;
          fVar304 = auVar224._24_4_;
          uVar130 = auVar272._28_4_;
          auVar86._24_4_ = fVar304 * fVar157;
          auVar86._28_4_ = uVar130;
          auVar198 = vsubps_avx(auVar86,auVar85);
          fVar299 = auVar20._0_4_;
          fVar336 = auVar20._4_4_;
          auVar87._4_4_ = fVar295 * fVar336;
          auVar87._0_4_ = fVar285 * fVar299;
          fVar261 = auVar20._8_4_;
          auVar87._8_4_ = fVar298 * fVar261;
          fVar210 = auVar20._12_4_;
          auVar87._12_4_ = fVar301 * fVar210;
          fVar148 = auVar20._16_4_;
          auVar87._16_4_ = fVar302 * fVar148;
          fVar209 = auVar20._20_4_;
          auVar87._20_4_ = fVar303 * fVar209;
          fVar248 = auVar20._24_4_;
          auVar87._24_4_ = fVar304 * fVar248;
          auVar87._28_4_ = uVar130;
          fVar206 = auVar147._0_4_;
          fVar325 = auVar147._4_4_;
          auVar88._4_4_ = fVar257 * fVar325;
          auVar88._0_4_ = fVar250 * fVar206;
          fVar277 = auVar147._8_4_;
          auVar88._8_4_ = fVar343 * fVar277;
          fVar264 = auVar147._12_4_;
          auVar88._12_4_ = fVar260 * fVar264;
          fVar150 = auVar147._16_4_;
          auVar88._16_4_ = fVar346 * fVar150;
          fVar212 = auVar147._20_4_;
          auVar88._20_4_ = fVar263 * fVar212;
          fVar284 = auVar147._24_4_;
          auVar88._24_4_ = fVar265 * fVar284;
          auVar88._28_4_ = auVar339._28_4_;
          auVar272 = vsubps_avx(auVar88,auVar87);
          auVar89._4_4_ = fVar324 * fVar325;
          auVar89._0_4_ = fVar296 * fVar206;
          auVar89._8_4_ = fVar205 * fVar277;
          auVar89._12_4_ = fVar280 * fVar264;
          auVar89._16_4_ = fVar305 * fVar150;
          auVar89._20_4_ = fVar207 * fVar212;
          auVar89._24_4_ = fVar157 * fVar284;
          auVar89._28_4_ = uVar130;
          auVar90._4_4_ = fVar336 * fVar172;
          auVar90._0_4_ = fVar299 * fVar293;
          auVar90._8_4_ = fVar261 * fVar268;
          auVar90._12_4_ = fVar210 * fVar279;
          auVar90._16_4_ = fVar148 * fVar173;
          auVar90._20_4_ = fVar209 * fVar152;
          auVar90._24_4_ = fVar248 * fVar233;
          auVar90._28_4_ = auVar317._28_4_;
          auVar317 = vsubps_avx(auVar90,auVar89);
          auVar26 = vsubps_avx(auVar26,auVar21);
          fVar211 = auVar317._28_4_ + auVar272._28_4_;
          local_860._0_4_ = auVar317._0_4_ + auVar272._0_4_ * 0.0 + auVar198._0_4_ * 0.0;
          local_860._4_4_ = auVar317._4_4_ + auVar272._4_4_ * 0.0 + auVar198._4_4_ * 0.0;
          local_860._8_4_ = auVar317._8_4_ + auVar272._8_4_ * 0.0 + auVar198._8_4_ * 0.0;
          local_860._12_4_ = auVar317._12_4_ + auVar272._12_4_ * 0.0 + auVar198._12_4_ * 0.0;
          local_860._16_4_ = auVar317._16_4_ + auVar272._16_4_ * 0.0 + auVar198._16_4_ * 0.0;
          local_860._20_4_ = auVar317._20_4_ + auVar272._20_4_ * 0.0 + auVar198._20_4_ * 0.0;
          local_860._24_4_ = auVar317._24_4_ + auVar272._24_4_ * 0.0 + auVar198._24_4_ * 0.0;
          local_860._28_4_ = fVar211 + auVar198._28_4_;
          fVar321 = auVar33._0_4_;
          fVar204 = auVar33._4_4_;
          auVar91._4_4_ = auVar21._4_4_ * fVar204;
          auVar91._0_4_ = auVar21._0_4_ * fVar321;
          fVar278 = auVar33._8_4_;
          auVar91._8_4_ = auVar21._8_4_ * fVar278;
          fVar281 = auVar33._12_4_;
          auVar91._12_4_ = auVar21._12_4_ * fVar281;
          fVar153 = auVar33._16_4_;
          auVar91._16_4_ = auVar21._16_4_ * fVar153;
          fVar266 = auVar33._20_4_;
          auVar91._20_4_ = auVar21._20_4_ * fVar266;
          fVar294 = auVar33._24_4_;
          auVar91._24_4_ = auVar21._24_4_ * fVar294;
          auVar91._28_4_ = fVar211;
          fVar211 = auVar26._0_4_;
          fVar327 = auVar26._4_4_;
          auVar92._4_4_ = auVar34._4_4_ * fVar327;
          auVar92._0_4_ = auVar34._0_4_ * fVar211;
          fVar208 = auVar26._8_4_;
          auVar92._8_4_ = auVar34._8_4_ * fVar208;
          fVar282 = auVar26._12_4_;
          auVar92._12_4_ = auVar34._12_4_ * fVar282;
          fVar155 = auVar26._16_4_;
          auVar92._16_4_ = auVar34._16_4_ * fVar155;
          fVar216 = auVar26._20_4_;
          auVar92._20_4_ = auVar34._20_4_ * fVar216;
          fVar297 = auVar26._24_4_;
          auVar92._24_4_ = auVar34._24_4_ * fVar297;
          auVar92._28_4_ = auVar317._28_4_;
          auVar272 = vsubps_avx(auVar92,auVar91);
          auVar20 = vsubps_avx(auVar20,auVar27);
          fVar323 = auVar20._0_4_;
          fVar326 = auVar20._4_4_;
          auVar93._4_4_ = auVar21._4_4_ * fVar326;
          auVar93._0_4_ = auVar21._0_4_ * fVar323;
          fVar262 = auVar20._8_4_;
          auVar93._8_4_ = auVar21._8_4_ * fVar262;
          fVar213 = auVar20._12_4_;
          auVar93._12_4_ = auVar21._12_4_ * fVar213;
          fVar156 = auVar20._16_4_;
          auVar93._16_4_ = auVar21._16_4_ * fVar156;
          fVar231 = auVar20._20_4_;
          auVar93._20_4_ = auVar21._20_4_ * fVar231;
          fVar300 = auVar20._24_4_;
          auVar93._24_4_ = auVar21._24_4_ * fVar300;
          auVar93._28_4_ = auVar21._28_4_;
          auVar94._4_4_ = fVar327 * auVar27._4_4_;
          auVar94._0_4_ = fVar211 * auVar27._0_4_;
          auVar94._8_4_ = fVar208 * auVar27._8_4_;
          auVar94._12_4_ = fVar282 * auVar27._12_4_;
          auVar94._16_4_ = fVar155 * auVar27._16_4_;
          auVar94._20_4_ = fVar216 * auVar27._20_4_;
          auVar94._24_4_ = fVar297 * auVar27._24_4_;
          auVar94._28_4_ = auVar198._28_4_;
          auVar20 = vsubps_avx(auVar93,auVar94);
          auVar95._4_4_ = auVar34._4_4_ * fVar326;
          auVar95._0_4_ = auVar34._0_4_ * fVar323;
          auVar95._8_4_ = auVar34._8_4_ * fVar262;
          auVar95._12_4_ = auVar34._12_4_ * fVar213;
          auVar95._16_4_ = auVar34._16_4_ * fVar156;
          auVar95._20_4_ = auVar34._20_4_ * fVar231;
          auVar95._24_4_ = auVar34._24_4_ * fVar300;
          auVar95._28_4_ = auVar34._28_4_;
          auVar96._4_4_ = fVar204 * auVar27._4_4_;
          auVar96._0_4_ = fVar321 * auVar27._0_4_;
          auVar96._8_4_ = fVar278 * auVar27._8_4_;
          auVar96._12_4_ = fVar281 * auVar27._12_4_;
          auVar96._16_4_ = fVar153 * auVar27._16_4_;
          auVar96._20_4_ = fVar266 * auVar27._20_4_;
          auVar96._24_4_ = fVar294 * auVar27._24_4_;
          auVar96._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar96,auVar95);
          auVar145._0_4_ = auVar272._0_4_ * 0.0 + auVar27._0_4_ + auVar20._0_4_ * 0.0;
          auVar145._4_4_ = auVar272._4_4_ * 0.0 + auVar27._4_4_ + auVar20._4_4_ * 0.0;
          auVar145._8_4_ = auVar272._8_4_ * 0.0 + auVar27._8_4_ + auVar20._8_4_ * 0.0;
          auVar145._12_4_ = auVar272._12_4_ * 0.0 + auVar27._12_4_ + auVar20._12_4_ * 0.0;
          auVar145._16_4_ = auVar272._16_4_ * 0.0 + auVar27._16_4_ + auVar20._16_4_ * 0.0;
          auVar145._20_4_ = auVar272._20_4_ * 0.0 + auVar27._20_4_ + auVar20._20_4_ * 0.0;
          auVar145._24_4_ = auVar272._24_4_ * 0.0 + auVar27._24_4_ + auVar20._24_4_ * 0.0;
          auVar145._28_4_ = auVar20._28_4_ + auVar27._28_4_ + auVar20._28_4_;
          auVar20 = vmaxps_avx(local_860,auVar145);
          auVar20 = vcmpps_avx(auVar20,ZEXT432(0) << 0x20,2);
          auVar27 = auVar142 & auVar20;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
LAB_00909ee1:
            auVar203 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar275._4_4_ = fVar149;
            auVar275._0_4_ = fVar131;
            auVar275._8_4_ = fVar151;
            auVar275._12_4_ = fVar154;
            auVar275._16_4_ = fStack_830;
            auVar275._20_4_ = fStack_82c;
            auVar275._24_4_ = fStack_828;
            auVar275._28_4_ = fStack_824;
          }
          else {
            auVar27 = vandps_avx(auVar20,auVar142);
            auVar97._4_4_ = fVar327 * fVar172;
            auVar97._0_4_ = fVar211 * fVar293;
            auVar97._8_4_ = fVar208 * fVar268;
            auVar97._12_4_ = fVar282 * fVar279;
            auVar97._16_4_ = fVar155 * fVar173;
            auVar97._20_4_ = fVar216 * fVar152;
            auVar97._24_4_ = fVar297 * fVar233;
            auVar97._28_4_ = auVar142._28_4_;
            auVar98._4_4_ = fVar204 * fVar295;
            auVar98._0_4_ = fVar321 * fVar285;
            auVar98._8_4_ = fVar278 * fVar298;
            auVar98._12_4_ = fVar281 * fVar301;
            auVar98._16_4_ = fVar153 * fVar302;
            auVar98._20_4_ = fVar266 * fVar303;
            auVar98._24_4_ = fVar294 * fVar304;
            auVar98._28_4_ = auVar20._28_4_;
            auVar20 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar326 * fVar295;
            auVar99._0_4_ = fVar323 * fVar285;
            auVar99._8_4_ = fVar262 * fVar298;
            auVar99._12_4_ = fVar213 * fVar301;
            auVar99._16_4_ = fVar156 * fVar302;
            auVar99._20_4_ = fVar231 * fVar303;
            auVar99._24_4_ = fVar300 * fVar304;
            auVar99._28_4_ = auVar224._28_4_;
            auVar100._4_4_ = fVar327 * fVar325;
            auVar100._0_4_ = fVar211 * fVar206;
            auVar100._8_4_ = fVar208 * fVar277;
            auVar100._12_4_ = fVar282 * fVar264;
            auVar100._16_4_ = fVar155 * fVar150;
            auVar100._20_4_ = fVar216 * fVar212;
            auVar100._24_4_ = fVar297 * fVar284;
            auVar100._28_4_ = auVar26._28_4_;
            auVar34 = vsubps_avx(auVar100,auVar99);
            auVar101._4_4_ = fVar204 * fVar325;
            auVar101._0_4_ = fVar321 * fVar206;
            auVar101._8_4_ = fVar278 * fVar277;
            auVar101._12_4_ = fVar281 * fVar264;
            auVar101._16_4_ = fVar153 * fVar150;
            auVar101._20_4_ = fVar266 * fVar212;
            auVar101._24_4_ = fVar294 * fVar284;
            auVar101._28_4_ = auVar147._28_4_;
            auVar102._4_4_ = fVar326 * fVar172;
            auVar102._0_4_ = fVar323 * fVar293;
            auVar102._8_4_ = fVar262 * fVar268;
            auVar102._12_4_ = fVar213 * fVar279;
            auVar102._16_4_ = fVar156 * fVar173;
            auVar102._20_4_ = fVar231 * fVar152;
            auVar102._24_4_ = fVar300 * fVar233;
            auVar102._28_4_ = auVar32._28_4_;
            auVar21 = vsubps_avx(auVar102,auVar101);
            auVar274._0_4_ = auVar20._0_4_ * 0.0 + auVar21._0_4_ + auVar34._0_4_ * 0.0;
            auVar274._4_4_ = auVar20._4_4_ * 0.0 + auVar21._4_4_ + auVar34._4_4_ * 0.0;
            auVar274._8_4_ = auVar20._8_4_ * 0.0 + auVar21._8_4_ + auVar34._8_4_ * 0.0;
            auVar274._12_4_ = auVar20._12_4_ * 0.0 + auVar21._12_4_ + auVar34._12_4_ * 0.0;
            auVar274._16_4_ = auVar20._16_4_ * 0.0 + auVar21._16_4_ + auVar34._16_4_ * 0.0;
            auVar274._20_4_ = auVar20._20_4_ * 0.0 + auVar21._20_4_ + auVar34._20_4_ * 0.0;
            auVar274._24_4_ = auVar20._24_4_ * 0.0 + auVar21._24_4_ + auVar34._24_4_ * 0.0;
            auVar274._28_4_ = auVar33._28_4_ + auVar21._28_4_ + auVar147._28_4_;
            auVar142 = vrcpps_avx(auVar274);
            fVar293 = auVar142._0_4_;
            fVar206 = auVar142._4_4_;
            auVar103._4_4_ = auVar274._4_4_ * fVar206;
            auVar103._0_4_ = auVar274._0_4_ * fVar293;
            fVar321 = auVar142._8_4_;
            auVar103._8_4_ = auVar274._8_4_ * fVar321;
            fVar211 = auVar142._12_4_;
            auVar103._12_4_ = auVar274._12_4_ * fVar211;
            fVar323 = auVar142._16_4_;
            auVar103._16_4_ = auVar274._16_4_ * fVar323;
            fVar172 = auVar142._20_4_;
            auVar103._20_4_ = auVar274._20_4_ * fVar172;
            fVar325 = auVar142._24_4_;
            auVar103._24_4_ = auVar274._24_4_ * fVar325;
            auVar103._28_4_ = auVar26._28_4_;
            auVar334._8_4_ = 0x3f800000;
            auVar334._0_8_ = 0x3f8000003f800000;
            auVar334._12_4_ = 0x3f800000;
            auVar334._16_4_ = 0x3f800000;
            auVar334._20_4_ = 0x3f800000;
            auVar334._24_4_ = 0x3f800000;
            auVar334._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar334,auVar103);
            fVar293 = auVar142._0_4_ * fVar293 + fVar293;
            fVar206 = auVar142._4_4_ * fVar206 + fVar206;
            fVar321 = auVar142._8_4_ * fVar321 + fVar321;
            fVar211 = auVar142._12_4_ * fVar211 + fVar211;
            fVar323 = auVar142._16_4_ * fVar323 + fVar323;
            fVar172 = auVar142._20_4_ * fVar172 + fVar172;
            fVar325 = auVar142._24_4_ * fVar325 + fVar325;
            auVar104._4_4_ =
                 (fVar336 * auVar20._4_4_ + auVar34._4_4_ * fVar324 + fVar257 * auVar21._4_4_) *
                 fVar206;
            auVar104._0_4_ =
                 (fVar299 * auVar20._0_4_ + auVar34._0_4_ * fVar296 + fVar250 * auVar21._0_4_) *
                 fVar293;
            auVar104._8_4_ =
                 (fVar261 * auVar20._8_4_ + auVar34._8_4_ * fVar205 + fVar343 * auVar21._8_4_) *
                 fVar321;
            auVar104._12_4_ =
                 (fVar210 * auVar20._12_4_ + auVar34._12_4_ * fVar280 + fVar260 * auVar21._12_4_) *
                 fVar211;
            auVar104._16_4_ =
                 (fVar148 * auVar20._16_4_ + auVar34._16_4_ * fVar305 + fVar346 * auVar21._16_4_) *
                 fVar323;
            auVar104._20_4_ =
                 (fVar209 * auVar20._20_4_ + auVar34._20_4_ * fVar207 + fVar263 * auVar21._20_4_) *
                 fVar172;
            auVar104._24_4_ =
                 (fVar248 * auVar20._24_4_ + auVar34._24_4_ * fVar157 + fVar265 * auVar21._24_4_) *
                 fVar325;
            auVar104._28_4_ = auVar28._28_4_ + auVar21._28_4_;
            uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar202._4_4_ = uVar130;
            auVar202._0_4_ = uVar130;
            auVar202._8_4_ = uVar130;
            auVar202._12_4_ = uVar130;
            auVar202._16_4_ = uVar130;
            auVar202._20_4_ = uVar130;
            auVar202._24_4_ = uVar130;
            auVar202._28_4_ = uVar130;
            auVar20 = vcmpps_avx(local_300,auVar104,2);
            auVar142 = vcmpps_avx(auVar104,auVar202,2);
            auVar142 = vandps_avx(auVar20,auVar142);
            auVar28 = auVar27 & auVar142;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) goto LAB_00909ee1;
            auVar142 = vandps_avx(auVar27,auVar142);
            auVar28 = vcmpps_avx(auVar274,ZEXT432(0) << 0x20,4);
            auVar26 = auVar142 & auVar28;
            auVar203 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar275._4_4_ = fVar149;
            auVar275._0_4_ = fVar131;
            auVar275._8_4_ = fVar151;
            auVar275._12_4_ = fVar154;
            auVar275._16_4_ = fStack_830;
            auVar275._20_4_ = fStack_82c;
            auVar275._24_4_ = fStack_828;
            auVar275._28_4_ = fStack_824;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar142 = vandps_avx(auVar28,auVar142);
              auVar203 = ZEXT3264(auVar142);
              auVar105._4_4_ = fVar206 * local_860._4_4_;
              auVar105._0_4_ = fVar293 * local_860._0_4_;
              auVar105._8_4_ = fVar321 * local_860._8_4_;
              auVar105._12_4_ = fVar211 * local_860._12_4_;
              auVar105._16_4_ = fVar323 * local_860._16_4_;
              auVar105._20_4_ = fVar172 * local_860._20_4_;
              auVar105._24_4_ = fVar325 * local_860._24_4_;
              auVar105._28_4_ = auVar20._28_4_;
              auVar106._4_4_ = auVar145._4_4_ * fVar206;
              auVar106._0_4_ = auVar145._0_4_ * fVar293;
              auVar106._8_4_ = auVar145._8_4_ * fVar321;
              auVar106._12_4_ = auVar145._12_4_ * fVar211;
              auVar106._16_4_ = auVar145._16_4_ * fVar323;
              auVar106._20_4_ = auVar145._20_4_ * fVar172;
              auVar106._24_4_ = auVar145._24_4_ * fVar325;
              auVar106._28_4_ = auVar145._28_4_;
              auVar247._8_4_ = 0x3f800000;
              auVar247._0_8_ = 0x3f8000003f800000;
              auVar247._12_4_ = 0x3f800000;
              auVar247._16_4_ = 0x3f800000;
              auVar247._20_4_ = 0x3f800000;
              auVar247._24_4_ = 0x3f800000;
              auVar247._28_4_ = 0x3f800000;
              auVar142 = vsubps_avx(auVar247,auVar105);
              _local_4e0 = vblendvps_avx(auVar142,auVar105,auVar239);
              auVar142 = vsubps_avx(auVar247,auVar106);
              _local_360 = vblendvps_avx(auVar142,auVar106,auVar239);
              local_4c0 = auVar104;
            }
          }
          auVar335 = ZEXT3264(local_800);
          auVar142 = auVar203._0_32_;
          auVar255 = ZEXT3264(local_620);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar203 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar203 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar203[0x1f]) {
LAB_00909bc2:
            fVar235 = (float)local_7c0._0_4_;
            fVar309 = (float)local_7c0._4_4_;
            fVar310 = fStack_7b8;
            fVar311 = fStack_7b4;
            fVar158 = fStack_7b0;
            fVar169 = fStack_7ac;
            fVar170 = fStack_7a8;
            fVar174 = (float)local_820._0_4_;
            fVar189 = (float)local_820._4_4_;
            fVar190 = fStack_818;
            fVar191 = fStack_814;
            fVar171 = fStack_810;
            fVar249 = fStack_80c;
            fVar256 = fStack_808;
            fVar215 = (float)local_7e0._0_4_;
            fVar230 = (float)local_7e0._4_4_;
            fVar232 = fStack_7d8;
            fVar234 = fStack_7d4;
            fVar258 = fStack_7d0;
            fVar259 = fStack_7cc;
            fVar283 = fStack_7c8;
          }
          else {
            auVar20 = vsubps_avx(auVar318,auVar275);
            fVar296 = auVar275._0_4_ + auVar20._0_4_ * (float)local_4e0._0_4_;
            fVar299 = auVar275._4_4_ + auVar20._4_4_ * (float)local_4e0._4_4_;
            fVar206 = auVar275._8_4_ + auVar20._8_4_ * fStack_4d8;
            fVar321 = auVar275._12_4_ + auVar20._12_4_ * fStack_4d4;
            fVar211 = auVar275._16_4_ + auVar20._16_4_ * fStack_4d0;
            fVar323 = auVar275._20_4_ + auVar20._20_4_ * fStack_4cc;
            fVar172 = auVar275._24_4_ + auVar20._24_4_ * fStack_4c8;
            fVar324 = auVar275._28_4_ + auVar20._28_4_;
            fVar293 = *(float *)((long)local_6b0->ray_space + k * 4 + -0x10);
            auVar107._4_4_ = (fVar299 + fVar299) * fVar293;
            auVar107._0_4_ = (fVar296 + fVar296) * fVar293;
            auVar107._8_4_ = (fVar206 + fVar206) * fVar293;
            auVar107._12_4_ = (fVar321 + fVar321) * fVar293;
            auVar107._16_4_ = (fVar211 + fVar211) * fVar293;
            auVar107._20_4_ = (fVar323 + fVar323) * fVar293;
            auVar107._24_4_ = (fVar172 + fVar172) * fVar293;
            auVar107._28_4_ = fVar324 + fVar324;
            auVar20 = vcmpps_avx(local_4c0,auVar107,6);
            auVar28 = auVar142 & auVar20;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) goto LAB_00909c2d;
            local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            uStack_358._0_4_ = (float)uStack_358 + (float)uStack_358 + -1.0;
            uStack_358._4_4_ = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
            uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
            uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_2a0 = _local_4e0;
            auVar120 = _local_360;
            auVar28 = _local_360;
            local_280 = (float)local_360._0_4_;
            fStack_27c = (float)local_360._4_4_;
            fStack_278 = (float)uStack_358;
            fStack_274 = uStack_358._4_4_;
            fStack_270 = (float)uStack_350;
            fStack_26c = uStack_350._4_4_;
            fStack_268 = (float)uStack_348;
            fStack_264 = uStack_348._4_4_;
            local_260 = local_4c0;
            local_23c = uVar11;
            local_230 = auVar220._0_8_;
            uStack_228 = uStack_878;
            local_220 = auVar270._0_8_;
            uStack_218 = uStack_888;
            local_210 = local_790;
            uStack_208 = uStack_788;
            local_200 = local_780;
            uStack_1f8 = uStack_778;
            pGVar128 = (context->scene->geometries).items[local_6d0].ptr;
            if ((pGVar128->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_540 = vandps_avx(auVar20,auVar142);
              auVar181._0_4_ = (float)(int)local_240;
              auVar181._4_12_ = auVar272._4_12_;
              auVar223 = vshufps_avx(auVar181,auVar181,0);
              local_1c0[0] = (auVar223._0_4_ + (float)local_4e0._0_4_ + 0.0) *
                             (float)local_140._0_4_;
              local_1c0[1] = (auVar223._4_4_ + (float)local_4e0._4_4_ + 1.0) *
                             (float)local_140._4_4_;
              local_1c0[2] = (auVar223._8_4_ + fStack_4d8 + 2.0) * fStack_138;
              local_1c0[3] = (auVar223._12_4_ + fStack_4d4 + 3.0) * fStack_134;
              fStack_1b0 = (auVar223._0_4_ + fStack_4d0 + 4.0) * fStack_130;
              fStack_1ac = (auVar223._4_4_ + fStack_4cc + 5.0) * fStack_12c;
              fStack_1a8 = (auVar223._8_4_ + fStack_4c8 + 6.0) * fStack_128;
              fStack_1a4 = auVar223._12_4_ + fStack_4c4 + 7.0;
              uStack_350 = auVar120._16_8_;
              uStack_348 = auVar28._24_8_;
              local_1a0 = local_360;
              uStack_198 = uStack_358;
              uStack_190 = uStack_350;
              uStack_188 = uStack_348;
              local_180 = local_4c0;
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar142 = vblendvps_avx(auVar166,local_4c0,local_540);
              auVar20 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar20 = vminps_avx(auVar142,auVar20);
              auVar26 = vshufpd_avx(auVar20,auVar20,5);
              auVar20 = vminps_avx(auVar20,auVar26);
              auVar26 = vperm2f128_avx(auVar20,auVar20,1);
              auVar20 = vminps_avx(auVar20,auVar26);
              auVar20 = vcmpps_avx(auVar142,auVar20,0);
              auVar26 = local_540 & auVar20;
              auVar142 = local_540;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar142 = vandps_avx(auVar20,local_540);
              }
              uVar122 = vmovmskps_avx(auVar142);
              uVar125 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                }
              }
              uVar124 = (ulong)uVar125;
              _local_360 = auVar28;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar128->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar313 = local_1c0[uVar124];
                uVar130 = *(undefined4 *)((long)&local_1a0 + uVar124 * 4);
                fVar320 = 1.0 - fVar313;
                fVar319 = fVar313 * fVar320 + fVar313 * fVar320;
                auVar223 = ZEXT416((uint)(fVar313 * fVar313 * 3.0));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar182 = ZEXT416((uint)((fVar319 - fVar313 * fVar313) * 3.0));
                auVar182 = vshufps_avx(auVar182,auVar182,0);
                auVar197 = ZEXT416((uint)((fVar320 * fVar320 - fVar319) * 3.0));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar186 = ZEXT416((uint)(fVar320 * fVar320 * -3.0));
                auVar186 = vshufps_avx(auVar186,auVar186,0);
                auVar183._0_4_ =
                     auVar186._0_4_ * fVar214 +
                     auVar197._0_4_ * fVar267 +
                     auVar223._0_4_ * (float)local_780._0_4_ +
                     auVar182._0_4_ * (float)local_790._0_4_;
                auVar183._4_4_ =
                     auVar186._4_4_ * fVar229 +
                     auVar197._4_4_ * fVar276 +
                     auVar223._4_4_ * (float)local_780._4_4_ +
                     auVar182._4_4_ * (float)local_790._4_4_;
                auVar183._8_4_ =
                     auVar186._8_4_ * auVar220._8_4_ +
                     auVar197._8_4_ * auVar270._8_4_ +
                     auVar223._8_4_ * (float)uStack_778 + auVar182._8_4_ * (float)uStack_788;
                auVar183._12_4_ =
                     auVar186._12_4_ * auVar220._12_4_ +
                     auVar197._12_4_ * auVar270._12_4_ +
                     auVar223._12_4_ * uStack_778._4_4_ + auVar182._12_4_ * uStack_788._4_4_;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar124 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar183._0_4_;
                uVar12 = vextractps_avx(auVar183,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar12;
                uVar12 = vextractps_avx(auVar183,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar12;
                *(float *)(ray + k * 4 + 0xf0) = fVar313;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar130;
                *(int *)(ray + k * 4 + 0x110) = (int)local_6a8;
                *(int *)(ray + k * 4 + 0x120) = (int)local_6d0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                stack0xfffffffffffff908 = auVar246._8_24_;
                auVar223 = *local_6b8;
                local_840 = *(uint *)(ray + k * 4 + 0x80);
                uStack_83c = 0;
                uStack_838 = 0;
                uStack_834 = 0;
                local_860._0_8_ = pGVar128;
                _local_6a0 = auVar318;
                while( true ) {
                  local_3c0 = local_1c0[uVar124];
                  local_3b0 = *(undefined4 *)((long)&local_1a0 + uVar124 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar124 * 4);
                  fVar319 = 1.0 - local_3c0;
                  fVar313 = local_3c0 * fVar319 + local_3c0 * fVar319;
                  auVar182 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar197 = ZEXT416((uint)((fVar313 - local_3c0 * local_3c0) * 3.0));
                  auVar197 = vshufps_avx(auVar197,auVar197,0);
                  auVar186 = ZEXT416((uint)((fVar319 * fVar319 - fVar313) * 3.0));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  local_770.context = context->user;
                  auVar184 = ZEXT416((uint)(fVar319 * fVar319 * -3.0));
                  auVar184 = vshufps_avx(auVar184,auVar184,0);
                  auVar185._0_4_ =
                       auVar184._0_4_ * fVar214 +
                       auVar186._0_4_ * fVar267 +
                       auVar182._0_4_ * (float)local_780._0_4_ +
                       auVar197._0_4_ * (float)local_790._0_4_;
                  auVar185._4_4_ =
                       auVar184._4_4_ * fVar229 +
                       auVar186._4_4_ * fVar276 +
                       auVar182._4_4_ * (float)local_780._4_4_ +
                       auVar197._4_4_ * (float)local_790._4_4_;
                  auVar185._8_4_ =
                       auVar184._8_4_ * auVar220._8_4_ +
                       auVar186._8_4_ * auVar270._8_4_ +
                       auVar182._8_4_ * (float)uStack_778 + auVar197._8_4_ * (float)uStack_788;
                  auVar185._12_4_ =
                       auVar184._12_4_ * auVar220._12_4_ +
                       auVar186._12_4_ * auVar270._12_4_ +
                       auVar182._12_4_ * uStack_778._4_4_ + auVar197._12_4_ * uStack_788._4_4_;
                  auVar182 = vshufps_avx(auVar185,auVar185,0);
                  local_3f0[0] = (RTCHitN)auVar182[0];
                  local_3f0[1] = (RTCHitN)auVar182[1];
                  local_3f0[2] = (RTCHitN)auVar182[2];
                  local_3f0[3] = (RTCHitN)auVar182[3];
                  local_3f0[4] = (RTCHitN)auVar182[4];
                  local_3f0[5] = (RTCHitN)auVar182[5];
                  local_3f0[6] = (RTCHitN)auVar182[6];
                  local_3f0[7] = (RTCHitN)auVar182[7];
                  local_3f0[8] = (RTCHitN)auVar182[8];
                  local_3f0[9] = (RTCHitN)auVar182[9];
                  local_3f0[10] = (RTCHitN)auVar182[10];
                  local_3f0[0xb] = (RTCHitN)auVar182[0xb];
                  local_3f0[0xc] = (RTCHitN)auVar182[0xc];
                  local_3f0[0xd] = (RTCHitN)auVar182[0xd];
                  local_3f0[0xe] = (RTCHitN)auVar182[0xe];
                  local_3f0[0xf] = (RTCHitN)auVar182[0xf];
                  auVar182 = vshufps_avx(auVar185,auVar185,0x55);
                  local_3e0 = auVar182;
                  local_3d0 = vshufps_avx(auVar185,auVar185,0xaa);
                  fStack_3bc = local_3c0;
                  fStack_3b8 = local_3c0;
                  fStack_3b4 = local_3c0;
                  uStack_3ac = local_3b0;
                  uStack_3a8 = local_3b0;
                  uStack_3a4 = local_3b0;
                  local_3a0 = local_630._0_8_;
                  uStack_398 = local_630._8_8_;
                  local_390 = local_320._0_16_;
                  vcmpps_avx(ZEXT1632(local_320._0_16_),ZEXT1632(local_320._0_16_),0xf);
                  uStack_37c = (local_770.context)->instID[0];
                  local_380 = uStack_37c;
                  uStack_378 = uStack_37c;
                  uStack_374 = uStack_37c;
                  uStack_370 = (local_770.context)->instPrimID[0];
                  uStack_36c = uStack_370;
                  uStack_368 = uStack_370;
                  uStack_364 = uStack_370;
                  local_770.valid = (int *)local_870;
                  local_770.geometryUserPtr = pGVar128->userPtr;
                  local_770.hit = local_3f0;
                  local_770.N = 4;
                  local_870 = auVar223;
                  local_770.ray = (RTCRayN *)ray;
                  if (pGVar128->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar128->intersectionFilterN)(&local_770);
                    pGVar128 = (Geometry *)local_860._0_8_;
                  }
                  if (local_870 == (undefined1  [16])0x0) {
                    auVar182 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar182 = auVar182 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar128->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_770);
                      pGVar128 = (Geometry *)local_860._0_8_;
                    }
                    auVar197 = vpcmpeqd_avx(local_870,_DAT_01f45a50);
                    auVar186 = vpcmpeqd_avx(auVar182,auVar182);
                    auVar182 = auVar197 ^ auVar186;
                    if (local_870 != (undefined1  [16])0x0) {
                      auVar197 = auVar197 ^ auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])local_770.hit);
                      *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x10));
                      *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x20));
                      *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x30));
                      *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x40));
                      *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x50));
                      *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x60));
                      *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar186;
                      auVar186 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x70));
                      *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar186;
                      auVar197 = vmaskmovps_avx(auVar197,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x80));
                      *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar197;
                    }
                  }
                  auVar142 = local_4c0;
                  auVar161._8_8_ = 0x100000001;
                  auVar161._0_8_ = 0x100000001;
                  if ((auVar161 & auVar182) == (undefined1  [16])0x0) {
                    auVar137._4_4_ = uStack_83c;
                    auVar137._0_4_ = local_840;
                    auVar137._8_4_ = uStack_838;
                    auVar137._12_4_ = uStack_834;
                    *(uint *)(ray + k * 4 + 0x80) = local_840;
                  }
                  else {
                    auVar137 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_540 + uVar124 * 4) = 0;
                  local_840 = auVar137._0_4_;
                  uStack_83c = auVar137._4_4_;
                  uStack_838 = auVar137._8_4_;
                  uStack_834 = auVar137._12_4_;
                  auVar182 = vshufps_avx(auVar137,auVar137,0);
                  auVar146._16_16_ = auVar182;
                  auVar146._0_16_ = auVar182;
                  auVar28 = vcmpps_avx(auVar142,auVar146,2);
                  auVar20 = vandps_avx(auVar28,local_540);
                  local_540 = local_540 & auVar28;
                  if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_540 >> 0x7f,0) == '\0') &&
                        (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_540 >> 0xbf,0) == '\0') &&
                      (local_540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_540[0x1f]) break;
                  auVar167._8_4_ = 0x7f800000;
                  auVar167._0_8_ = 0x7f8000007f800000;
                  auVar167._12_4_ = 0x7f800000;
                  auVar167._16_4_ = 0x7f800000;
                  auVar167._20_4_ = 0x7f800000;
                  auVar167._24_4_ = 0x7f800000;
                  auVar167._28_4_ = 0x7f800000;
                  auVar142 = vblendvps_avx(auVar167,auVar142,auVar20);
                  auVar28 = vshufps_avx(auVar142,auVar142,0xb1);
                  auVar28 = vminps_avx(auVar142,auVar28);
                  auVar26 = vshufpd_avx(auVar28,auVar28,5);
                  auVar28 = vminps_avx(auVar28,auVar26);
                  auVar26 = vperm2f128_avx(auVar28,auVar28,1);
                  auVar28 = vminps_avx(auVar28,auVar26);
                  auVar28 = vcmpps_avx(auVar142,auVar28,0);
                  auVar26 = auVar20 & auVar28;
                  auVar142 = auVar20;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar142 = vandps_avx(auVar28,auVar20);
                  }
                  uVar122 = vmovmskps_avx(auVar142);
                  uVar125 = 0;
                  if (uVar122 != 0) {
                    for (; (uVar122 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                    }
                  }
                  uVar124 = (ulong)uVar125;
                  local_540 = auVar20;
                }
                auVar335 = ZEXT3264(local_800);
                auVar255 = ZEXT3264(local_620);
              }
              goto LAB_00909bc2;
            }
          }
          fVar312 = (float)local_680._0_4_;
          fVar340 = (float)local_680._4_4_;
          fVar341 = fStack_678;
          fVar342 = fStack_674;
          fVar313 = fStack_670;
          fVar319 = fStack_66c;
          fVar320 = fStack_668;
          fVar322 = fStack_664;
        }
LAB_00909c2d:
        lVar127 = lVar127 + 8;
      }
    }
    uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar135._4_4_ = uVar130;
    auVar135._0_4_ = uVar130;
    auVar135._8_4_ = uVar130;
    auVar135._12_4_ = uVar130;
    auVar223 = vcmpps_avx(local_2b0,auVar135,2);
    uVar125 = vmovmskps_avx(auVar223);
    uVar123 = (ulong)((uint)uVar123 & (uint)uVar123 + 0xf & uVar125);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }